

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersector1<4>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [28];
  undefined1 (*pauVar3) [16];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  Primitive PVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  RTCFilterFunctionN p_Var13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [12];
  undefined1 auVar111 [28];
  undefined1 auVar112 [28];
  undefined1 auVar113 [28];
  undefined1 auVar114 [24];
  undefined1 auVar115 [28];
  uint uVar116;
  int iVar117;
  RTCIntersectArguments *pRVar118;
  ulong uVar119;
  ulong uVar120;
  ulong uVar121;
  Geometry *geometry;
  long lVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar138;
  float fVar141;
  vint4 bi_1;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar139;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar149;
  float fVar151;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar140;
  float fVar143;
  float fVar146;
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  vint4 bi_2;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar166;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 ai;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar173 [32];
  float fVar176;
  float fVar189;
  float fVar191;
  vint4 bi;
  undefined1 auVar177 [16];
  float fVar192;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar190;
  float fVar193;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar194;
  float fVar196;
  float fVar197;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar195;
  float fVar198;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  float fVar199;
  float fVar212;
  float fVar214;
  vint4 ai_2;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar216;
  undefined1 auVar203 [16];
  float fVar200;
  undefined1 auVar205 [16];
  undefined1 auVar225 [16];
  undefined1 auVar204 [16];
  float fVar213;
  float fVar215;
  float fVar217;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar218;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  float fVar219;
  float fVar231;
  float fVar233;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar235;
  undefined1 auVar224 [16];
  float fVar220;
  float fVar232;
  float fVar234;
  float fVar236;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar237;
  float fVar244;
  float fVar245;
  undefined1 auVar238 [16];
  float fVar248;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar247;
  float fVar249;
  undefined1 auVar242 [32];
  float fVar246;
  undefined1 auVar243 [64];
  float fVar250;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar260;
  float fVar270;
  float fVar273;
  float fVar274;
  float fVar276;
  vint4 ai_1;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar277;
  undefined1 auVar267 [32];
  float fVar272;
  undefined1 auVar268 [32];
  float fVar271;
  float fVar275;
  float fVar278;
  undefined1 auVar269 [64];
  float fVar282;
  float fVar283;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar284 [16];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar301;
  undefined1 auVar300 [64];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar307 [16];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar315;
  float fVar323;
  float fVar325;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar316;
  float fVar324;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  float fVar329;
  float fVar330;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar331 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7d5;
  int local_7d4;
  RayQueryContext *local_7d0;
  Ray *local_7c8;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  Precalculations *local_7a8;
  undefined1 local_7a0 [8];
  undefined1 auStack_798 [8];
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  ulong local_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 auStack_5f0 [8];
  float fStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined8 local_5a0;
  undefined4 local_598;
  float local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  uint local_584;
  uint local_580;
  ulong local_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 auStack_4f0 [8];
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_490 [16];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar314 [64];
  
  PVar10 = prim[1];
  uVar120 = (ulong)(byte)PVar10;
  auVar225 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar120 * 0x19 + 6));
  fVar176 = *(float *)(prim + uVar120 * 0x19 + 0x12);
  auVar155._0_4_ = fVar176 * auVar225._0_4_;
  auVar155._4_4_ = fVar176 * auVar225._4_4_;
  auVar155._8_4_ = fVar176 * auVar225._8_4_;
  auVar155._12_4_ = fVar176 * auVar225._12_4_;
  auVar221._0_4_ = fVar176 * (ray->dir).field_0.m128[0];
  auVar221._4_4_ = fVar176 * (ray->dir).field_0.m128[1];
  auVar221._8_4_ = fVar176 * (ray->dir).field_0.m128[2];
  auVar221._12_4_ = fVar176 * (ray->dir).field_0.m128[3];
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 4 + 6)));
  auVar171 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 5 + 6)));
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 6 + 6)));
  auVar171 = vcvtdq2ps_avx(auVar171);
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar120 * 0xb + 6)));
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar120 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar179 = vcvtdq2ps_avx(auVar179);
  uVar121 = (ulong)(uint)((int)(uVar120 * 9) * 2);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 + uVar120 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  uVar121 = (ulong)(uint)((int)(uVar120 * 5) << 2);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 + 6)));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar127 = vshufps_avx(auVar221,auVar221,0);
  auVar156 = vshufps_avx(auVar221,auVar221,0x55);
  auVar167 = vshufps_avx(auVar221,auVar221,0xaa);
  fVar176 = auVar167._0_4_;
  fVar199 = auVar167._4_4_;
  fVar219 = auVar167._8_4_;
  fVar189 = auVar167._12_4_;
  fVar233 = auVar156._0_4_;
  fVar192 = auVar156._4_4_;
  fVar216 = auVar156._8_4_;
  fVar235 = auVar156._12_4_;
  fVar212 = auVar127._0_4_;
  fVar231 = auVar127._4_4_;
  fVar191 = auVar127._8_4_;
  fVar214 = auVar127._12_4_;
  auVar307._0_4_ = fVar212 * auVar225._0_4_ + fVar233 * auVar171._0_4_ + fVar176 * auVar205._0_4_;
  auVar307._4_4_ = fVar231 * auVar225._4_4_ + fVar192 * auVar171._4_4_ + fVar199 * auVar205._4_4_;
  auVar307._8_4_ = fVar191 * auVar225._8_4_ + fVar216 * auVar171._8_4_ + fVar219 * auVar205._8_4_;
  auVar307._12_4_ =
       fVar214 * auVar225._12_4_ + fVar235 * auVar171._12_4_ + fVar189 * auVar205._12_4_;
  auVar314 = ZEXT1664(auVar307);
  auVar317._0_4_ = fVar212 * auVar181._0_4_ + fVar233 * auVar19._0_4_ + auVar179._0_4_ * fVar176;
  auVar317._4_4_ = fVar231 * auVar181._4_4_ + fVar192 * auVar19._4_4_ + auVar179._4_4_ * fVar199;
  auVar317._8_4_ = fVar191 * auVar181._8_4_ + fVar216 * auVar19._8_4_ + auVar179._8_4_ * fVar219;
  auVar317._12_4_ = fVar214 * auVar181._12_4_ + fVar235 * auVar19._12_4_ + auVar179._12_4_ * fVar189
  ;
  auVar222._0_4_ = fVar212 * auVar128._0_4_ + fVar233 * auVar129._0_4_ + auVar157._0_4_ * fVar176;
  auVar222._4_4_ = fVar231 * auVar128._4_4_ + fVar192 * auVar129._4_4_ + auVar157._4_4_ * fVar199;
  auVar222._8_4_ = fVar191 * auVar128._8_4_ + fVar216 * auVar129._8_4_ + auVar157._8_4_ * fVar219;
  auVar222._12_4_ =
       fVar214 * auVar128._12_4_ + fVar235 * auVar129._12_4_ + auVar157._12_4_ * fVar189;
  auVar127 = vshufps_avx(auVar155,auVar155,0);
  auVar156 = vshufps_avx(auVar155,auVar155,0x55);
  auVar167 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar176 = auVar167._0_4_;
  fVar199 = auVar167._4_4_;
  fVar219 = auVar167._8_4_;
  fVar189 = auVar167._12_4_;
  fVar233 = auVar156._0_4_;
  fVar192 = auVar156._4_4_;
  fVar216 = auVar156._8_4_;
  fVar235 = auVar156._12_4_;
  fVar212 = auVar127._0_4_;
  fVar231 = auVar127._4_4_;
  fVar191 = auVar127._8_4_;
  fVar214 = auVar127._12_4_;
  auVar238._0_4_ = fVar212 * auVar225._0_4_ + fVar233 * auVar171._0_4_ + fVar176 * auVar205._0_4_;
  auVar238._4_4_ = fVar231 * auVar225._4_4_ + fVar192 * auVar171._4_4_ + fVar199 * auVar205._4_4_;
  auVar238._8_4_ = fVar191 * auVar225._8_4_ + fVar216 * auVar171._8_4_ + fVar219 * auVar205._8_4_;
  auVar238._12_4_ =
       fVar214 * auVar225._12_4_ + fVar235 * auVar171._12_4_ + fVar189 * auVar205._12_4_;
  auVar127._0_4_ = fVar212 * auVar181._0_4_ + auVar179._0_4_ * fVar176 + fVar233 * auVar19._0_4_;
  auVar127._4_4_ = fVar231 * auVar181._4_4_ + auVar179._4_4_ * fVar199 + fVar192 * auVar19._4_4_;
  auVar127._8_4_ = fVar191 * auVar181._8_4_ + auVar179._8_4_ * fVar219 + fVar216 * auVar19._8_4_;
  auVar127._12_4_ = fVar214 * auVar181._12_4_ + auVar179._12_4_ * fVar189 + fVar235 * auVar19._12_4_
  ;
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar225 = vandps_avx(auVar307,auVar261);
  auVar201._8_4_ = 0x219392ef;
  auVar201._0_8_ = 0x219392ef219392ef;
  auVar201._12_4_ = 0x219392ef;
  auVar225 = vcmpps_avx(auVar225,auVar201,1);
  auVar171 = vblendvps_avx(auVar307,auVar201,auVar225);
  auVar225 = vandps_avx(auVar317,auVar261);
  auVar225 = vcmpps_avx(auVar225,auVar201,1);
  auVar205 = vblendvps_avx(auVar317,auVar201,auVar225);
  auVar225 = vandps_avx(auVar261,auVar222);
  auVar225 = vcmpps_avx(auVar225,auVar201,1);
  auVar225 = vblendvps_avx(auVar222,auVar201,auVar225);
  auVar156._0_4_ = fVar212 * auVar128._0_4_ + fVar233 * auVar129._0_4_ + auVar157._0_4_ * fVar176;
  auVar156._4_4_ = fVar231 * auVar128._4_4_ + fVar192 * auVar129._4_4_ + auVar157._4_4_ * fVar199;
  auVar156._8_4_ = fVar191 * auVar128._8_4_ + fVar216 * auVar129._8_4_ + auVar157._8_4_ * fVar219;
  auVar156._12_4_ =
       fVar214 * auVar128._12_4_ + fVar235 * auVar129._12_4_ + auVar157._12_4_ * fVar189;
  auVar181 = vrcpps_avx(auVar171);
  fVar176 = auVar181._0_4_;
  auVar177._0_4_ = fVar176 * auVar171._0_4_;
  fVar189 = auVar181._4_4_;
  auVar177._4_4_ = fVar189 * auVar171._4_4_;
  fVar191 = auVar181._8_4_;
  auVar177._8_4_ = fVar191 * auVar171._8_4_;
  fVar192 = auVar181._12_4_;
  auVar177._12_4_ = fVar192 * auVar171._12_4_;
  auVar262._8_4_ = 0x3f800000;
  auVar262._0_8_ = &DAT_3f8000003f800000;
  auVar262._12_4_ = 0x3f800000;
  auVar171 = vsubps_avx(auVar262,auVar177);
  fVar176 = fVar176 + fVar176 * auVar171._0_4_;
  fVar189 = fVar189 + fVar189 * auVar171._4_4_;
  fVar191 = fVar191 + fVar191 * auVar171._8_4_;
  fVar192 = fVar192 + fVar192 * auVar171._12_4_;
  auVar171 = vrcpps_avx(auVar205);
  fVar199 = auVar171._0_4_;
  auVar202._0_4_ = fVar199 * auVar205._0_4_;
  fVar212 = auVar171._4_4_;
  auVar202._4_4_ = fVar212 * auVar205._4_4_;
  fVar214 = auVar171._8_4_;
  auVar202._8_4_ = fVar214 * auVar205._8_4_;
  fVar216 = auVar171._12_4_;
  auVar202._12_4_ = fVar216 * auVar205._12_4_;
  auVar171 = vsubps_avx(auVar262,auVar202);
  fVar199 = fVar199 + fVar199 * auVar171._0_4_;
  fVar212 = fVar212 + fVar212 * auVar171._4_4_;
  fVar214 = fVar214 + fVar214 * auVar171._8_4_;
  fVar216 = fVar216 + fVar216 * auVar171._12_4_;
  auVar171 = vrcpps_avx(auVar225);
  fVar219 = auVar171._0_4_;
  auVar223._0_4_ = fVar219 * auVar225._0_4_;
  fVar231 = auVar171._4_4_;
  auVar223._4_4_ = fVar231 * auVar225._4_4_;
  fVar233 = auVar171._8_4_;
  auVar223._8_4_ = fVar233 * auVar225._8_4_;
  fVar235 = auVar171._12_4_;
  auVar223._12_4_ = fVar235 * auVar225._12_4_;
  auVar171 = vsubps_avx(auVar262,auVar223);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar120 * 7 + 6);
  auVar225 = vpmovsxwd_avx(auVar225);
  fVar219 = fVar219 + fVar219 * auVar171._0_4_;
  fVar231 = fVar231 + fVar231 * auVar171._4_4_;
  fVar233 = fVar233 + fVar233 * auVar171._8_4_;
  fVar235 = fVar235 + fVar235 * auVar171._12_4_;
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar238);
  auVar167._0_4_ = fVar176 * auVar225._0_4_;
  auVar167._4_4_ = fVar189 * auVar225._4_4_;
  auVar167._8_4_ = fVar191 * auVar225._8_4_;
  auVar167._12_4_ = fVar192 * auVar225._12_4_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar120 * 9 + 6);
  auVar225 = vpmovsxwd_avx(auVar171);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar238);
  auVar178._0_4_ = fVar176 * auVar225._0_4_;
  auVar178._4_4_ = fVar189 * auVar225._4_4_;
  auVar178._8_4_ = fVar191 * auVar225._8_4_;
  auVar178._12_4_ = fVar192 * auVar225._12_4_;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar171 = vpmovsxwd_avx(auVar205);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar120 * -2 + 6);
  auVar225 = vpmovsxwd_avx(auVar181);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar127);
  auVar263._0_4_ = auVar225._0_4_ * fVar199;
  auVar263._4_4_ = auVar225._4_4_ * fVar212;
  auVar263._8_4_ = auVar225._8_4_ * fVar214;
  auVar263._12_4_ = auVar225._12_4_ * fVar216;
  auVar225 = vcvtdq2ps_avx(auVar171);
  auVar225 = vsubps_avx(auVar225,auVar127);
  auVar128._0_4_ = fVar199 * auVar225._0_4_;
  auVar128._4_4_ = fVar212 * auVar225._4_4_;
  auVar128._8_4_ = fVar214 * auVar225._8_4_;
  auVar128._12_4_ = fVar216 * auVar225._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar121 + uVar120 + 6);
  auVar225 = vpmovsxwd_avx(auVar19);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar156);
  auVar203._0_4_ = auVar225._0_4_ * fVar219;
  auVar203._4_4_ = auVar225._4_4_ * fVar231;
  auVar203._8_4_ = auVar225._8_4_ * fVar233;
  auVar203._12_4_ = auVar225._12_4_ * fVar235;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar120 * 0x17 + 6);
  auVar225 = vpmovsxwd_avx(auVar179);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar156);
  auVar157._0_4_ = auVar225._0_4_ * fVar219;
  auVar157._4_4_ = auVar225._4_4_ * fVar231;
  auVar157._8_4_ = auVar225._8_4_ * fVar233;
  auVar157._12_4_ = auVar225._12_4_ * fVar235;
  auVar225 = vpminsd_avx(auVar167,auVar178);
  auVar171 = vpminsd_avx(auVar263,auVar128);
  auVar225 = vmaxps_avx(auVar225,auVar171);
  auVar171 = vpminsd_avx(auVar203,auVar157);
  uVar8 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar284._4_4_ = uVar8;
  auVar284._0_4_ = uVar8;
  auVar284._8_4_ = uVar8;
  auVar284._12_4_ = uVar8;
  auVar171 = vmaxps_avx(auVar171,auVar284);
  auVar225 = vmaxps_avx(auVar225,auVar171);
  local_2d0._0_4_ = auVar225._0_4_ * 0.99999964;
  local_2d0._4_4_ = auVar225._4_4_ * 0.99999964;
  local_2d0._8_4_ = auVar225._8_4_ * 0.99999964;
  local_2d0._12_4_ = auVar225._12_4_ * 0.99999964;
  auVar225 = vpmaxsd_avx(auVar167,auVar178);
  auVar171 = vpmaxsd_avx(auVar263,auVar128);
  auVar225 = vminps_avx(auVar225,auVar171);
  auVar171 = vpmaxsd_avx(auVar203,auVar157);
  fVar176 = ray->tfar;
  auVar168._4_4_ = fVar176;
  auVar168._0_4_ = fVar176;
  auVar168._8_4_ = fVar176;
  auVar168._12_4_ = fVar176;
  auVar171 = vminps_avx(auVar171,auVar168);
  auVar225 = vminps_avx(auVar225,auVar171);
  auVar129._0_4_ = auVar225._0_4_ * 1.0000004;
  auVar129._4_4_ = auVar225._4_4_ * 1.0000004;
  auVar129._8_4_ = auVar225._8_4_ * 1.0000004;
  auVar129._12_4_ = auVar225._12_4_ * 1.0000004;
  auVar225 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar171 = vpcmpgtd_avx(auVar225,_DAT_01ff0cf0);
  auVar225 = vcmpps_avx(local_2d0,auVar129,2);
  auVar225 = vandps_avx(auVar225,auVar171);
  uVar116 = vmovmskps_avx(auVar225);
  local_7d5 = uVar116 != 0;
  if (local_7d5) {
    uVar116 = uVar116 & 0xff;
    local_480 = mm_lookupmask_ps._16_8_;
    uStack_478 = mm_lookupmask_ps._24_8_;
    uStack_470 = mm_lookupmask_ps._16_8_;
    uStack_468 = mm_lookupmask_ps._24_8_;
    do {
      uVar121 = (ulong)uVar116;
      auVar308 = auVar314._0_32_;
      lVar14 = 0;
      if (uVar121 != 0) {
        for (; (uVar116 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      uVar121 = uVar121 - 1 & uVar121;
      local_728 = (ulong)*(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      _Var12 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_568 = (ulong)*(uint *)(prim + lVar14 * 4 + 6);
      uVar119 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                                _Var12 * *(uint *)(prim + lVar14 * 4 + 6));
      p_Var13 = pGVar11[1].intersectionFilterN;
      lVar14 = *(long *)&pGVar11[1].time_range.upper;
      _local_7c0 = *(undefined1 (*) [16])(lVar14 + (long)p_Var13 * uVar119);
      local_680 = *(undefined1 (*) [16])(lVar14 + (uVar119 + 1) * (long)p_Var13);
      local_690 = *(undefined1 (*) [16])(lVar14 + (uVar119 + 2) * (long)p_Var13);
      uVar120 = 0;
      if (uVar121 != 0) {
        for (; (uVar121 >> uVar120 & 1) == 0; uVar120 = uVar120 + 1) {
        }
      }
      local_490 = *(undefined1 (*) [16])(lVar14 + (uVar119 + 3) * (long)p_Var13);
      if (uVar121 != 0) {
        uVar119 = uVar121 - 1 & uVar121;
        uVar120 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                                  *(uint *)(prim + uVar120 * 4 + 6) * _Var12) * (long)p_Var13;
        if ((uVar119 != 0) && (lVar14 = 0, uVar119 != 0)) {
          for (; (uVar119 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
      }
      uVar116 = (uint)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar9 = (ray->org).field_0;
      auVar205 = vsubps_avx(_local_7c0,(undefined1  [16])aVar9);
      auVar129 = _local_7c0;
      auVar225 = vshufps_avx(auVar205,auVar205,0);
      auVar171 = vshufps_avx(auVar205,auVar205,0x55);
      auVar205 = vshufps_avx(auVar205,auVar205,0xaa);
      fVar176 = (pre->ray_space).vx.field_0.m128[0];
      fVar199 = (pre->ray_space).vx.field_0.m128[1];
      fVar219 = (pre->ray_space).vx.field_0.m128[2];
      fVar189 = (pre->ray_space).vx.field_0.m128[3];
      fVar212 = (pre->ray_space).vy.field_0.m128[0];
      fVar231 = (pre->ray_space).vy.field_0.m128[1];
      fVar191 = (pre->ray_space).vy.field_0.m128[2];
      fVar214 = (pre->ray_space).vy.field_0.m128[3];
      fVar233 = (pre->ray_space).vz.field_0.m128[0];
      fVar192 = (pre->ray_space).vz.field_0.m128[1];
      fVar216 = (pre->ray_space).vz.field_0.m128[2];
      fVar235 = (pre->ray_space).vz.field_0.m128[3];
      auVar158._0_4_ =
           auVar225._0_4_ * fVar176 + auVar205._0_4_ * fVar233 + auVar171._0_4_ * fVar212;
      auVar158._4_4_ =
           auVar225._4_4_ * fVar199 + auVar205._4_4_ * fVar192 + auVar171._4_4_ * fVar231;
      auVar158._8_4_ =
           auVar225._8_4_ * fVar219 + auVar205._8_4_ * fVar216 + auVar171._8_4_ * fVar191;
      auVar158._12_4_ =
           auVar225._12_4_ * fVar189 + auVar205._12_4_ * fVar235 + auVar171._12_4_ * fVar214;
      auVar225 = vblendps_avx(auVar158,_local_7c0,8);
      auVar181 = vsubps_avx(local_680,(undefined1  [16])aVar9);
      auVar171 = vshufps_avx(auVar181,auVar181,0);
      auVar205 = vshufps_avx(auVar181,auVar181,0x55);
      auVar181 = vshufps_avx(auVar181,auVar181,0xaa);
      auVar318._0_4_ =
           auVar171._0_4_ * fVar176 + auVar205._0_4_ * fVar212 + auVar181._0_4_ * fVar233;
      auVar318._4_4_ =
           auVar171._4_4_ * fVar199 + auVar205._4_4_ * fVar231 + auVar181._4_4_ * fVar192;
      auVar318._8_4_ =
           auVar171._8_4_ * fVar219 + auVar205._8_4_ * fVar191 + auVar181._8_4_ * fVar216;
      auVar318._12_4_ =
           auVar171._12_4_ * fVar189 + auVar205._12_4_ * fVar214 + auVar181._12_4_ * fVar235;
      auVar171 = vblendps_avx(auVar318,local_680,8);
      auVar19 = vsubps_avx(local_690,(undefined1  [16])aVar9);
      auVar205 = vshufps_avx(auVar19,auVar19,0);
      auVar181 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar224._0_4_ = auVar205._0_4_ * fVar176 + auVar181._0_4_ * fVar212 + auVar19._0_4_ * fVar233
      ;
      auVar224._4_4_ = auVar205._4_4_ * fVar199 + auVar181._4_4_ * fVar231 + auVar19._4_4_ * fVar192
      ;
      auVar224._8_4_ = auVar205._8_4_ * fVar219 + auVar181._8_4_ * fVar191 + auVar19._8_4_ * fVar216
      ;
      auVar224._12_4_ =
           auVar205._12_4_ * fVar189 + auVar181._12_4_ * fVar214 + auVar19._12_4_ * fVar235;
      auVar179 = vshufps_avx(local_690,local_690,0xff);
      auVar157 = local_690;
      auVar205 = vblendps_avx(auVar224,local_690,8);
      auVar128 = vsubps_avx(local_490,(undefined1  [16])aVar9);
      auVar181 = vshufps_avx(auVar128,auVar128,0);
      auVar19 = vshufps_avx(auVar128,auVar128,0x55);
      auVar128 = vshufps_avx(auVar128,auVar128,0xaa);
      auVar264._0_4_ = auVar181._0_4_ * fVar176 + auVar128._0_4_ * fVar233 + auVar19._0_4_ * fVar212
      ;
      auVar264._4_4_ = auVar181._4_4_ * fVar199 + auVar128._4_4_ * fVar192 + auVar19._4_4_ * fVar231
      ;
      auVar264._8_4_ = auVar181._8_4_ * fVar219 + auVar128._8_4_ * fVar216 + auVar19._8_4_ * fVar191
      ;
      auVar264._12_4_ =
           auVar181._12_4_ * fVar189 + auVar128._12_4_ * fVar235 + auVar19._12_4_ * fVar214;
      auVar128 = vshufps_avx(local_490,local_490,0xff);
      auVar127 = local_490;
      auVar181 = vblendps_avx(auVar264,local_490,8);
      auVar204._8_4_ = 0x7fffffff;
      auVar204._0_8_ = 0x7fffffff7fffffff;
      auVar204._12_4_ = 0x7fffffff;
      auVar225 = vandps_avx(auVar225,auVar204);
      auVar171 = vandps_avx(auVar171,auVar204);
      auVar19 = vmaxps_avx(auVar225,auVar171);
      auVar225 = vandps_avx(auVar205,auVar204);
      auVar171 = vandps_avx(auVar181,auVar204);
      auVar225 = vmaxps_avx(auVar225,auVar171);
      auVar225 = vmaxps_avx(auVar19,auVar225);
      auVar171 = vmovshdup_avx(auVar225);
      auVar171 = vmaxss_avx(auVar171,auVar225);
      auVar225 = vshufpd_avx(auVar225,auVar225,1);
      auVar225 = vmaxss_avx(auVar225,auVar171);
      lVar14 = (long)(int)uVar116 * 0x44;
      fVar146 = *(float *)(bspline_basis0 + lVar14 + 0x908);
      fVar148 = *(float *)(bspline_basis0 + lVar14 + 0x90c);
      fVar150 = *(float *)(bspline_basis0 + lVar14 + 0x910);
      fVar153 = *(float *)(bspline_basis0 + lVar14 + 0x914);
      fVar247 = *(float *)(bspline_basis0 + lVar14 + 0x918);
      fVar195 = *(float *)(bspline_basis0 + lVar14 + 0x91c);
      fVar301 = *(float *)(bspline_basis0 + lVar14 + 0x920);
      auVar171 = vshufps_avx(auVar224,auVar224,0);
      register0x00001450 = auVar171;
      _local_4e0 = auVar171;
      auVar205 = vshufps_avx(auVar224,auVar224,0x55);
      register0x00001390 = auVar205;
      _local_760 = auVar205;
      register0x000014d0 = auVar179;
      _local_300 = auVar179;
      fVar272 = *(float *)(bspline_basis0 + lVar14 + 0xd8c);
      fVar273 = *(float *)(bspline_basis0 + lVar14 + 0xd90);
      fVar198 = *(float *)(bspline_basis0 + lVar14 + 0xd94);
      fVar276 = *(float *)(bspline_basis0 + lVar14 + 0xd98);
      fVar124 = *(float *)(bspline_basis0 + lVar14 + 0xd9c);
      fVar139 = *(float *)(bspline_basis0 + lVar14 + 0xda0);
      fVar142 = *(float *)(bspline_basis0 + lVar14 + 0xda4);
      auVar181 = vshufps_avx(auVar264,auVar264,0);
      register0x00001490 = auVar181;
      _local_400 = auVar181;
      auVar19 = vshufps_avx(auVar264,auVar264,0x55);
      register0x00001350 = auVar19;
      _local_720 = auVar19;
      register0x000013d0 = auVar128;
      _local_120 = auVar128;
      fVar257 = auVar181._0_4_;
      fVar258 = auVar181._4_4_;
      fVar259 = auVar181._8_4_;
      fVar283 = auVar181._12_4_;
      fVar220 = auVar19._0_4_;
      fVar232 = auVar19._4_4_;
      fVar234 = auVar19._8_4_;
      fVar236 = auVar19._12_4_;
      fVar250 = auVar171._0_4_;
      fVar254 = auVar171._4_4_;
      fVar255 = auVar171._8_4_;
      fVar256 = auVar171._12_4_;
      fVar237 = auVar205._0_4_;
      fVar244 = auVar205._4_4_;
      fVar245 = auVar205._8_4_;
      fVar246 = auVar205._12_4_;
      fVar302 = auVar128._0_4_;
      fVar303 = auVar128._4_4_;
      fVar193 = auVar128._8_4_;
      fVar196 = auVar128._12_4_;
      fVar291 = auVar179._0_4_;
      fVar293 = auVar179._4_4_;
      fVar295 = auVar179._8_4_;
      auVar171 = vshufps_avx(auVar318,auVar318,0);
      register0x000014d0 = auVar171;
      _local_620 = auVar171;
      pauVar3 = (undefined1 (*) [16])(bspline_basis0 + lVar14 + 0x484);
      fVar199 = *(float *)*pauVar3;
      fVar219 = *(float *)(bspline_basis0 + lVar14 + 0x488);
      fVar189 = *(float *)(bspline_basis0 + lVar14 + 0x48c);
      auVar110 = *(undefined1 (*) [12])*pauVar3;
      fVar145 = *(float *)(bspline_basis0 + lVar14 + 0x490);
      fStack_310 = *(float *)(bspline_basis0 + lVar14 + 0x494);
      fStack_30c = *(float *)(bspline_basis0 + lVar14 + 0x498);
      fStack_308 = *(float *)(bspline_basis0 + lVar14 + 0x49c);
      fStack_304 = *(float *)(bspline_basis0 + lVar14 + 0x4a0);
      fVar292 = auVar171._0_4_;
      fVar294 = auVar171._4_4_;
      fVar296 = auVar171._8_4_;
      fVar305 = auVar171._12_4_;
      auVar171 = vshufps_avx(auVar318,auVar318,0x55);
      register0x00001310 = auVar171;
      _local_5c0 = auVar171;
      fVar200 = auVar171._0_4_;
      fVar213 = auVar171._4_4_;
      fVar215 = auVar171._8_4_;
      fVar217 = auVar171._12_4_;
      auVar19 = local_680;
      auVar171 = vshufps_avx(local_680,local_680,0xff);
      register0x00001590 = auVar171;
      _local_80 = auVar171;
      _local_320 = *pauVar3;
      auVar128 = _local_320;
      fVar329 = auVar171._0_4_;
      fVar332 = auVar171._4_4_;
      fVar334 = auVar171._8_4_;
      fVar336 = auVar171._12_4_;
      fVar175 = *(float *)(bspline_basis0 + lVar14 + 0x924) + 0.0 + 0.0;
      auVar171 = vshufps_avx(auVar158,auVar158,0);
      register0x00001550 = auVar171;
      _local_a0 = auVar171;
      pauVar1 = (undefined1 (*) [32])(bspline_basis0 + lVar14);
      fVar231 = *(float *)*pauVar1;
      fVar191 = *(float *)(bspline_basis0 + lVar14 + 4);
      fVar214 = *(float *)(bspline_basis0 + lVar14 + 8);
      fVar192 = *(float *)(bspline_basis0 + lVar14 + 0xc);
      fVar216 = *(float *)(bspline_basis0 + lVar14 + 0x10);
      fVar235 = *(float *)(bspline_basis0 + lVar14 + 0x14);
      fVar152 = *(float *)(bspline_basis0 + lVar14 + 0x18);
      auVar111 = *(undefined1 (*) [28])*pauVar1;
      fVar315 = auVar171._0_4_;
      fVar323 = auVar171._4_4_;
      fVar325 = auVar171._8_4_;
      fVar327 = auVar171._12_4_;
      auVar309._0_4_ = fVar315 * fVar231 + fVar292 * fVar199 + fVar250 * fVar146 + fVar257 * fVar272
      ;
      auVar309._4_4_ = fVar323 * fVar191 + fVar294 * fVar219 + fVar254 * fVar148 + fVar258 * fVar273
      ;
      auVar309._8_4_ = fVar325 * fVar214 + fVar296 * fVar189 + fVar255 * fVar150 + fVar259 * fVar198
      ;
      auVar309._12_4_ =
           fVar327 * fVar192 + fVar305 * fVar145 + fVar256 * fVar153 + fVar283 * fVar276;
      auVar309._16_4_ =
           fVar315 * fVar216 + fVar292 * fStack_310 + fVar250 * fVar247 + fVar257 * fVar124;
      auVar309._20_4_ =
           fVar323 * fVar235 + fVar294 * fStack_30c + fVar254 * fVar195 + fVar258 * fVar139;
      auVar309._24_4_ =
           fVar325 * fVar152 + fVar296 * fStack_308 + fVar255 * fVar301 + fVar259 * fVar142;
      auVar309._28_4_ = fStack_304 + 0.0;
      auVar171 = vshufps_avx(auVar158,auVar158,0x55);
      register0x00001210 = auVar171;
      _local_100 = auVar171;
      fVar176 = auVar171._0_4_;
      fVar212 = auVar171._4_4_;
      fVar233 = auVar171._8_4_;
      fVar174 = auVar171._12_4_;
      auVar265._0_4_ = fVar231 * fVar176 + fVar200 * fVar199 + fVar237 * fVar146 + fVar220 * fVar272
      ;
      auVar265._4_4_ = fVar191 * fVar212 + fVar213 * fVar219 + fVar244 * fVar148 + fVar232 * fVar273
      ;
      auVar265._8_4_ = fVar214 * fVar233 + fVar215 * fVar189 + fVar245 * fVar150 + fVar234 * fVar198
      ;
      auVar265._12_4_ =
           fVar192 * fVar174 + fVar217 * fVar145 + fVar246 * fVar153 + fVar236 * fVar276;
      auVar265._16_4_ =
           fVar216 * fVar176 + fVar200 * fStack_310 + fVar237 * fVar247 + fVar220 * fVar124;
      auVar265._20_4_ =
           fVar235 * fVar212 + fVar213 * fStack_30c + fVar244 * fVar195 + fVar232 * fVar139;
      auVar265._24_4_ =
           fVar152 * fVar233 + fVar215 * fStack_308 + fVar245 * fVar301 + fVar234 * fVar142;
      auVar265._28_4_ = 0;
      auVar171 = vpermilps_avx(_local_7c0,0xff);
      register0x00001450 = auVar171;
      _local_c0 = auVar171;
      _local_340 = *pauVar1;
      auVar25 = _local_340;
      fVar306 = auVar171._0_4_;
      fVar140 = auVar171._4_4_;
      fVar143 = auVar171._8_4_;
      local_780 = fVar306 * fVar231 + fVar329 * fVar199 + fVar291 * fVar146 + fVar302 * fVar272;
      fStack_77c = fVar140 * fVar191 + fVar332 * fVar219 + fVar293 * fVar148 + fVar303 * fVar273;
      fStack_778 = fVar143 * fVar214 + fVar334 * fVar189 + fVar295 * fVar150 + fVar193 * fVar198;
      fStack_774 = auVar171._12_4_ * fVar192 +
                   fVar336 * fVar145 + auVar179._12_4_ * fVar153 + fVar196 * fVar276;
      fStack_770 = fVar306 * fVar216 + fVar329 * fStack_310 + fVar291 * fVar247 + fVar302 * fVar124;
      fStack_76c = fVar140 * fVar235 + fVar332 * fStack_30c + fVar293 * fVar195 + fVar303 * fVar139;
      fStack_768 = fVar143 * fVar152 + fVar334 * fStack_308 + fVar295 * fVar301 + fVar193 * fVar142;
      fStack_764 = fVar175 + 0.0;
      fVar147 = *(float *)(bspline_basis1 + lVar14 + 0x908);
      fVar149 = *(float *)(bspline_basis1 + lVar14 + 0x90c);
      fVar151 = *(float *)(bspline_basis1 + lVar14 + 0x910);
      fVar125 = *(float *)(bspline_basis1 + lVar14 + 0x914);
      fVar218 = *(float *)(bspline_basis1 + lVar14 + 0x918);
      fVar338 = *(float *)(bspline_basis1 + lVar14 + 0x91c);
      fVar339 = *(float *)(bspline_basis1 + lVar14 + 0x920);
      fVar340 = *(float *)(bspline_basis1 + lVar14 + 0xd8c);
      fVar194 = *(float *)(bspline_basis1 + lVar14 + 0xd90);
      fVar197 = *(float *)(bspline_basis1 + lVar14 + 0xd94);
      fVar271 = *(float *)(bspline_basis1 + lVar14 + 0xd98);
      fVar275 = *(float *)(bspline_basis1 + lVar14 + 0xd9c);
      fVar278 = *(float *)(bspline_basis1 + lVar14 + 0xda0);
      fVar279 = *(float *)(bspline_basis1 + lVar14 + 0xda4);
      auVar165 = *(undefined1 (*) [32])(bspline_basis1 + lVar14 + 0x484);
      auVar243 = ZEXT3264(auVar165);
      fVar199 = auVar165._0_4_;
      fVar231 = auVar165._4_4_;
      fVar192 = auVar165._8_4_;
      fVar152 = auVar165._12_4_;
      fVar190 = auVar165._16_4_;
      fVar304 = auVar165._20_4_;
      fVar126 = auVar165._24_4_;
      fVar189 = fVar327 + fVar175 + 0.0;
      fVar280 = *(float *)(bspline_basis1 + lVar14);
      fVar281 = *(float *)(bspline_basis1 + lVar14 + 4);
      fVar282 = *(float *)(bspline_basis1 + lVar14 + 8);
      fVar290 = *(float *)(bspline_basis1 + lVar14 + 0xc);
      fVar154 = *(float *)(bspline_basis1 + lVar14 + 0x10);
      fVar166 = *(float *)(bspline_basis1 + lVar14 + 0x14);
      fVar249 = *(float *)(bspline_basis1 + lVar14 + 0x18);
      auVar206._0_4_ = fVar315 * fVar280 + fVar292 * fVar199 + fVar147 * fVar250 + fVar257 * fVar340
      ;
      auVar206._4_4_ = fVar323 * fVar281 + fVar294 * fVar231 + fVar149 * fVar254 + fVar258 * fVar194
      ;
      auVar206._8_4_ = fVar325 * fVar282 + fVar296 * fVar192 + fVar151 * fVar255 + fVar259 * fVar197
      ;
      auVar206._12_4_ =
           fVar327 * fVar290 + fVar305 * fVar152 + fVar125 * fVar256 + fVar283 * fVar271;
      auVar206._16_4_ =
           fVar315 * fVar154 + fVar292 * fVar190 + fVar218 * fVar250 + fVar257 * fVar275;
      auVar206._20_4_ =
           fVar323 * fVar166 + fVar294 * fVar304 + fVar338 * fVar254 + fVar258 * fVar278;
      auVar206._24_4_ =
           fVar325 * fVar249 + fVar296 * fVar126 + fVar339 * fVar255 + fVar259 * fVar279;
      auVar206._28_4_ = fVar336 + fVar189;
      auVar183._0_4_ = fVar176 * fVar280 + fVar200 * fVar199 + fVar147 * fVar237 + fVar340 * fVar220
      ;
      auVar183._4_4_ = fVar212 * fVar281 + fVar213 * fVar231 + fVar149 * fVar244 + fVar194 * fVar232
      ;
      auVar183._8_4_ = fVar233 * fVar282 + fVar215 * fVar192 + fVar151 * fVar245 + fVar197 * fVar234
      ;
      auVar183._12_4_ =
           fVar174 * fVar290 + fVar217 * fVar152 + fVar125 * fVar246 + fVar271 * fVar236;
      auVar183._16_4_ =
           fVar176 * fVar154 + fVar200 * fVar190 + fVar218 * fVar237 + fVar275 * fVar220;
      auVar183._20_4_ =
           fVar212 * fVar166 + fVar213 * fVar304 + fVar338 * fVar244 + fVar278 * fVar232;
      auVar183._24_4_ =
           fVar233 * fVar249 + fVar215 * fVar126 + fVar339 * fVar245 + fVar279 * fVar234;
      auVar183._28_4_ = fVar189 + fVar327 + fStack_304 + 0.0;
      auVar285._0_4_ = fVar329 * fVar199 + fVar147 * fVar291 + fVar340 * fVar302 + fVar306 * fVar280
      ;
      auVar285._4_4_ = fVar332 * fVar231 + fVar149 * fVar293 + fVar194 * fVar303 + fVar140 * fVar281
      ;
      auVar285._8_4_ = fVar334 * fVar192 + fVar151 * fVar295 + fVar197 * fVar193 + fVar143 * fVar282
      ;
      auVar285._12_4_ =
           fVar336 * fVar152 + fVar125 * auVar179._12_4_ + fVar271 * fVar196 +
           auVar171._12_4_ * fVar290;
      auVar285._16_4_ =
           fVar329 * fVar190 + fVar218 * fVar291 + fVar275 * fVar302 + fVar306 * fVar154;
      auVar285._20_4_ =
           fVar332 * fVar304 + fVar338 * fVar293 + fVar278 * fVar303 + fVar140 * fVar166;
      auVar285._24_4_ =
           fVar334 * fVar126 + fVar339 * fVar295 + fVar279 * fVar193 + fVar143 * fVar249;
      auVar285._28_4_ = fVar327 + fVar196 + fStack_304 + fVar189;
      _local_3a0 = vsubps_avx(auVar206,auVar309);
      auVar20 = vsubps_avx(auVar183,auVar265);
      fVar219 = local_3a0._0_4_;
      fVar191 = local_3a0._4_4_;
      auVar17._4_4_ = auVar265._4_4_ * fVar191;
      auVar17._0_4_ = auVar265._0_4_ * fVar219;
      fVar216 = local_3a0._8_4_;
      auVar17._8_4_ = auVar265._8_4_ * fVar216;
      fVar175 = local_3a0._12_4_;
      auVar17._12_4_ = auVar265._12_4_ * fVar175;
      fVar303 = local_3a0._16_4_;
      auVar17._16_4_ = auVar265._16_4_ * fVar303;
      fVar196 = local_3a0._20_4_;
      auVar17._20_4_ = auVar265._20_4_ * fVar196;
      fVar140 = local_3a0._24_4_;
      auVar17._24_4_ = auVar265._24_4_ * fVar140;
      auVar17._28_4_ = fVar189;
      fVar189 = auVar20._0_4_;
      fVar214 = auVar20._4_4_;
      auVar21._4_4_ = auVar309._4_4_ * fVar214;
      auVar21._0_4_ = auVar309._0_4_ * fVar189;
      fVar235 = auVar20._8_4_;
      auVar21._8_4_ = auVar309._8_4_ * fVar235;
      fVar302 = auVar20._12_4_;
      auVar21._12_4_ = auVar309._12_4_ * fVar302;
      fVar193 = auVar20._16_4_;
      auVar21._16_4_ = auVar309._16_4_ * fVar193;
      fVar306 = auVar20._20_4_;
      auVar21._20_4_ = auVar309._20_4_ * fVar306;
      fVar143 = auVar20._24_4_;
      auVar21._24_4_ = auVar309._24_4_ * fVar143;
      auVar21._28_4_ = auVar183._28_4_;
      auVar21 = vsubps_avx(auVar17,auVar21);
      auVar18._4_4_ = fStack_77c;
      auVar18._0_4_ = local_780;
      auVar18._8_4_ = fStack_778;
      auVar18._12_4_ = fStack_774;
      auVar18._16_4_ = fStack_770;
      auVar18._20_4_ = fStack_76c;
      auVar18._24_4_ = fStack_768;
      auVar18._28_4_ = fStack_764;
      auVar17 = vmaxps_avx(auVar18,auVar285);
      auVar26._4_4_ = auVar17._4_4_ * auVar17._4_4_ * (fVar191 * fVar191 + fVar214 * fVar214);
      auVar26._0_4_ = auVar17._0_4_ * auVar17._0_4_ * (fVar219 * fVar219 + fVar189 * fVar189);
      auVar26._8_4_ = auVar17._8_4_ * auVar17._8_4_ * (fVar216 * fVar216 + fVar235 * fVar235);
      auVar26._12_4_ = auVar17._12_4_ * auVar17._12_4_ * (fVar175 * fVar175 + fVar302 * fVar302);
      auVar26._16_4_ = auVar17._16_4_ * auVar17._16_4_ * (fVar303 * fVar303 + fVar193 * fVar193);
      auVar26._20_4_ = auVar17._20_4_ * auVar17._20_4_ * (fVar196 * fVar196 + fVar306 * fVar306);
      auVar26._24_4_ = auVar17._24_4_ * auVar17._24_4_ * (fVar140 * fVar140 + fVar143 * fVar143);
      auVar26._28_4_ = auVar20._28_4_ + auVar183._28_4_;
      auVar16._4_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar16._0_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar16._8_4_ = auVar21._8_4_ * auVar21._8_4_;
      auVar16._12_4_ = auVar21._12_4_ * auVar21._12_4_;
      auVar16._16_4_ = auVar21._16_4_ * auVar21._16_4_;
      auVar16._20_4_ = auVar21._20_4_ * auVar21._20_4_;
      auVar16._24_4_ = auVar21._24_4_ * auVar21._24_4_;
      auVar16._28_4_ = auVar21._28_4_;
      auVar17 = vcmpps_avx(auVar16,auVar26,2);
      auVar179 = ZEXT416((uint)(auVar225._0_4_ * 4.7683716e-07));
      _local_7a0 = auVar179;
      local_420 = (float)(int)uVar116;
      fStack_41c = 0.0;
      fStack_418 = 0.0;
      fStack_414 = 0.0;
      auVar225 = vshufps_avx(ZEXT416((uint)local_420),ZEXT416((uint)local_420),0);
      auVar184._16_16_ = auVar225;
      auVar184._0_16_ = auVar225;
      auVar21 = vcmpps_avx(_DAT_02020f40,auVar184,1);
      auVar188 = ZEXT3264(auVar21);
      auVar225 = vpermilps_avx(auVar158,0xaa);
      auVar266._16_16_ = auVar225;
      auVar266._0_16_ = auVar225;
      auVar171 = vpermilps_avx(auVar318,0xaa);
      register0x00001550 = auVar171;
      _local_460 = auVar171;
      auVar205 = vpermilps_avx(auVar224,0xaa);
      register0x00001590 = auVar205;
      _local_e0 = auVar205;
      auVar181 = vpermilps_avx(auVar264,0xaa);
      register0x00001310 = auVar181;
      _local_440 = auVar181;
      auVar26 = auVar21 & auVar17;
      local_5e0._0_16_ = ZEXT416((uint)(ray->org).field_0.m128[3]);
      fVar219 = fVar220;
      fVar189 = fVar232;
      fVar191 = fVar234;
      fVar214 = fVar236;
      fVar216 = fVar200;
      fVar235 = fVar213;
      fVar175 = fVar215;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0x7f,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0xbf,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
      {
        uVar120 = 0;
        auVar314 = ZEXT3264(auVar308);
        auVar300 = ZEXT3264(_local_760);
        auVar211 = ZEXT3264(_local_620);
        local_690 = auVar157;
        local_680 = auVar19;
        local_490 = auVar127;
      }
      else {
        local_360 = vandps_avx(auVar17,auVar21);
        fVar260 = auVar225._0_4_;
        fVar270 = auVar225._4_4_;
        fVar274 = auVar225._8_4_;
        fVar277 = auVar225._12_4_;
        fVar316 = auVar171._0_4_;
        fVar324 = auVar171._4_4_;
        fVar326 = auVar171._8_4_;
        fVar328 = auVar171._12_4_;
        fVar330 = auVar205._0_4_;
        fVar333 = auVar205._4_4_;
        fVar335 = auVar205._8_4_;
        fVar337 = auVar205._12_4_;
        fVar302 = auVar181._0_4_;
        fVar303 = auVar181._4_4_;
        fVar193 = auVar181._8_4_;
        fVar196 = auVar181._12_4_;
        fVar306 = auVar21._28_4_ + *(float *)(bspline_basis1 + lVar14 + 0x924) + 0.0;
        local_380._0_4_ =
             fVar260 * fVar280 + fVar316 * fVar199 + fVar330 * fVar147 + fVar340 * fVar302;
        local_380._4_4_ =
             fVar270 * fVar281 + fVar324 * fVar231 + fVar333 * fVar149 + fVar194 * fVar303;
        fStack_378 = fVar274 * fVar282 + fVar326 * fVar192 + fVar335 * fVar151 + fVar197 * fVar193;
        fStack_374 = fVar277 * fVar290 + fVar328 * fVar152 + fVar337 * fVar125 + fVar271 * fVar196;
        fStack_370 = fVar260 * fVar154 + fVar316 * fVar190 + fVar330 * fVar218 + fVar275 * fVar302;
        fStack_36c = fVar270 * fVar166 + fVar324 * fVar304 + fVar333 * fVar338 + fVar278 * fVar303;
        fStack_368 = fVar274 * fVar249 + fVar326 * fVar126 + fVar335 * fVar339 + fVar279 * fVar193;
        fStack_364 = local_360._28_4_ + fVar306;
        local_340._0_4_ = auVar111._0_4_;
        local_340._4_4_ = auVar111._4_4_;
        fStack_338 = auVar111._8_4_;
        fStack_334 = auVar111._12_4_;
        fStack_330 = auVar111._16_4_;
        fStack_32c = auVar111._20_4_;
        fStack_328 = auVar111._24_4_;
        local_320._0_4_ = auVar110._0_4_;
        local_320._4_4_ = auVar110._4_4_;
        fStack_318 = auVar110._8_4_;
        fVar123 = fVar260 * (float)local_340._0_4_ +
                  fVar316 * (float)local_320._0_4_ + fVar330 * fVar146 + fVar302 * fVar272;
        fVar138 = fVar270 * (float)local_340._4_4_ +
                  fVar324 * (float)local_320._4_4_ + fVar333 * fVar148 + fVar303 * fVar273;
        fVar141 = fVar274 * fStack_338 +
                  fVar326 * fStack_318 + fVar335 * fVar150 + fVar193 * fVar198;
        fVar144 = fVar277 * fStack_334 + fVar328 * fVar145 + fVar337 * fVar153 + fVar196 * fVar276;
        fStack_6f0 = fVar260 * fStack_330 +
                     fVar316 * fStack_310 + fVar330 * fVar247 + fVar302 * fVar124;
        fStack_6ec = fVar270 * fStack_32c +
                     fVar324 * fStack_30c + fVar333 * fVar195 + fVar303 * fVar139;
        fStack_6e8 = fVar274 * fStack_328 +
                     fVar326 * fStack_308 + fVar335 * fVar301 + fVar193 * fVar142;
        fStack_6e4 = fStack_364 + fVar306 + local_360._28_4_ + auVar21._28_4_;
        fVar199 = *(float *)(bspline_basis0 + lVar14 + 0x1210);
        fVar231 = *(float *)(bspline_basis0 + lVar14 + 0x1214);
        fVar192 = *(float *)(bspline_basis0 + lVar14 + 0x1218);
        fVar152 = *(float *)(bspline_basis0 + lVar14 + 0x121c);
        fVar190 = *(float *)(bspline_basis0 + lVar14 + 0x1220);
        fVar304 = *(float *)(bspline_basis0 + lVar14 + 0x1224);
        fVar306 = *(float *)(bspline_basis0 + lVar14 + 0x1228);
        fVar126 = *(float *)(bspline_basis0 + lVar14 + 0x1694);
        fVar140 = *(float *)(bspline_basis0 + lVar14 + 0x1698);
        fVar143 = *(float *)(bspline_basis0 + lVar14 + 0x169c);
        fVar146 = *(float *)(bspline_basis0 + lVar14 + 0x16a0);
        fVar148 = *(float *)(bspline_basis0 + lVar14 + 0x16a4);
        fVar150 = *(float *)(bspline_basis0 + lVar14 + 0x16a8);
        fVar153 = *(float *)(bspline_basis0 + lVar14 + 0x16ac);
        fVar247 = *(float *)(bspline_basis0 + lVar14 + 0x1b18);
        fVar195 = *(float *)(bspline_basis0 + lVar14 + 0x1b1c);
        fVar301 = *(float *)(bspline_basis0 + lVar14 + 0x1b20);
        fVar272 = *(float *)(bspline_basis0 + lVar14 + 0x1b24);
        fVar273 = *(float *)(bspline_basis0 + lVar14 + 0x1b28);
        fVar198 = *(float *)(bspline_basis0 + lVar14 + 0x1b2c);
        fVar276 = *(float *)(bspline_basis0 + lVar14 + 0x1b30);
        fVar124 = *(float *)(bspline_basis0 + lVar14 + 0x1f9c);
        fVar139 = *(float *)(bspline_basis0 + lVar14 + 0x1fa0);
        fVar142 = *(float *)(bspline_basis0 + lVar14 + 0x1fa4);
        fVar145 = *(float *)(bspline_basis0 + lVar14 + 0x1fa8);
        fVar147 = *(float *)(bspline_basis0 + lVar14 + 0x1fac);
        fVar149 = *(float *)(bspline_basis0 + lVar14 + 0x1fb0);
        fVar151 = *(float *)(bspline_basis0 + lVar14 + 0x1fb4);
        _local_560 = auVar266;
        fVar248 = auVar285._28_4_ + auVar165._28_4_;
        fVar125 = *(float *)(bspline_basis0 + lVar14 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar14 + 0x1fb8);
        auVar160._0_4_ =
             fVar176 * fVar199 + fVar237 * fVar247 + fVar220 * fVar124 + fVar200 * fVar126;
        auVar160._4_4_ =
             fVar212 * fVar231 + fVar244 * fVar195 + fVar232 * fVar139 + fVar213 * fVar140;
        auVar160._8_4_ =
             fVar233 * fVar192 + fVar245 * fVar301 + fVar234 * fVar142 + fVar215 * fVar143;
        auVar160._12_4_ =
             fVar174 * fVar152 + fVar246 * fVar272 + fVar236 * fVar145 + fVar217 * fVar146;
        auVar160._16_4_ =
             fVar176 * fVar190 + fVar237 * fVar273 + fVar220 * fVar147 + fVar200 * fVar148;
        auVar160._20_4_ =
             fVar212 * fVar304 + fVar244 * fVar198 + fVar232 * fVar149 + fVar213 * fVar150;
        auVar160._24_4_ =
             fVar233 * fVar306 + fVar245 * fVar276 + fVar234 * fVar151 + fVar215 * fVar153;
        auVar160._28_4_ = fVar125 + auVar285._28_4_ + fVar277 + fVar248;
        auVar267._0_4_ =
             fVar316 * fVar126 + fVar330 * fVar247 + fVar302 * fVar124 + fVar260 * fVar199;
        auVar267._4_4_ =
             fVar324 * fVar140 + fVar333 * fVar195 + fVar303 * fVar139 + fVar270 * fVar231;
        auVar267._8_4_ =
             fVar326 * fVar143 + fVar335 * fVar301 + fVar193 * fVar142 + fVar274 * fVar192;
        auVar267._12_4_ =
             fVar328 * fVar146 + fVar337 * fVar272 + fVar196 * fVar145 + fVar277 * fVar152;
        auVar267._16_4_ =
             fVar316 * fVar148 + fVar330 * fVar273 + fVar302 * fVar147 + fVar260 * fVar190;
        auVar267._20_4_ =
             fVar324 * fVar150 + fVar333 * fVar198 + fVar303 * fVar149 + fVar270 * fVar304;
        auVar267._24_4_ =
             fVar326 * fVar153 + fVar335 * fVar276 + fVar193 * fVar151 + fVar274 * fVar306;
        auVar267._28_4_ =
             *(float *)(bspline_basis0 + lVar14 + 0x16b0) + fVar125 +
             *(float *)(bspline_basis0 + lVar14 + 0x122c);
        fVar125 = *(float *)(bspline_basis1 + lVar14 + 0x1b18);
        fVar218 = *(float *)(bspline_basis1 + lVar14 + 0x1b1c);
        fVar338 = *(float *)(bspline_basis1 + lVar14 + 0x1b20);
        fVar339 = *(float *)(bspline_basis1 + lVar14 + 0x1b24);
        fVar340 = *(float *)(bspline_basis1 + lVar14 + 0x1b28);
        fVar194 = *(float *)(bspline_basis1 + lVar14 + 0x1b2c);
        fVar197 = *(float *)(bspline_basis1 + lVar14 + 0x1b30);
        fVar271 = *(float *)(bspline_basis1 + lVar14 + 0x1f9c);
        fVar275 = *(float *)(bspline_basis1 + lVar14 + 0x1fa0);
        fVar278 = *(float *)(bspline_basis1 + lVar14 + 0x1fa4);
        fVar279 = *(float *)(bspline_basis1 + lVar14 + 0x1fa8);
        fVar280 = *(float *)(bspline_basis1 + lVar14 + 0x1fac);
        fVar281 = *(float *)(bspline_basis1 + lVar14 + 0x1fb0);
        fVar282 = *(float *)(bspline_basis1 + lVar14 + 0x1fb4);
        fVar290 = *(float *)(bspline_basis1 + lVar14 + 0x1694);
        fVar154 = *(float *)(bspline_basis1 + lVar14 + 0x1698);
        fVar166 = *(float *)(bspline_basis1 + lVar14 + 0x169c);
        fVar249 = *(float *)(bspline_basis1 + lVar14 + 0x16a0);
        fVar291 = *(float *)(bspline_basis1 + lVar14 + 0x16a4);
        fVar293 = *(float *)(bspline_basis1 + lVar14 + 0x16a8);
        fVar295 = *(float *)(bspline_basis1 + lVar14 + 0x16ac);
        fVar329 = *(float *)(bspline_basis1 + lVar14 + 0x1210);
        fVar332 = *(float *)(bspline_basis1 + lVar14 + 0x1214);
        fVar334 = *(float *)(bspline_basis1 + lVar14 + 0x1218);
        fVar336 = *(float *)(bspline_basis1 + lVar14 + 0x121c);
        fVar100 = *(float *)(bspline_basis1 + lVar14 + 0x1220);
        fVar101 = *(float *)(bspline_basis1 + lVar14 + 0x1224);
        fVar102 = *(float *)(bspline_basis1 + lVar14 + 0x1228);
        auVar251._0_4_ =
             fVar315 * fVar329 + fVar292 * fVar290 + fVar250 * fVar125 + fVar257 * fVar271;
        auVar251._4_4_ =
             fVar323 * fVar332 + fVar294 * fVar154 + fVar254 * fVar218 + fVar258 * fVar275;
        auVar251._8_4_ =
             fVar325 * fVar334 + fVar296 * fVar166 + fVar255 * fVar338 + fVar259 * fVar278;
        auVar251._12_4_ =
             fVar327 * fVar336 + fVar305 * fVar249 + fVar256 * fVar339 + fVar283 * fVar279;
        auVar251._16_4_ =
             fVar315 * fVar100 + fVar292 * fVar291 + fVar250 * fVar340 + fVar257 * fVar280;
        auVar251._20_4_ =
             fVar323 * fVar101 + fVar294 * fVar293 + fVar254 * fVar194 + fVar258 * fVar281;
        auVar251._24_4_ =
             fVar325 * fVar102 + fVar296 * fVar295 + fVar255 * fVar197 + fVar259 * fVar282;
        auVar251._28_4_ = fVar246 + fVar246 + auVar285._28_4_ + fVar283;
        auVar286._0_4_ =
             fVar176 * fVar329 + fVar200 * fVar290 + fVar237 * fVar125 + fVar220 * fVar271;
        auVar286._4_4_ =
             fVar212 * fVar332 + fVar213 * fVar154 + fVar244 * fVar218 + fVar232 * fVar275;
        auVar286._8_4_ =
             fVar233 * fVar334 + fVar215 * fVar166 + fVar245 * fVar338 + fVar234 * fVar278;
        auVar286._12_4_ =
             fVar174 * fVar336 + fVar217 * fVar249 + fVar246 * fVar339 + fVar236 * fVar279;
        auVar286._16_4_ =
             fVar176 * fVar100 + fVar200 * fVar291 + fVar237 * fVar340 + fVar220 * fVar280;
        auVar286._20_4_ =
             fVar212 * fVar101 + fVar213 * fVar293 + fVar244 * fVar194 + fVar232 * fVar281;
        auVar286._24_4_ =
             fVar233 * fVar102 + fVar215 * fVar295 + fVar245 * fVar197 + fVar234 * fVar282;
        auVar286._28_4_ = fVar246 + fVar246 + fVar246 + auVar285._28_4_;
        auVar173._0_4_ =
             fVar260 * fVar329 + fVar316 * fVar290 + fVar330 * fVar125 + fVar271 * fVar302;
        auVar173._4_4_ =
             fVar270 * fVar332 + fVar324 * fVar154 + fVar333 * fVar218 + fVar275 * fVar303;
        auVar173._8_4_ =
             fVar274 * fVar334 + fVar326 * fVar166 + fVar335 * fVar338 + fVar278 * fVar193;
        auVar173._12_4_ =
             fVar277 * fVar336 + fVar328 * fVar249 + fVar337 * fVar339 + fVar279 * fVar196;
        auVar173._16_4_ =
             fVar260 * fVar100 + fVar316 * fVar291 + fVar330 * fVar340 + fVar280 * fVar302;
        auVar173._20_4_ =
             fVar270 * fVar101 + fVar324 * fVar293 + fVar333 * fVar194 + fVar281 * fVar303;
        auVar173._24_4_ =
             fVar274 * fVar102 + fVar326 * fVar295 + fVar335 * fVar197 + fVar282 * fVar193;
        auVar173._28_4_ =
             *(float *)(bspline_basis1 + lVar14 + 0x122c) +
             *(float *)(bspline_basis1 + lVar14 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar14 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar14 + 0x1fb8);
        auVar207._8_4_ = 0x7fffffff;
        auVar207._0_8_ = 0x7fffffff7fffffff;
        auVar207._12_4_ = 0x7fffffff;
        auVar207._16_4_ = 0x7fffffff;
        auVar207._20_4_ = 0x7fffffff;
        auVar207._24_4_ = 0x7fffffff;
        auVar207._28_4_ = 0x7fffffff;
        auVar106._4_4_ =
             fVar323 * fVar231 + fVar294 * fVar140 + fVar254 * fVar195 + fVar258 * fVar139;
        auVar106._0_4_ =
             fVar315 * fVar199 + fVar292 * fVar126 + fVar250 * fVar247 + fVar257 * fVar124;
        auVar106._8_4_ =
             fVar325 * fVar192 + fVar296 * fVar143 + fVar255 * fVar301 + fVar259 * fVar142;
        auVar106._12_4_ =
             fVar327 * fVar152 + fVar305 * fVar146 + fVar256 * fVar272 + fVar283 * fVar145;
        auVar106._16_4_ =
             fVar315 * fVar190 + fVar292 * fVar148 + fVar250 * fVar273 + fVar257 * fVar147;
        auVar106._20_4_ =
             fVar323 * fVar304 + fVar294 * fVar150 + fVar254 * fVar198 + fVar258 * fVar149;
        auVar106._24_4_ =
             fVar325 * fVar306 + fVar296 * fVar153 + fVar255 * fVar276 + fVar259 * fVar151;
        auVar106._28_4_ =
             *(float *)(bspline_basis0 + lVar14 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar14 + 0x1fb8) + fVar248;
        auVar165 = vandps_avx(auVar106,auVar207);
        auVar17 = vandps_avx(auVar160,auVar207);
        auVar17 = vmaxps_avx(auVar165,auVar17);
        auVar165 = vandps_avx(auVar267,auVar207);
        auVar165 = vmaxps_avx(auVar17,auVar165);
        auVar225 = vpermilps_avx(auVar179,0);
        auVar239._16_16_ = auVar225;
        auVar239._0_16_ = auVar225;
        auVar165 = vcmpps_avx(auVar165,auVar239,1);
        auVar21 = vblendvps_avx(auVar106,_local_3a0,auVar165);
        auVar26 = vblendvps_avx(auVar160,auVar20,auVar165);
        auVar165 = vandps_avx(auVar251,auVar207);
        auVar17 = vandps_avx(auVar286,auVar207);
        auVar16 = vmaxps_avx(auVar165,auVar17);
        auVar165 = vandps_avx(auVar173,auVar207);
        auVar165 = vmaxps_avx(auVar16,auVar165);
        auVar16 = vcmpps_avx(auVar165,auVar239,1);
        auVar165 = vblendvps_avx(auVar251,_local_3a0,auVar16);
        auVar20 = vblendvps_avx(auVar286,auVar20,auVar16);
        fVar124 = auVar21._0_4_;
        fVar139 = auVar21._4_4_;
        fVar142 = auVar21._8_4_;
        fVar145 = auVar21._12_4_;
        fVar147 = auVar21._16_4_;
        fVar149 = auVar21._20_4_;
        fVar151 = auVar21._24_4_;
        fVar125 = auVar165._0_4_;
        fVar218 = auVar165._4_4_;
        fVar338 = auVar165._8_4_;
        fVar339 = auVar165._12_4_;
        fVar340 = auVar165._16_4_;
        fVar194 = auVar165._20_4_;
        fVar197 = auVar165._24_4_;
        fStack_504 = -auVar165._28_4_;
        fVar176 = auVar26._0_4_;
        fVar233 = auVar26._4_4_;
        fVar302 = auVar26._8_4_;
        fVar304 = auVar26._12_4_;
        fVar140 = auVar26._16_4_;
        fVar150 = auVar26._20_4_;
        fVar301 = auVar26._24_4_;
        auVar132._0_4_ = fVar176 * fVar176 + fVar124 * fVar124;
        auVar132._4_4_ = fVar233 * fVar233 + fVar139 * fVar139;
        auVar132._8_4_ = fVar302 * fVar302 + fVar142 * fVar142;
        auVar132._12_4_ = fVar304 * fVar304 + fVar145 * fVar145;
        auVar132._16_4_ = fVar140 * fVar140 + fVar147 * fVar147;
        auVar132._20_4_ = fVar150 * fVar150 + fVar149 * fVar149;
        auVar132._24_4_ = fVar301 * fVar301 + fVar151 * fVar151;
        auVar132._28_4_ = auVar286._28_4_ + auVar21._28_4_;
        auVar21 = vrsqrtps_avx(auVar132);
        fVar199 = auVar21._0_4_;
        fVar212 = auVar21._4_4_;
        auVar22._4_4_ = fVar212 * 1.5;
        auVar22._0_4_ = fVar199 * 1.5;
        fVar231 = auVar21._8_4_;
        auVar22._8_4_ = fVar231 * 1.5;
        fVar192 = auVar21._12_4_;
        auVar22._12_4_ = fVar192 * 1.5;
        fVar174 = auVar21._16_4_;
        auVar22._16_4_ = fVar174 * 1.5;
        fVar152 = auVar21._20_4_;
        auVar22._20_4_ = fVar152 * 1.5;
        fVar190 = auVar21._24_4_;
        fVar276 = auVar17._28_4_;
        auVar22._24_4_ = fVar190 * 1.5;
        auVar22._28_4_ = fVar276;
        auVar23._4_4_ = fVar212 * fVar212 * fVar212 * auVar132._4_4_ * 0.5;
        auVar23._0_4_ = fVar199 * fVar199 * fVar199 * auVar132._0_4_ * 0.5;
        auVar23._8_4_ = fVar231 * fVar231 * fVar231 * auVar132._8_4_ * 0.5;
        auVar23._12_4_ = fVar192 * fVar192 * fVar192 * auVar132._12_4_ * 0.5;
        auVar23._16_4_ = fVar174 * fVar174 * fVar174 * auVar132._16_4_ * 0.5;
        auVar23._20_4_ = fVar152 * fVar152 * fVar152 * auVar132._20_4_ * 0.5;
        auVar23._24_4_ = fVar190 * fVar190 * fVar190 * auVar132._24_4_ * 0.5;
        auVar23._28_4_ = auVar132._28_4_;
        auVar17 = vsubps_avx(auVar22,auVar23);
        fVar199 = auVar17._0_4_;
        fVar192 = auVar17._4_4_;
        fVar190 = auVar17._8_4_;
        fVar196 = auVar17._12_4_;
        fVar143 = auVar17._16_4_;
        fVar153 = auVar17._20_4_;
        fVar272 = auVar17._24_4_;
        fVar212 = auVar20._0_4_;
        fVar174 = auVar20._4_4_;
        fVar303 = auVar20._8_4_;
        fVar306 = auVar20._12_4_;
        fVar146 = auVar20._16_4_;
        fVar247 = auVar20._20_4_;
        fVar273 = auVar20._24_4_;
        auVar133._0_4_ = fVar212 * fVar212 + fVar125 * fVar125;
        auVar133._4_4_ = fVar174 * fVar174 + fVar218 * fVar218;
        auVar133._8_4_ = fVar303 * fVar303 + fVar338 * fVar338;
        auVar133._12_4_ = fVar306 * fVar306 + fVar339 * fVar339;
        auVar133._16_4_ = fVar146 * fVar146 + fVar340 * fVar340;
        auVar133._20_4_ = fVar247 * fVar247 + fVar194 * fVar194;
        auVar133._24_4_ = fVar273 * fVar273 + fVar197 * fVar197;
        auVar133._28_4_ = auVar165._28_4_ + auVar17._28_4_;
        auVar165 = vrsqrtps_avx(auVar133);
        fVar231 = auVar165._0_4_;
        fVar152 = auVar165._4_4_;
        auVar24._4_4_ = fVar152 * 1.5;
        auVar24._0_4_ = fVar231 * 1.5;
        fVar193 = auVar165._8_4_;
        auVar24._8_4_ = fVar193 * 1.5;
        fVar126 = auVar165._12_4_;
        auVar24._12_4_ = fVar126 * 1.5;
        fVar148 = auVar165._16_4_;
        auVar24._16_4_ = fVar148 * 1.5;
        fVar195 = auVar165._20_4_;
        auVar24._20_4_ = fVar195 * 1.5;
        fVar198 = auVar165._24_4_;
        auVar24._24_4_ = fVar198 * 1.5;
        auVar24._28_4_ = fVar276;
        auVar165._4_4_ = fVar152 * fVar152 * fVar152 * auVar133._4_4_ * 0.5;
        auVar165._0_4_ = fVar231 * fVar231 * fVar231 * auVar133._0_4_ * 0.5;
        auVar165._8_4_ = fVar193 * fVar193 * fVar193 * auVar133._8_4_ * 0.5;
        auVar165._12_4_ = fVar126 * fVar126 * fVar126 * auVar133._12_4_ * 0.5;
        auVar165._16_4_ = fVar148 * fVar148 * fVar148 * auVar133._16_4_ * 0.5;
        auVar165._20_4_ = fVar195 * fVar195 * fVar195 * auVar133._20_4_ * 0.5;
        auVar165._24_4_ = fVar198 * fVar198 * fVar198 * auVar133._24_4_ * 0.5;
        auVar165._28_4_ = auVar133._28_4_;
        auVar165 = vsubps_avx(auVar24,auVar165);
        fVar231 = auVar165._0_4_;
        fVar152 = auVar165._4_4_;
        fVar193 = auVar165._8_4_;
        fVar126 = auVar165._12_4_;
        fVar148 = auVar165._16_4_;
        fVar195 = auVar165._20_4_;
        fVar198 = auVar165._24_4_;
        local_520 = local_780 * fVar176 * fVar199;
        fStack_51c = fStack_77c * fVar233 * fVar192;
        auVar27._4_4_ = fStack_51c;
        auVar27._0_4_ = local_520;
        fStack_518 = fStack_778 * fVar302 * fVar190;
        auVar27._8_4_ = fStack_518;
        fStack_514 = fStack_774 * fVar304 * fVar196;
        auVar27._12_4_ = fStack_514;
        fStack_510 = fStack_770 * fVar140 * fVar143;
        auVar27._16_4_ = fStack_510;
        fStack_50c = fStack_76c * fVar150 * fVar153;
        auVar27._20_4_ = fStack_50c;
        fStack_508 = fStack_768 * fVar301 * fVar272;
        auVar27._24_4_ = fStack_508;
        auVar27._28_4_ = fStack_504;
        local_520 = auVar309._0_4_ + local_520;
        fStack_51c = auVar309._4_4_ + fStack_51c;
        fStack_518 = auVar309._8_4_ + fStack_518;
        fStack_514 = auVar309._12_4_ + fStack_514;
        fStack_510 = auVar309._16_4_ + fStack_510;
        fStack_50c = auVar309._20_4_ + fStack_50c;
        fStack_508 = auVar309._24_4_ + fStack_508;
        fStack_504 = auVar309._28_4_ + fStack_504;
        fVar176 = local_780 * fVar199 * -fVar124;
        fVar233 = fStack_77c * fVar192 * -fVar139;
        auVar28._4_4_ = fVar233;
        auVar28._0_4_ = fVar176;
        fVar302 = fStack_778 * fVar190 * -fVar142;
        auVar28._8_4_ = fVar302;
        fVar304 = fStack_774 * fVar196 * -fVar145;
        auVar28._12_4_ = fVar304;
        fVar140 = fStack_770 * fVar143 * -fVar147;
        auVar28._16_4_ = fVar140;
        fVar150 = fStack_76c * fVar153 * -fVar149;
        auVar28._20_4_ = fVar150;
        fVar301 = fStack_768 * fVar272 * -fVar151;
        auVar28._24_4_ = fVar301;
        auVar28._28_4_ = fVar276;
        local_4c0._4_4_ = fVar233 + auVar265._4_4_;
        local_4c0._0_4_ = fVar176 + auVar265._0_4_;
        fStack_4b8 = fVar302 + auVar265._8_4_;
        fStack_4b4 = fVar304 + auVar265._12_4_;
        fStack_4b0 = fVar140 + auVar265._16_4_;
        fStack_4ac = fVar150 + auVar265._20_4_;
        fStack_4a8 = fVar301 + auVar265._24_4_;
        fStack_4a4 = fVar276 + 0.0;
        fVar176 = local_780 * fVar199 * 0.0;
        fVar199 = fStack_77c * fVar192 * 0.0;
        auVar29._4_4_ = fVar199;
        auVar29._0_4_ = fVar176;
        fVar233 = fStack_778 * fVar190 * 0.0;
        auVar29._8_4_ = fVar233;
        fVar192 = fStack_774 * fVar196 * 0.0;
        auVar29._12_4_ = fVar192;
        fVar302 = fStack_770 * fVar143 * 0.0;
        auVar29._16_4_ = fVar302;
        fVar190 = fStack_76c * fVar153 * 0.0;
        auVar29._20_4_ = fVar190;
        fVar304 = fStack_768 * fVar272 * 0.0;
        auVar29._24_4_ = fVar304;
        auVar29._28_4_ = fVar305;
        auVar104._4_4_ = fVar138;
        auVar104._0_4_ = fVar123;
        auVar104._8_4_ = fVar141;
        auVar104._12_4_ = fVar144;
        auVar104._16_4_ = fStack_6f0;
        auVar104._20_4_ = fStack_6ec;
        auVar104._24_4_ = fStack_6e8;
        auVar104._28_4_ = fStack_6e4;
        auVar240._0_4_ = fVar123 + fVar176;
        auVar240._4_4_ = fVar138 + fVar199;
        auVar240._8_4_ = fVar141 + fVar233;
        auVar240._12_4_ = fVar144 + fVar192;
        auVar240._16_4_ = fStack_6f0 + fVar302;
        auVar240._20_4_ = fStack_6ec + fVar190;
        auVar240._24_4_ = fStack_6e8 + fVar304;
        auVar240._28_4_ = fStack_6e4 + fVar305;
        fVar176 = auVar285._0_4_ * fVar212 * fVar231;
        fVar199 = auVar285._4_4_ * fVar174 * fVar152;
        auVar30._4_4_ = fVar199;
        auVar30._0_4_ = fVar176;
        fVar212 = auVar285._8_4_ * fVar303 * fVar193;
        auVar30._8_4_ = fVar212;
        fVar233 = auVar285._12_4_ * fVar306 * fVar126;
        auVar30._12_4_ = fVar233;
        fVar192 = auVar285._16_4_ * fVar146 * fVar148;
        auVar30._16_4_ = fVar192;
        fVar174 = auVar285._20_4_ * fVar247 * fVar195;
        auVar30._20_4_ = fVar174;
        fVar302 = auVar285._24_4_ * fVar273 * fVar198;
        auVar30._24_4_ = fVar302;
        auVar30._28_4_ = auVar20._28_4_;
        auVar16 = vsubps_avx(auVar309,auVar27);
        auVar287._0_4_ = auVar206._0_4_ + fVar176;
        auVar287._4_4_ = auVar206._4_4_ + fVar199;
        auVar287._8_4_ = auVar206._8_4_ + fVar212;
        auVar287._12_4_ = auVar206._12_4_ + fVar233;
        auVar287._16_4_ = auVar206._16_4_ + fVar192;
        auVar287._20_4_ = auVar206._20_4_ + fVar174;
        auVar287._24_4_ = auVar206._24_4_ + fVar302;
        auVar287._28_4_ = auVar206._28_4_ + auVar20._28_4_;
        fVar176 = auVar285._0_4_ * fVar231 * -fVar125;
        fVar199 = auVar285._4_4_ * fVar152 * -fVar218;
        auVar20._4_4_ = fVar199;
        auVar20._0_4_ = fVar176;
        fVar212 = auVar285._8_4_ * fVar193 * -fVar338;
        auVar20._8_4_ = fVar212;
        fVar233 = auVar285._12_4_ * fVar126 * -fVar339;
        auVar20._12_4_ = fVar233;
        fVar192 = auVar285._16_4_ * fVar148 * -fVar340;
        auVar20._16_4_ = fVar192;
        fVar174 = auVar285._20_4_ * fVar195 * -fVar194;
        auVar20._20_4_ = fVar174;
        fVar302 = auVar285._24_4_ * fVar198 * -fVar197;
        auVar20._24_4_ = fVar302;
        auVar20._28_4_ = fVar328;
        auVar18 = vsubps_avx(auVar265,auVar28);
        auVar297._0_4_ = fVar176 + auVar183._0_4_;
        auVar297._4_4_ = fVar199 + auVar183._4_4_;
        auVar297._8_4_ = fVar212 + auVar183._8_4_;
        auVar297._12_4_ = fVar233 + auVar183._12_4_;
        auVar297._16_4_ = fVar192 + auVar183._16_4_;
        auVar297._20_4_ = fVar174 + auVar183._20_4_;
        auVar297._24_4_ = fVar302 + auVar183._24_4_;
        auVar297._28_4_ = fVar328 + auVar183._28_4_;
        fVar176 = auVar285._0_4_ * fVar231 * 0.0;
        fVar199 = auVar285._4_4_ * fVar152 * 0.0;
        auVar31._4_4_ = fVar199;
        auVar31._0_4_ = fVar176;
        fVar212 = auVar285._8_4_ * fVar193 * 0.0;
        auVar31._8_4_ = fVar212;
        fVar231 = auVar285._12_4_ * fVar126 * 0.0;
        auVar31._12_4_ = fVar231;
        fVar233 = auVar285._16_4_ * fVar148 * 0.0;
        auVar31._16_4_ = fVar233;
        fVar192 = auVar285._20_4_ * fVar195 * 0.0;
        auVar31._20_4_ = fVar192;
        fVar174 = auVar285._24_4_ * fVar198 * 0.0;
        auVar31._24_4_ = fVar174;
        auVar31._28_4_ = 0x3f000000;
        auVar184 = vsubps_avx(auVar104,auVar29);
        auVar331._0_4_ = fVar176 + (float)local_380._0_4_;
        auVar331._4_4_ = fVar199 + (float)local_380._4_4_;
        auVar331._8_4_ = fVar212 + fStack_378;
        auVar331._12_4_ = fVar231 + fStack_374;
        auVar331._16_4_ = fVar233 + fStack_370;
        auVar331._20_4_ = fVar192 + fStack_36c;
        auVar331._24_4_ = fVar174 + fStack_368;
        auVar331._28_4_ = fStack_364 + 0.5;
        auVar165 = vsubps_avx(auVar206,auVar30);
        auVar17 = vsubps_avx(auVar183,auVar20);
        auVar265 = vsubps_avx(_local_380,auVar31);
        auVar21 = vsubps_avx(auVar297,auVar18);
        auVar20 = vsubps_avx(auVar331,auVar184);
        auVar32._4_4_ = auVar184._4_4_ * auVar21._4_4_;
        auVar32._0_4_ = auVar184._0_4_ * auVar21._0_4_;
        auVar32._8_4_ = auVar184._8_4_ * auVar21._8_4_;
        auVar32._12_4_ = auVar184._12_4_ * auVar21._12_4_;
        auVar32._16_4_ = auVar184._16_4_ * auVar21._16_4_;
        auVar32._20_4_ = auVar184._20_4_ * auVar21._20_4_;
        auVar32._24_4_ = auVar184._24_4_ * auVar21._24_4_;
        auVar32._28_4_ = fVar327;
        auVar33._4_4_ = auVar18._4_4_ * auVar20._4_4_;
        auVar33._0_4_ = auVar18._0_4_ * auVar20._0_4_;
        auVar33._8_4_ = auVar18._8_4_ * auVar20._8_4_;
        auVar33._12_4_ = auVar18._12_4_ * auVar20._12_4_;
        auVar33._16_4_ = auVar18._16_4_ * auVar20._16_4_;
        auVar33._20_4_ = auVar18._20_4_ * auVar20._20_4_;
        auVar33._24_4_ = auVar18._24_4_ * auVar20._24_4_;
        auVar33._28_4_ = fStack_364;
        auVar26 = vsubps_avx(auVar33,auVar32);
        auVar34._4_4_ = auVar16._4_4_ * auVar20._4_4_;
        auVar34._0_4_ = auVar16._0_4_ * auVar20._0_4_;
        auVar34._8_4_ = auVar16._8_4_ * auVar20._8_4_;
        auVar34._12_4_ = auVar16._12_4_ * auVar20._12_4_;
        auVar34._16_4_ = auVar16._16_4_ * auVar20._16_4_;
        auVar34._20_4_ = auVar16._20_4_ * auVar20._20_4_;
        auVar34._24_4_ = auVar16._24_4_ * auVar20._24_4_;
        auVar34._28_4_ = auVar20._28_4_;
        auVar22 = vsubps_avx(auVar287,auVar16);
        auVar35._4_4_ = auVar184._4_4_ * auVar22._4_4_;
        auVar35._0_4_ = auVar184._0_4_ * auVar22._0_4_;
        auVar35._8_4_ = auVar184._8_4_ * auVar22._8_4_;
        auVar35._12_4_ = auVar184._12_4_ * auVar22._12_4_;
        auVar35._16_4_ = auVar184._16_4_ * auVar22._16_4_;
        auVar35._20_4_ = auVar184._20_4_ * auVar22._20_4_;
        auVar35._24_4_ = auVar184._24_4_ * auVar22._24_4_;
        auVar35._28_4_ = auVar206._28_4_;
        auVar206 = vsubps_avx(auVar35,auVar34);
        auVar36._4_4_ = auVar22._4_4_ * auVar18._4_4_;
        auVar36._0_4_ = auVar22._0_4_ * auVar18._0_4_;
        auVar36._8_4_ = auVar22._8_4_ * auVar18._8_4_;
        auVar36._12_4_ = auVar22._12_4_ * auVar18._12_4_;
        auVar36._16_4_ = auVar22._16_4_ * auVar18._16_4_;
        auVar36._20_4_ = auVar22._20_4_ * auVar18._20_4_;
        auVar36._24_4_ = auVar22._24_4_ * auVar18._24_4_;
        auVar36._28_4_ = auVar20._28_4_;
        auVar37._4_4_ = auVar16._4_4_ * auVar21._4_4_;
        auVar37._0_4_ = auVar16._0_4_ * auVar21._0_4_;
        auVar37._8_4_ = auVar16._8_4_ * auVar21._8_4_;
        auVar37._12_4_ = auVar16._12_4_ * auVar21._12_4_;
        auVar37._16_4_ = auVar16._16_4_ * auVar21._16_4_;
        auVar37._20_4_ = auVar16._20_4_ * auVar21._20_4_;
        auVar37._24_4_ = auVar16._24_4_ * auVar21._24_4_;
        auVar37._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar37,auVar36);
        auVar134._0_4_ = auVar26._0_4_ * 0.0 + auVar21._0_4_ + auVar206._0_4_ * 0.0;
        auVar134._4_4_ = auVar26._4_4_ * 0.0 + auVar21._4_4_ + auVar206._4_4_ * 0.0;
        auVar134._8_4_ = auVar26._8_4_ * 0.0 + auVar21._8_4_ + auVar206._8_4_ * 0.0;
        auVar134._12_4_ = auVar26._12_4_ * 0.0 + auVar21._12_4_ + auVar206._12_4_ * 0.0;
        auVar134._16_4_ = auVar26._16_4_ * 0.0 + auVar21._16_4_ + auVar206._16_4_ * 0.0;
        auVar134._20_4_ = auVar26._20_4_ * 0.0 + auVar21._20_4_ + auVar206._20_4_ * 0.0;
        auVar134._24_4_ = auVar26._24_4_ * 0.0 + auVar21._24_4_ + auVar206._24_4_ * 0.0;
        auVar134._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar206._28_4_;
        auVar206 = vcmpps_avx(auVar134,ZEXT432(0) << 0x20,2);
        auVar107._4_4_ = fStack_51c;
        auVar107._0_4_ = local_520;
        auVar107._8_4_ = fStack_518;
        auVar107._12_4_ = fStack_514;
        auVar107._16_4_ = fStack_510;
        auVar107._20_4_ = fStack_50c;
        auVar107._24_4_ = fStack_508;
        auVar107._28_4_ = fStack_504;
        _local_640 = vblendvps_avx(auVar165,auVar107,auVar206);
        auVar165 = vblendvps_avx(auVar17,_local_4c0,auVar206);
        auVar17 = vblendvps_avx(auVar265,auVar240,auVar206);
        auVar243 = ZEXT3264(auVar17);
        auVar21 = vblendvps_avx(auVar16,auVar287,auVar206);
        auVar20 = vblendvps_avx(auVar18,auVar297,auVar206);
        auVar26 = vblendvps_avx(auVar184,auVar331,auVar206);
        auVar16 = vblendvps_avx(auVar287,auVar16,auVar206);
        auVar18 = vblendvps_avx(auVar297,auVar18,auVar206);
        local_540 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auStack_530 = auVar309._16_16_;
        auVar184 = vblendvps_avx(auVar331,auVar184,auVar206);
        auVar16 = vsubps_avx(auVar16,_local_640);
        auVar309 = vsubps_avx(auVar18,auVar165);
        auVar184 = vsubps_avx(auVar184,auVar17);
        auVar22 = vsubps_avx(auVar165,auVar20);
        fVar176 = auVar309._0_4_;
        fVar151 = auVar17._0_4_;
        fVar192 = auVar309._4_4_;
        fVar125 = auVar17._4_4_;
        auVar38._4_4_ = fVar125 * fVar192;
        auVar38._0_4_ = fVar151 * fVar176;
        fVar303 = auVar309._8_4_;
        fVar218 = auVar17._8_4_;
        auVar38._8_4_ = fVar218 * fVar303;
        fVar126 = auVar309._12_4_;
        fVar338 = auVar17._12_4_;
        auVar38._12_4_ = fVar338 * fVar126;
        fVar150 = auVar309._16_4_;
        fVar339 = auVar17._16_4_;
        auVar38._16_4_ = fVar339 * fVar150;
        fVar272 = auVar309._20_4_;
        fVar340 = auVar17._20_4_;
        auVar38._20_4_ = fVar340 * fVar272;
        fVar139 = auVar309._24_4_;
        fVar194 = auVar17._24_4_;
        auVar38._24_4_ = fVar194 * fVar139;
        auVar38._28_4_ = auVar18._28_4_;
        fVar199 = auVar165._0_4_;
        fVar282 = auVar184._0_4_;
        fVar174 = auVar165._4_4_;
        fVar290 = auVar184._4_4_;
        auVar39._4_4_ = fVar290 * fVar174;
        auVar39._0_4_ = fVar282 * fVar199;
        fVar193 = auVar165._8_4_;
        fVar154 = auVar184._8_4_;
        auVar39._8_4_ = fVar154 * fVar193;
        fVar140 = auVar165._12_4_;
        fVar166 = auVar184._12_4_;
        auVar39._12_4_ = fVar166 * fVar140;
        fVar153 = auVar165._16_4_;
        fVar249 = auVar184._16_4_;
        auVar39._16_4_ = fVar249 * fVar153;
        fVar273 = auVar165._20_4_;
        fVar237 = auVar184._20_4_;
        auVar39._20_4_ = fVar237 * fVar273;
        fVar142 = auVar165._24_4_;
        fVar244 = auVar184._24_4_;
        uVar8 = auVar265._28_4_;
        auVar39._24_4_ = fVar244 * fVar142;
        auVar39._28_4_ = uVar8;
        auVar18 = vsubps_avx(auVar39,auVar38);
        fVar212 = local_640._0_4_;
        fVar152 = local_640._4_4_;
        auVar40._4_4_ = fVar290 * fVar152;
        auVar40._0_4_ = fVar282 * fVar212;
        fVar304 = local_640._8_4_;
        auVar40._8_4_ = fVar154 * fVar304;
        fVar143 = local_640._12_4_;
        auVar40._12_4_ = fVar166 * fVar143;
        fVar247 = local_640._16_4_;
        auVar40._16_4_ = fVar249 * fVar247;
        fVar198 = local_640._20_4_;
        auVar40._20_4_ = fVar237 * fVar198;
        fVar145 = local_640._24_4_;
        auVar40._24_4_ = fVar244 * fVar145;
        auVar40._28_4_ = uVar8;
        fVar231 = auVar16._0_4_;
        fVar302 = auVar16._4_4_;
        auVar41._4_4_ = fVar125 * fVar302;
        auVar41._0_4_ = fVar151 * fVar231;
        fVar196 = auVar16._8_4_;
        auVar41._8_4_ = fVar218 * fVar196;
        fVar146 = auVar16._12_4_;
        auVar41._12_4_ = fVar338 * fVar146;
        fVar195 = auVar16._16_4_;
        auVar41._16_4_ = fVar339 * fVar195;
        fVar276 = auVar16._20_4_;
        auVar41._20_4_ = fVar340 * fVar276;
        fVar147 = auVar16._24_4_;
        auVar41._24_4_ = fVar194 * fVar147;
        auVar41._28_4_ = auVar331._28_4_;
        auVar265 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = fVar174 * fVar302;
        auVar42._0_4_ = fVar199 * fVar231;
        auVar42._8_4_ = fVar193 * fVar196;
        auVar42._12_4_ = fVar140 * fVar146;
        auVar42._16_4_ = fVar153 * fVar195;
        auVar42._20_4_ = fVar273 * fVar276;
        auVar42._24_4_ = fVar142 * fVar147;
        auVar42._28_4_ = uVar8;
        auVar341._0_4_ = fVar212 * fVar176;
        auVar341._4_4_ = fVar152 * fVar192;
        auVar341._8_4_ = fVar304 * fVar303;
        auVar341._12_4_ = fVar143 * fVar126;
        auVar341._16_4_ = fVar247 * fVar150;
        auVar341._20_4_ = fVar198 * fVar272;
        auVar341._24_4_ = fVar145 * fVar139;
        auVar341._28_4_ = 0;
        auVar23 = vsubps_avx(auVar341,auVar42);
        auVar24 = vsubps_avx(auVar17,auVar26);
        fVar233 = auVar23._28_4_ + auVar265._28_4_;
        auVar161._0_4_ = auVar23._0_4_ + auVar265._0_4_ * 0.0 + auVar18._0_4_ * 0.0;
        auVar161._4_4_ = auVar23._4_4_ + auVar265._4_4_ * 0.0 + auVar18._4_4_ * 0.0;
        auVar161._8_4_ = auVar23._8_4_ + auVar265._8_4_ * 0.0 + auVar18._8_4_ * 0.0;
        auVar161._12_4_ = auVar23._12_4_ + auVar265._12_4_ * 0.0 + auVar18._12_4_ * 0.0;
        auVar161._16_4_ = auVar23._16_4_ + auVar265._16_4_ * 0.0 + auVar18._16_4_ * 0.0;
        auVar161._20_4_ = auVar23._20_4_ + auVar265._20_4_ * 0.0 + auVar18._20_4_ * 0.0;
        auVar161._24_4_ = auVar23._24_4_ + auVar265._24_4_ * 0.0 + auVar18._24_4_ * 0.0;
        auVar161._28_4_ = fVar233 + auVar18._28_4_;
        fVar197 = auVar22._0_4_;
        fVar271 = auVar22._4_4_;
        auVar43._4_4_ = fVar271 * auVar26._4_4_;
        auVar43._0_4_ = fVar197 * auVar26._0_4_;
        fVar275 = auVar22._8_4_;
        auVar43._8_4_ = fVar275 * auVar26._8_4_;
        fVar278 = auVar22._12_4_;
        auVar43._12_4_ = fVar278 * auVar26._12_4_;
        fVar279 = auVar22._16_4_;
        auVar43._16_4_ = fVar279 * auVar26._16_4_;
        fVar280 = auVar22._20_4_;
        auVar43._20_4_ = fVar280 * auVar26._20_4_;
        fVar281 = auVar22._24_4_;
        auVar43._24_4_ = fVar281 * auVar26._24_4_;
        auVar43._28_4_ = fVar233;
        fVar233 = auVar24._0_4_;
        fVar190 = auVar24._4_4_;
        auVar44._4_4_ = auVar20._4_4_ * fVar190;
        auVar44._0_4_ = auVar20._0_4_ * fVar233;
        fVar306 = auVar24._8_4_;
        auVar44._8_4_ = auVar20._8_4_ * fVar306;
        fVar148 = auVar24._12_4_;
        auVar44._12_4_ = auVar20._12_4_ * fVar148;
        fVar301 = auVar24._16_4_;
        auVar44._16_4_ = auVar20._16_4_ * fVar301;
        fVar124 = auVar24._20_4_;
        auVar44._20_4_ = auVar20._20_4_ * fVar124;
        fVar149 = auVar24._24_4_;
        auVar44._24_4_ = auVar20._24_4_ * fVar149;
        auVar44._28_4_ = auVar23._28_4_;
        auVar265 = vsubps_avx(auVar44,auVar43);
        auVar22 = vsubps_avx(_local_640,auVar21);
        fVar245 = auVar22._0_4_;
        fVar246 = auVar22._4_4_;
        auVar45._4_4_ = fVar246 * auVar26._4_4_;
        auVar45._0_4_ = fVar245 * auVar26._0_4_;
        fVar250 = auVar22._8_4_;
        auVar45._8_4_ = fVar250 * auVar26._8_4_;
        fVar254 = auVar22._12_4_;
        auVar45._12_4_ = fVar254 * auVar26._12_4_;
        fVar255 = auVar22._16_4_;
        auVar45._16_4_ = fVar255 * auVar26._16_4_;
        fVar256 = auVar22._20_4_;
        auVar45._20_4_ = fVar256 * auVar26._20_4_;
        fVar257 = auVar22._24_4_;
        auVar45._24_4_ = fVar257 * auVar26._24_4_;
        auVar45._28_4_ = auVar26._28_4_;
        auVar46._4_4_ = auVar21._4_4_ * fVar190;
        auVar46._0_4_ = auVar21._0_4_ * fVar233;
        auVar46._8_4_ = auVar21._8_4_ * fVar306;
        auVar46._12_4_ = auVar21._12_4_ * fVar148;
        auVar46._16_4_ = auVar21._16_4_ * fVar301;
        auVar46._20_4_ = auVar21._20_4_ * fVar124;
        auVar46._24_4_ = auVar21._24_4_ * fVar149;
        auVar46._28_4_ = auVar18._28_4_;
        auVar18 = vsubps_avx(auVar45,auVar46);
        auVar47._4_4_ = auVar20._4_4_ * fVar246;
        auVar47._0_4_ = auVar20._0_4_ * fVar245;
        auVar47._8_4_ = auVar20._8_4_ * fVar250;
        auVar47._12_4_ = auVar20._12_4_ * fVar254;
        auVar47._16_4_ = auVar20._16_4_ * fVar255;
        auVar47._20_4_ = auVar20._20_4_ * fVar256;
        auVar47._24_4_ = auVar20._24_4_ * fVar257;
        auVar47._28_4_ = auVar26._28_4_;
        auVar48._4_4_ = auVar21._4_4_ * fVar271;
        auVar48._0_4_ = auVar21._0_4_ * fVar197;
        auVar48._8_4_ = auVar21._8_4_ * fVar275;
        auVar48._12_4_ = auVar21._12_4_ * fVar278;
        auVar48._16_4_ = auVar21._16_4_ * fVar279;
        auVar48._20_4_ = auVar21._20_4_ * fVar280;
        auVar48._24_4_ = auVar21._24_4_ * fVar281;
        auVar48._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar48,auVar47);
        auVar208._0_4_ = auVar265._0_4_ * 0.0 + auVar21._0_4_ + auVar18._0_4_ * 0.0;
        auVar208._4_4_ = auVar265._4_4_ * 0.0 + auVar21._4_4_ + auVar18._4_4_ * 0.0;
        auVar208._8_4_ = auVar265._8_4_ * 0.0 + auVar21._8_4_ + auVar18._8_4_ * 0.0;
        auVar208._12_4_ = auVar265._12_4_ * 0.0 + auVar21._12_4_ + auVar18._12_4_ * 0.0;
        auVar208._16_4_ = auVar265._16_4_ * 0.0 + auVar21._16_4_ + auVar18._16_4_ * 0.0;
        auVar208._20_4_ = auVar265._20_4_ * 0.0 + auVar21._20_4_ + auVar18._20_4_ * 0.0;
        auVar208._24_4_ = auVar265._24_4_ * 0.0 + auVar21._24_4_ + auVar18._24_4_ * 0.0;
        auVar208._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar18._28_4_;
        auVar21 = vmaxps_avx(auVar161,auVar208);
        auVar21 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,2);
        auVar225 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        auVar225 = vpand_avx(auVar225,local_540);
        auVar171 = vpmovsxwd_avx(auVar225);
        auVar205 = vpunpckhwd_avx(auVar225,auVar225);
        auVar185._16_16_ = auVar205;
        auVar185._0_16_ = auVar171;
        if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar185 >> 0x7f,0) == '\0') &&
              (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar205 >> 0x3f,0) == '\0') &&
            (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar205[0xf]) {
LAB_00fa9ce1:
          auVar228._8_8_ = uStack_478;
          auVar228._0_8_ = local_480;
          auVar228._16_8_ = uStack_470;
          auVar228._24_8_ = uStack_468;
          auVar314 = ZEXT3264(auVar308);
          auVar188 = ZEXT3264(auVar185);
          auVar308._4_4_ = fStack_77c;
          auVar308._0_4_ = local_780;
          auVar308._8_4_ = fStack_778;
          auVar308._12_4_ = fStack_774;
          auVar308._16_4_ = fStack_770;
          auVar308._20_4_ = fStack_76c;
          auVar308._24_4_ = fStack_768;
          auVar308._28_4_ = fStack_764;
        }
        else {
          auVar49._4_4_ = fVar190 * fVar192;
          auVar49._0_4_ = fVar233 * fVar176;
          auVar49._8_4_ = fVar306 * fVar303;
          auVar49._12_4_ = fVar148 * fVar126;
          auVar49._16_4_ = fVar301 * fVar150;
          auVar49._20_4_ = fVar124 * fVar272;
          auVar49._24_4_ = fVar149 * fVar139;
          auVar49._28_4_ = auVar205._12_4_;
          auVar310._0_4_ = fVar197 * fVar282;
          auVar310._4_4_ = fVar271 * fVar290;
          auVar310._8_4_ = fVar275 * fVar154;
          auVar310._12_4_ = fVar278 * fVar166;
          auVar310._16_4_ = fVar279 * fVar249;
          auVar310._20_4_ = fVar280 * fVar237;
          auVar310._24_4_ = fVar281 * fVar244;
          auVar310._28_4_ = 0;
          auVar21 = vsubps_avx(auVar310,auVar49);
          auVar50._4_4_ = fVar246 * fVar290;
          auVar50._0_4_ = fVar245 * fVar282;
          auVar50._8_4_ = fVar250 * fVar154;
          auVar50._12_4_ = fVar254 * fVar166;
          auVar50._16_4_ = fVar255 * fVar249;
          auVar50._20_4_ = fVar256 * fVar237;
          auVar50._24_4_ = fVar257 * fVar244;
          auVar50._28_4_ = auVar184._28_4_;
          auVar51._4_4_ = fVar190 * fVar302;
          auVar51._0_4_ = fVar233 * fVar231;
          auVar51._8_4_ = fVar306 * fVar196;
          auVar51._12_4_ = fVar148 * fVar146;
          auVar51._16_4_ = fVar301 * fVar195;
          auVar51._20_4_ = fVar124 * fVar276;
          auVar51._24_4_ = fVar149 * fVar147;
          auVar51._28_4_ = auVar24._28_4_;
          auVar26 = vsubps_avx(auVar51,auVar50);
          auVar52._4_4_ = fVar271 * fVar302;
          auVar52._0_4_ = fVar197 * fVar231;
          auVar52._8_4_ = fVar275 * fVar196;
          auVar52._12_4_ = fVar278 * fVar146;
          auVar52._16_4_ = fVar279 * fVar195;
          auVar52._20_4_ = fVar280 * fVar276;
          auVar52._24_4_ = fVar281 * fVar147;
          auVar52._28_4_ = auVar161._28_4_;
          auVar53._4_4_ = fVar246 * fVar192;
          auVar53._0_4_ = fVar245 * fVar176;
          auVar53._8_4_ = fVar250 * fVar303;
          auVar53._12_4_ = fVar254 * fVar126;
          auVar53._16_4_ = fVar255 * fVar150;
          auVar53._20_4_ = fVar256 * fVar272;
          auVar53._24_4_ = fVar257 * fVar139;
          auVar53._28_4_ = auVar309._28_4_;
          auVar18 = vsubps_avx(auVar53,auVar52);
          auVar252._0_4_ = auVar21._0_4_ * 0.0 + auVar18._0_4_ + auVar26._0_4_ * 0.0;
          auVar252._4_4_ = auVar21._4_4_ * 0.0 + auVar18._4_4_ + auVar26._4_4_ * 0.0;
          auVar252._8_4_ = auVar21._8_4_ * 0.0 + auVar18._8_4_ + auVar26._8_4_ * 0.0;
          auVar252._12_4_ = auVar21._12_4_ * 0.0 + auVar18._12_4_ + auVar26._12_4_ * 0.0;
          auVar252._16_4_ = auVar21._16_4_ * 0.0 + auVar18._16_4_ + auVar26._16_4_ * 0.0;
          auVar252._20_4_ = auVar21._20_4_ * 0.0 + auVar18._20_4_ + auVar26._20_4_ * 0.0;
          auVar252._24_4_ = auVar21._24_4_ * 0.0 + auVar18._24_4_ + auVar26._24_4_ * 0.0;
          auVar252._28_4_ = auVar309._28_4_ + auVar18._28_4_ + auVar161._28_4_;
          auVar20 = vrcpps_avx(auVar252);
          fVar231 = auVar20._0_4_;
          fVar233 = auVar20._4_4_;
          auVar54._4_4_ = auVar252._4_4_ * fVar233;
          auVar54._0_4_ = auVar252._0_4_ * fVar231;
          fVar192 = auVar20._8_4_;
          auVar54._8_4_ = auVar252._8_4_ * fVar192;
          fVar302 = auVar20._12_4_;
          auVar54._12_4_ = auVar252._12_4_ * fVar302;
          fVar190 = auVar20._16_4_;
          auVar54._16_4_ = auVar252._16_4_ * fVar190;
          fVar303 = auVar20._20_4_;
          auVar54._20_4_ = auVar252._20_4_ * fVar303;
          fVar196 = auVar20._24_4_;
          auVar54._24_4_ = auVar252._24_4_ * fVar196;
          auVar54._28_4_ = auVar24._28_4_;
          auVar311._8_4_ = 0x3f800000;
          auVar311._0_8_ = &DAT_3f8000003f800000;
          auVar311._12_4_ = 0x3f800000;
          auVar311._16_4_ = 0x3f800000;
          auVar311._20_4_ = 0x3f800000;
          auVar311._24_4_ = 0x3f800000;
          auVar311._28_4_ = 0x3f800000;
          auVar184 = vsubps_avx(auVar311,auVar54);
          fVar231 = auVar184._0_4_ * fVar231 + fVar231;
          fVar233 = auVar184._4_4_ * fVar233 + fVar233;
          fVar192 = auVar184._8_4_ * fVar192 + fVar192;
          fVar302 = auVar184._12_4_ * fVar302 + fVar302;
          fVar190 = auVar184._16_4_ * fVar190 + fVar190;
          fVar303 = auVar184._20_4_ * fVar303 + fVar303;
          fVar196 = auVar184._24_4_ * fVar196 + fVar196;
          auVar55._4_4_ =
               (auVar21._4_4_ * fVar152 + auVar26._4_4_ * fVar174 + auVar18._4_4_ * fVar125) *
               fVar233;
          auVar55._0_4_ =
               (auVar21._0_4_ * fVar212 + auVar26._0_4_ * fVar199 + auVar18._0_4_ * fVar151) *
               fVar231;
          auVar55._8_4_ =
               (auVar21._8_4_ * fVar304 + auVar26._8_4_ * fVar193 + auVar18._8_4_ * fVar218) *
               fVar192;
          auVar55._12_4_ =
               (auVar21._12_4_ * fVar143 + auVar26._12_4_ * fVar140 + auVar18._12_4_ * fVar338) *
               fVar302;
          auVar55._16_4_ =
               (auVar21._16_4_ * fVar247 + auVar26._16_4_ * fVar153 + auVar18._16_4_ * fVar339) *
               fVar190;
          auVar55._20_4_ =
               (auVar21._20_4_ * fVar198 + auVar26._20_4_ * fVar273 + auVar18._20_4_ * fVar340) *
               fVar303;
          auVar55._24_4_ =
               (auVar21._24_4_ * fVar145 + auVar26._24_4_ * fVar142 + auVar18._24_4_ * fVar194) *
               fVar196;
          auVar55._28_4_ = local_640._28_4_ + auVar16._28_4_ + auVar17._28_4_;
          auVar171 = vpermilps_avx(local_5e0._0_16_,0);
          auVar186._16_16_ = auVar171;
          auVar186._0_16_ = auVar171;
          auVar17 = vcmpps_avx(auVar186,auVar55,2);
          fVar176 = ray->tfar;
          auVar226._4_4_ = fVar176;
          auVar226._0_4_ = fVar176;
          auVar226._8_4_ = fVar176;
          auVar226._12_4_ = fVar176;
          auVar226._16_4_ = fVar176;
          auVar226._20_4_ = fVar176;
          auVar226._24_4_ = fVar176;
          auVar226._28_4_ = fVar176;
          auVar21 = vcmpps_avx(auVar55,auVar226,2);
          auVar17 = vandps_avx(auVar21,auVar17);
          auVar171 = vpackssdw_avx(auVar17._0_16_,auVar17._16_16_);
          auVar225 = vpand_avx(auVar225,auVar171);
          auVar171 = vpmovsxwd_avx(auVar225);
          auVar205 = vpshufd_avx(auVar225,0xee);
          auVar205 = vpmovsxwd_avx(auVar205);
          auVar243 = ZEXT1664(auVar205);
          auVar185._16_16_ = auVar205;
          auVar185._0_16_ = auVar171;
          if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar185 >> 0x7f,0) == '\0') &&
                (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar205 >> 0x3f,0) == '\0') &&
              (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar205[0xf]) goto LAB_00fa9ce1;
          auVar17 = vcmpps_avx(ZEXT832(0) << 0x20,auVar252,4);
          auVar171 = vpackssdw_avx(auVar17._0_16_,auVar17._16_16_);
          auVar225 = vpand_avx(auVar225,auVar171);
          auVar171 = vpmovsxwd_avx(auVar225);
          auVar225 = vpunpckhwd_avx(auVar225,auVar225);
          auVar188 = ZEXT1664(auVar225);
          auVar241._16_16_ = auVar225;
          auVar241._0_16_ = auVar171;
          auVar243 = ZEXT3264(auVar241);
          auVar228._8_8_ = uStack_478;
          auVar228._0_8_ = local_480;
          auVar228._16_8_ = uStack_470;
          auVar228._24_8_ = uStack_468;
          auVar314 = ZEXT3264(auVar308);
          auVar308._4_4_ = fStack_77c;
          auVar308._0_4_ = local_780;
          auVar308._8_4_ = fStack_778;
          auVar308._12_4_ = fStack_774;
          auVar308._16_4_ = fStack_770;
          auVar308._20_4_ = fStack_76c;
          auVar308._24_4_ = fStack_768;
          auVar308._28_4_ = fStack_764;
          if ((((((((auVar241 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar241 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar241 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar241 >> 0x7f,0) != '\0') ||
                (auVar241 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar225 >> 0x3f,0) != '\0') ||
              (auVar241 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar225[0xf] < '\0') {
            auVar187._0_4_ = auVar161._0_4_ * fVar231;
            auVar187._4_4_ = auVar161._4_4_ * fVar233;
            auVar187._8_4_ = auVar161._8_4_ * fVar192;
            auVar187._12_4_ = auVar161._12_4_ * fVar302;
            auVar187._16_4_ = auVar161._16_4_ * fVar190;
            auVar187._20_4_ = auVar161._20_4_ * fVar303;
            auVar187._24_4_ = auVar161._24_4_ * fVar196;
            auVar187._28_4_ = 0;
            auVar56._4_4_ = auVar208._4_4_ * fVar233;
            auVar56._0_4_ = auVar208._0_4_ * fVar231;
            auVar56._8_4_ = auVar208._8_4_ * fVar192;
            auVar56._12_4_ = auVar208._12_4_ * fVar302;
            auVar56._16_4_ = auVar208._16_4_ * fVar190;
            auVar56._20_4_ = auVar208._20_4_ * fVar303;
            auVar56._24_4_ = auVar208._24_4_ * fVar196;
            auVar56._28_4_ = auVar184._28_4_ + auVar20._28_4_;
            auVar227._8_4_ = 0x3f800000;
            auVar227._0_8_ = &DAT_3f8000003f800000;
            auVar227._12_4_ = 0x3f800000;
            auVar227._16_4_ = 0x3f800000;
            auVar227._20_4_ = 0x3f800000;
            auVar227._24_4_ = 0x3f800000;
            auVar227._28_4_ = 0x3f800000;
            auVar17 = vsubps_avx(auVar227,auVar187);
            local_140 = vblendvps_avx(auVar17,auVar187,auVar206);
            auVar17 = vsubps_avx(auVar227,auVar56);
            auVar188 = ZEXT3264(auVar17);
            _local_3c0 = vblendvps_avx(auVar17,auVar56,auVar206);
            auVar314 = ZEXT3264(auVar55);
            auVar228 = auVar241;
          }
        }
        if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar228 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar228 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar228 >> 0x7f,0) != '\0') ||
              (auVar228 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar228 >> 0xbf,0) != '\0') ||
            (auVar228 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar228[0x1f] < '\0') {
          auVar17 = vsubps_avx(auVar285,auVar308);
          auVar188 = ZEXT3264(local_140);
          fVar199 = auVar308._0_4_ + auVar17._0_4_ * local_140._0_4_;
          fVar212 = auVar308._4_4_ + auVar17._4_4_ * local_140._4_4_;
          fVar231 = auVar308._8_4_ + auVar17._8_4_ * local_140._8_4_;
          fVar233 = auVar308._12_4_ + auVar17._12_4_ * local_140._12_4_;
          fVar192 = auVar308._16_4_ + auVar17._16_4_ * local_140._16_4_;
          fVar174 = auVar308._20_4_ + auVar17._20_4_ * local_140._20_4_;
          fVar152 = auVar308._24_4_ + auVar17._24_4_ * local_140._24_4_;
          fVar302 = auVar308._28_4_ + auVar17._28_4_;
          fVar176 = pre->depth_scale;
          auVar57._4_4_ = (fVar212 + fVar212) * fVar176;
          auVar57._0_4_ = (fVar199 + fVar199) * fVar176;
          auVar57._8_4_ = (fVar231 + fVar231) * fVar176;
          auVar57._12_4_ = (fVar233 + fVar233) * fVar176;
          auVar57._16_4_ = (fVar192 + fVar192) * fVar176;
          auVar57._20_4_ = (fVar174 + fVar174) * fVar176;
          auVar57._24_4_ = (fVar152 + fVar152) * fVar176;
          auVar57._28_4_ = fVar302 + fVar302;
          local_280 = auVar314._0_32_;
          auVar308 = vcmpps_avx(local_280,auVar57,6);
          auVar17 = auVar228 & auVar308;
          auVar211 = ZEXT3264(_local_620);
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0x7f,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0x1f] < '\0') {
            local_200 = vandps_avx(auVar308,auVar228);
            local_2a0 = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
            fStack_29c = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
            fStack_298 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
            fStack_294 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
            fStack_290 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
            fStack_28c = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
            fStack_288 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
            fStack_284 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
            local_2c0 = local_140;
            local_260 = 0;
            local_25c = uVar116;
            local_250 = local_7c0;
            uStack_248 = local_7c0._8_8_;
            local_240 = local_680._0_8_;
            uStack_238 = local_680._8_8_;
            local_230 = local_690._0_8_;
            uStack_228 = local_690._8_8_;
            local_220 = local_490._0_8_;
            uStack_218 = local_490._8_8_;
            local_3c0._4_4_ = fStack_29c;
            local_3c0._0_4_ = local_2a0;
            uStack_3b8._0_4_ = fStack_298;
            uStack_3b8._4_4_ = fStack_294;
            uStack_3b0._0_4_ = fStack_290;
            uStack_3b0._4_4_ = fStack_28c;
            auVar114 = _local_3c0;
            uStack_3a8._0_4_ = fStack_288;
            uStack_3a8._4_4_ = fStack_284;
            auVar308 = _local_3c0;
            if ((pGVar11->mask & ray->mask) != 0) {
              auVar300 = ZEXT3264(_local_760);
              auVar269 = ZEXT3264(auVar266);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar120 = CONCAT71((int7)(uVar120 >> 8),1), local_690 = auVar157,
                 local_680 = auVar19, local_490 = auVar127,
                 pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar169._0_4_ = 1.0 / local_420;
                auVar169._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar225 = vshufps_avx(auVar169,auVar169,0);
                local_1e0[0] = auVar225._0_4_ * (local_140._0_4_ + 0.0);
                local_1e0[1] = auVar225._4_4_ * (local_140._4_4_ + 1.0);
                local_1e0[2] = auVar225._8_4_ * (local_140._8_4_ + 2.0);
                local_1e0[3] = auVar225._12_4_ * (local_140._12_4_ + 3.0);
                fStack_1d0 = auVar225._0_4_ * (local_140._16_4_ + 4.0);
                fStack_1cc = auVar225._4_4_ * (local_140._20_4_ + 5.0);
                fStack_1c8 = auVar225._8_4_ * (local_140._24_4_ + 6.0);
                fStack_1c4 = (float)local_140._28_4_ + 7.0;
                uStack_3b0 = auVar114._16_8_;
                uStack_3a8 = auVar308._24_8_;
                local_1c0 = local_3c0;
                uStack_1b8 = uStack_3b8;
                uStack_1b0 = uStack_3b0;
                uStack_1a8 = uStack_3a8;
                local_1a0 = local_280;
                iVar117 = vmovmskps_avx(local_200);
                local_6e0._0_8_ = CONCAT44((int)((ulong)context->args >> 0x20),iVar117);
                lVar122 = 0;
                if (local_6e0._0_8_ != 0) {
                  for (; ((ulong)local_6e0._0_8_ >> lVar122 & 1) == 0; lVar122 = lVar122 + 1) {
                  }
                }
                uVar120 = CONCAT71((int7)(uVar120 >> 8),iVar117 != 0);
                local_690 = auVar157;
                local_680 = auVar19;
                local_490 = auVar127;
                _local_3c0 = auVar308;
                if (iVar117 != 0) {
                  local_6e0._8_24_ = auVar285._8_24_;
                  _auStack_5f0 = auVar165._16_16_;
                  _local_600 = local_680;
                  _auStack_4f0 = auVar183._16_16_;
                  _local_500 = local_690;
                  local_700 = local_490._0_4_;
                  fStack_6fc = local_490._4_4_;
                  fStack_6f8 = local_490._8_4_;
                  fStack_6f4 = local_490._12_4_;
                  local_6c0 = local_280;
                  local_7d0 = context;
                  local_7c8 = ray;
                  local_7a8 = pre;
                  fVar176 = (float)local_7c0._0_4_;
                  fVar199 = (float)local_7c0._4_4_;
                  fVar219 = (float)uStack_7b8;
                  fVar189 = uStack_7b8._4_4_;
                  _local_7c0 = auVar129;
                  _local_340 = auVar25;
                  _local_320 = auVar128;
                  do {
                    local_594 = local_1e0[lVar122];
                    local_590 = *(undefined4 *)((long)&local_1c0 + lVar122 * 4);
                    local_640._0_4_ = ray->tfar;
                    local_540._0_8_ = lVar122;
                    ray->tfar = *(float *)(local_1a0 + lVar122 * 4);
                    local_670.context = context->user;
                    fVar231 = 1.0 - local_594;
                    fVar212 = local_594 * fVar231 * 4.0;
                    auVar243 = ZEXT464(0x3f000000);
                    auVar225 = ZEXT416((uint)(local_594 * local_594 * 0.5));
                    auVar225 = vshufps_avx(auVar225,auVar225,0);
                    auVar171 = ZEXT416((uint)((fVar231 * fVar231 + fVar212) * 0.5));
                    auVar171 = vshufps_avx(auVar171,auVar171,0);
                    auVar205 = ZEXT416((uint)((-local_594 * local_594 - fVar212) * 0.5));
                    auVar205 = vshufps_avx(auVar205,auVar205,0);
                    auVar181 = ZEXT416((uint)(fVar231 * -fVar231 * 0.5));
                    auVar181 = vshufps_avx(auVar181,auVar181,0);
                    auVar180._0_4_ = fVar176 * auVar181._0_4_;
                    auVar180._4_4_ = fVar199 * auVar181._4_4_;
                    auVar180._8_4_ = fVar219 * auVar181._8_4_;
                    auVar180._12_4_ = fVar189 * auVar181._12_4_;
                    auVar188 = ZEXT1664(auVar180);
                    auVar170._0_4_ =
                         auVar180._0_4_ +
                         auVar205._0_4_ * (float)local_600._0_4_ +
                         auVar225._0_4_ * local_700 + auVar171._0_4_ * (float)local_500._0_4_;
                    auVar170._4_4_ =
                         auVar180._4_4_ +
                         auVar205._4_4_ * (float)local_600._4_4_ +
                         auVar225._4_4_ * fStack_6fc + auVar171._4_4_ * (float)local_500._4_4_;
                    auVar170._8_4_ =
                         auVar180._8_4_ +
                         auVar205._8_4_ * fStack_5f8 +
                         auVar225._8_4_ * fStack_6f8 + auVar171._8_4_ * fStack_4f8;
                    auVar170._12_4_ =
                         auVar180._12_4_ +
                         auVar205._12_4_ * fStack_5f4 +
                         auVar225._12_4_ * fStack_6f4 + auVar171._12_4_ * fStack_4f4;
                    local_5a0 = vmovlps_avx(auVar170);
                    local_598 = vextractps_avx(auVar170,2);
                    local_58c = (int)local_568;
                    local_588 = (int)local_728;
                    local_584 = (local_670.context)->instID[0];
                    local_580 = (local_670.context)->instPrimID[0];
                    local_7d4 = -1;
                    local_670.valid = &local_7d4;
                    local_670.geometryUserPtr = pGVar11->userPtr;
                    local_670.ray = (RTCRayN *)ray;
                    local_670.hit = (RTCHitN *)&local_5a0;
                    local_670.N = 1;
                    local_780 = (float)(uint)uVar120;
                    if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00fa8d4a:
                      auVar266 = auVar269._0_32_;
                      p_Var13 = context->args->filter;
                      auVar129 = _local_7c0;
                      if (p_Var13 == (RTCFilterFunctionN)0x0) break;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                        auVar188 = ZEXT1664(auVar188._0_16_);
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        (*p_Var13)(&local_670);
                        uVar120 = (ulong)(uint)local_780;
                        auVar269 = ZEXT3264(_local_560);
                        auVar300 = ZEXT3264(_local_760);
                        auVar314 = ZEXT3264(local_6c0);
                        ray = local_7c8;
                        context = local_7d0;
                        pre = local_7a8;
                        fVar176 = (float)local_7c0._0_4_;
                        fVar199 = (float)local_7c0._4_4_;
                        fVar219 = (float)uStack_7b8;
                        fVar189 = uStack_7b8._4_4_;
                        fVar200 = (float)local_5c0._0_4_;
                        fVar213 = (float)local_5c0._4_4_;
                        fVar215 = fStack_5b8;
                        fVar217 = fStack_5b4;
                        fVar216 = fStack_5b0;
                        fVar235 = fStack_5ac;
                        fVar175 = fStack_5a8;
                      }
                      auVar266 = auVar269._0_32_;
                      auVar129 = _local_7c0;
                      if (*local_670.valid != 0) break;
                    }
                    else {
                      auVar188 = ZEXT1664(auVar180);
                      auVar243 = ZEXT1664(auVar243._0_16_);
                      (*pGVar11->occlusionFilterN)(&local_670);
                      uVar120 = (ulong)(uint)local_780;
                      auVar269 = ZEXT3264(_local_560);
                      auVar300 = ZEXT3264(_local_760);
                      auVar314 = ZEXT3264(local_6c0);
                      ray = local_7c8;
                      context = local_7d0;
                      pre = local_7a8;
                      fVar176 = (float)local_7c0._0_4_;
                      fVar199 = (float)local_7c0._4_4_;
                      fVar219 = (float)uStack_7b8;
                      fVar189 = uStack_7b8._4_4_;
                      fVar200 = (float)local_5c0._0_4_;
                      fVar213 = (float)local_5c0._4_4_;
                      fVar215 = fStack_5b8;
                      fVar217 = fStack_5b4;
                      fVar216 = fStack_5b0;
                      fVar235 = fStack_5ac;
                      fVar175 = fStack_5a8;
                      if (*local_670.valid != 0) goto LAB_00fa8d4a;
                    }
                    auVar266 = auVar269._0_32_;
                    ray->tfar = (float)local_640._0_4_;
                    uVar119 = local_6e0._0_8_ ^ 1L << (local_540._0_8_ & 0x3f);
                    lVar122 = 0;
                    if (uVar119 != 0) {
                      for (; (uVar119 >> lVar122 & 1) == 0; lVar122 = lVar122 + 1) {
                      }
                    }
                    local_6e0._0_8_ = uVar119;
                    uVar120 = CONCAT71((int7)(uVar120 >> 8),uVar119 != 0);
                    auVar129 = _local_7c0;
                  } while (uVar119 != 0);
                }
                _local_7c0 = auVar129;
                uVar120 = uVar120 & 0xffffffffffffff01;
                auVar211 = ZEXT3264(_local_620);
                fVar220 = (float)local_720._0_4_;
                fVar232 = (float)local_720._4_4_;
                fVar234 = fStack_718;
                fVar236 = fStack_714;
                fVar219 = fStack_710;
                fVar189 = fStack_70c;
                fVar191 = fStack_708;
                fVar214 = fStack_704;
                auVar129 = _local_7c0;
              }
              goto LAB_00fa898a;
            }
          }
        }
        auVar211 = ZEXT3264(_local_620);
        uVar120 = 0;
        auVar300 = ZEXT3264(_local_760);
        local_690 = auVar157;
        local_680 = auVar19;
        local_490 = auVar127;
      }
LAB_00fa898a:
      _local_7c0 = auVar129;
      local_7c8 = ray;
      local_7d0 = context;
      local_7a8 = pre;
      if (8 < (int)uVar116) {
        _local_320 = vpshufd_avx(ZEXT416(uVar116),0);
        auVar225 = vshufps_avx(_local_7a0,_local_7a0,0);
        local_360._16_16_ = auVar225;
        local_360._0_16_ = auVar225;
        auVar225 = vpermilps_avx(local_5e0._0_16_,0);
        register0x00001210 = auVar225;
        _local_380 = auVar225;
        auVar131._0_4_ = 1.0 / local_420;
        auVar131._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar225 = vshufps_avx(auVar131,auVar131,0);
        register0x00001210 = auVar225;
        _local_3a0 = auVar225;
        lVar122 = 8;
        local_6c0 = auVar314._0_32_;
        _local_620 = auVar211._0_32_;
        _local_560 = auVar266;
        fVar176 = (float)local_4e0._0_4_;
        fVar199 = (float)local_4e0._4_4_;
        fVar212 = fStack_4d8;
        fVar231 = fStack_4d4;
        fVar233 = fStack_4d0;
        fVar192 = fStack_4cc;
        fVar174 = fStack_4c8;
        fVar152 = fStack_4c4;
        do {
          pauVar2 = (undefined1 (*) [28])(bspline_basis0 + lVar122 * 4 + lVar14);
          fVar302 = *(float *)*pauVar2;
          fVar190 = *(float *)(*pauVar2 + 4);
          fVar303 = *(float *)(*pauVar2 + 8);
          fVar193 = *(float *)(*pauVar2 + 0xc);
          fVar304 = *(float *)(*pauVar2 + 0x10);
          fVar196 = *(float *)(*pauVar2 + 0x14);
          fVar306 = *(float *)(*pauVar2 + 0x18);
          auVar113 = *pauVar2;
          pauVar2 = (undefined1 (*) [28])(lVar14 + 0x222bfac + lVar122 * 4);
          fVar126 = *(float *)*pauVar2;
          fVar140 = *(float *)(*pauVar2 + 4);
          fVar143 = *(float *)(*pauVar2 + 8);
          fVar146 = *(float *)(*pauVar2 + 0xc);
          fVar148 = *(float *)(*pauVar2 + 0x10);
          fVar150 = *(float *)(*pauVar2 + 0x14);
          fVar153 = *(float *)(*pauVar2 + 0x18);
          auVar112 = *pauVar2;
          pauVar2 = (undefined1 (*) [28])(lVar14 + 0x222c430 + lVar122 * 4);
          fVar247 = *(float *)*pauVar2;
          fVar195 = *(float *)(*pauVar2 + 4);
          fVar301 = *(float *)(*pauVar2 + 8);
          fVar272 = *(float *)(*pauVar2 + 0xc);
          fVar273 = *(float *)(*pauVar2 + 0x10);
          fVar198 = *(float *)(*pauVar2 + 0x14);
          fVar276 = *(float *)(*pauVar2 + 0x18);
          auVar111 = *pauVar2;
          pfVar4 = (float *)(lVar14 + 0x222c8b4 + lVar122 * 4);
          fVar124 = *pfVar4;
          fVar139 = pfVar4[1];
          fVar142 = pfVar4[2];
          fVar145 = pfVar4[3];
          fVar147 = pfVar4[4];
          fVar149 = pfVar4[5];
          fVar151 = pfVar4[6];
          fVar125 = auVar188._28_4_;
          fVar338 = auVar300._0_4_;
          fVar339 = auVar300._4_4_;
          fVar340 = auVar300._8_4_;
          fVar194 = auVar300._12_4_;
          fVar197 = auVar300._16_4_;
          fVar271 = auVar300._20_4_;
          fVar275 = auVar300._24_4_;
          fStack_764 = fVar125 + fVar125 + fStack_3e4;
          fVar218 = fVar125 + fVar125 + pfVar4[7];
          local_6e0._0_4_ =
               (float)local_a0._0_4_ * fVar302 +
               fVar126 * auVar211._0_4_ + fVar247 * fVar176 + (float)local_400._0_4_ * fVar124;
          local_6e0._4_4_ =
               (float)local_a0._4_4_ * fVar190 +
               fVar140 * auVar211._4_4_ + fVar195 * fVar199 + (float)local_400._4_4_ * fVar139;
          local_6e0._8_4_ =
               fStack_98 * fVar303 +
               fVar143 * auVar211._8_4_ + fVar301 * fVar212 + fStack_3f8 * fVar142;
          local_6e0._12_4_ =
               fStack_94 * fVar193 +
               fVar146 * auVar211._12_4_ + fVar272 * fVar231 + fStack_3f4 * fVar145;
          local_6e0._16_4_ =
               fStack_90 * fVar304 +
               fVar148 * auVar211._16_4_ + fVar273 * fVar233 + fStack_3f0 * fVar147;
          local_6e0._20_4_ =
               fStack_8c * fVar196 +
               fVar150 * auVar211._20_4_ + fVar198 * fVar192 + fStack_3ec * fVar149;
          local_6e0._24_4_ =
               fStack_88 * fVar306 +
               fVar153 * auVar211._24_4_ + fVar276 * fVar174 + fStack_3e8 * fVar151;
          local_6e0._28_4_ = fVar125 + pfVar4[7] + fStack_764;
          local_5e0._0_4_ =
               fVar200 * fVar126 + fVar338 * fVar247 + fVar220 * fVar124 +
               (float)local_100._0_4_ * fVar302;
          local_5e0._4_4_ =
               fVar213 * fVar140 + fVar339 * fVar195 + fVar232 * fVar139 +
               (float)local_100._4_4_ * fVar190;
          local_5e0._8_4_ =
               fVar215 * fVar143 + fVar340 * fVar301 + fVar234 * fVar142 + fStack_f8 * fVar303;
          local_5e0._12_4_ =
               fVar217 * fVar146 + fVar194 * fVar272 + fVar236 * fVar145 + fStack_f4 * fVar193;
          local_5e0._16_4_ =
               fVar216 * fVar148 + fVar197 * fVar273 + fVar219 * fVar147 + fStack_f0 * fVar304;
          local_5e0._20_4_ =
               fVar235 * fVar150 + fVar271 * fVar198 + fVar189 * fVar149 + fStack_ec * fVar196;
          local_5e0._24_4_ =
               fVar175 * fVar153 + fVar275 * fVar276 + fVar191 * fVar151 + fStack_e8 * fVar306;
          local_5e0._28_4_ = fVar125 + fVar125 + auVar243._28_4_ + fStack_764;
          fVar125 = (float)local_c0._0_4_ * fVar302 +
                    (float)local_80._0_4_ * fVar126 +
                    fVar247 * (float)local_300._0_4_ + fVar124 * (float)local_120._0_4_;
          fStack_77c = (float)local_c0._4_4_ * fVar190 +
                       (float)local_80._4_4_ * fVar140 +
                       fVar195 * (float)local_300._4_4_ + fVar139 * (float)local_120._4_4_;
          fStack_778 = fStack_b8 * fVar303 +
                       fStack_78 * fVar143 + fVar301 * fStack_2f8 + fVar142 * fStack_118;
          fStack_774 = fStack_b4 * fVar193 +
                       fStack_74 * fVar146 + fVar272 * fStack_2f4 + fVar145 * fStack_114;
          fStack_770 = fStack_b0 * fVar304 +
                       fStack_70 * fVar148 + fVar273 * fStack_2f0 + fVar147 * fStack_110;
          fStack_76c = fStack_ac * fVar196 +
                       fStack_6c * fVar150 + fVar198 * fStack_2ec + fVar149 * fStack_10c;
          fStack_768 = fStack_a8 * fVar306 +
                       fStack_68 * fVar153 + fVar276 * fStack_2e8 + fVar151 * fStack_108;
          fStack_764 = fStack_764 + fVar218;
          pauVar1 = (undefined1 (*) [32])(bspline_basis1 + lVar122 * 4 + lVar14);
          auVar114 = *(undefined1 (*) [24])*pauVar1;
          pfVar4 = (float *)(lVar14 + 0x222e3cc + lVar122 * 4);
          fVar302 = *pfVar4;
          fVar190 = pfVar4[1];
          fVar303 = pfVar4[2];
          fVar193 = pfVar4[3];
          fVar304 = pfVar4[4];
          fVar196 = pfVar4[5];
          fVar306 = pfVar4[6];
          pauVar2 = (undefined1 (*) [28])(lVar14 + 0x222e850 + lVar122 * 4);
          fVar126 = *(float *)*pauVar2;
          fVar140 = *(float *)(*pauVar2 + 4);
          fVar143 = *(float *)(*pauVar2 + 8);
          fVar146 = *(float *)(*pauVar2 + 0xc);
          fVar148 = *(float *)(*pauVar2 + 0x10);
          fVar150 = *(float *)(*pauVar2 + 0x14);
          fVar153 = *(float *)(*pauVar2 + 0x18);
          auVar115 = *pauVar2;
          pfVar4 = (float *)(lVar14 + 0x222ecd4 + lVar122 * 4);
          fVar247 = *pfVar4;
          fVar195 = pfVar4[1];
          fVar301 = pfVar4[2];
          fVar272 = pfVar4[3];
          fVar273 = pfVar4[4];
          fVar198 = pfVar4[5];
          fVar276 = pfVar4[6];
          fVar218 = fVar152 + fVar152 + fVar218;
          local_7a0._0_4_ = auVar114._0_4_;
          local_7a0._4_4_ = auVar114._4_4_;
          auStack_798._0_4_ = auVar114._8_4_;
          auStack_798._4_4_ = auVar114._12_4_;
          fStack_790 = auVar114._16_4_;
          fStack_78c = auVar114._20_4_;
          fStack_788 = (float)*(undefined8 *)(*pauVar1 + 0x18);
          fStack_784 = (float)((ulong)*(undefined8 *)(*pauVar1 + 0x18) >> 0x20);
          auVar319._0_4_ =
               (float)local_a0._0_4_ * (float)local_7a0._0_4_ +
               auVar211._0_4_ * fVar302 + fVar126 * fVar176 + fVar247 * (float)local_400._0_4_;
          auVar319._4_4_ =
               (float)local_a0._4_4_ * (float)local_7a0._4_4_ +
               auVar211._4_4_ * fVar190 + fVar140 * fVar199 + fVar195 * (float)local_400._4_4_;
          auVar319._8_4_ =
               fStack_98 * (float)auStack_798._0_4_ +
               auVar211._8_4_ * fVar303 + fVar143 * fVar212 + fVar301 * fStack_3f8;
          auVar319._12_4_ =
               fStack_94 * (float)auStack_798._4_4_ +
               auVar211._12_4_ * fVar193 + fVar146 * fVar231 + fVar272 * fStack_3f4;
          auVar319._16_4_ =
               fStack_90 * fStack_790 +
               auVar211._16_4_ * fVar304 + fVar148 * fVar233 + fVar273 * fStack_3f0;
          auVar319._20_4_ =
               fStack_8c * fStack_78c +
               auVar211._20_4_ * fVar196 + fVar150 * fVar192 + fVar198 * fStack_3ec;
          auVar319._24_4_ =
               fStack_88 * fStack_788 +
               auVar211._24_4_ * fVar306 + fVar153 * fVar174 + fVar276 * fStack_3e8;
          auVar319._28_4_ = auVar211._28_4_ + fVar218;
          auVar229._0_4_ =
               (float)local_100._0_4_ * (float)local_7a0._0_4_ +
               fVar200 * fVar302 + fVar338 * fVar126 + fVar247 * fVar220;
          auVar229._4_4_ =
               (float)local_100._4_4_ * (float)local_7a0._4_4_ +
               fVar213 * fVar190 + fVar339 * fVar140 + fVar195 * fVar232;
          auVar229._8_4_ =
               fStack_f8 * (float)auStack_798._0_4_ +
               fVar215 * fVar303 + fVar340 * fVar143 + fVar301 * fVar234;
          auVar229._12_4_ =
               fStack_f4 * (float)auStack_798._4_4_ +
               fVar217 * fVar193 + fVar194 * fVar146 + fVar272 * fVar236;
          auVar229._16_4_ =
               fStack_f0 * fStack_790 + fVar216 * fVar304 + fVar197 * fVar148 + fVar273 * fVar219;
          auVar229._20_4_ =
               fStack_ec * fStack_78c + fVar235 * fVar196 + fVar271 * fVar150 + fVar198 * fVar189;
          auVar229._24_4_ =
               fStack_e8 * fStack_788 + fVar175 * fVar306 + fVar275 * fVar153 + fVar276 * fVar191;
          auVar229._28_4_ = fVar218 + fVar152 + fVar152 + fVar214;
          auVar253._0_4_ =
               (float)local_80._0_4_ * fVar302 +
               fVar126 * (float)local_300._0_4_ + fVar247 * (float)local_120._0_4_ +
               (float)local_c0._0_4_ * (float)local_7a0._0_4_;
          auVar253._4_4_ =
               (float)local_80._4_4_ * fVar190 +
               fVar140 * (float)local_300._4_4_ + fVar195 * (float)local_120._4_4_ +
               (float)local_c0._4_4_ * (float)local_7a0._4_4_;
          auVar253._8_4_ =
               fStack_78 * fVar303 + fVar143 * fStack_2f8 + fVar301 * fStack_118 +
               fStack_b8 * (float)auStack_798._0_4_;
          auVar253._12_4_ =
               fStack_74 * fVar193 + fVar146 * fStack_2f4 + fVar272 * fStack_114 +
               fStack_b4 * (float)auStack_798._4_4_;
          auVar253._16_4_ =
               fStack_70 * fVar304 + fVar148 * fStack_2f0 + fVar273 * fStack_110 +
               fStack_b0 * fStack_790;
          auVar253._20_4_ =
               fStack_6c * fVar196 + fVar150 * fStack_2ec + fVar198 * fStack_10c +
               fStack_ac * fStack_78c;
          auVar253._24_4_ =
               fStack_68 * fVar306 + fVar153 * fStack_2e8 + fVar276 * fStack_108 +
               fStack_a8 * fStack_788;
          auVar253._28_4_ = fVar152 + fVar152 + fStack_3e4 + fVar218;
          auVar165 = vsubps_avx(auVar319,local_6e0);
          auVar17 = vsubps_avx(auVar229,local_5e0);
          fVar214 = auVar165._0_4_;
          fVar233 = auVar165._4_4_;
          auVar25._4_4_ = fVar233 * local_5e0._4_4_;
          auVar25._0_4_ = fVar214 * local_5e0._0_4_;
          fVar192 = auVar165._8_4_;
          auVar25._8_4_ = fVar192 * local_5e0._8_4_;
          fVar216 = auVar165._12_4_;
          auVar25._12_4_ = fVar216 * local_5e0._12_4_;
          fVar235 = auVar165._16_4_;
          auVar25._16_4_ = fVar235 * local_5e0._16_4_;
          fVar174 = auVar165._20_4_;
          auVar25._20_4_ = fVar174 * local_5e0._20_4_;
          fVar152 = auVar165._24_4_;
          auVar25._24_4_ = fVar152 * local_5e0._24_4_;
          auVar25._28_4_ = fVar218;
          fVar176 = auVar17._0_4_;
          fVar199 = auVar17._4_4_;
          auVar58._4_4_ = local_6e0._4_4_ * fVar199;
          auVar58._0_4_ = (float)local_6e0._0_4_ * fVar176;
          fVar219 = auVar17._8_4_;
          auVar58._8_4_ = local_6e0._8_4_ * fVar219;
          fVar189 = auVar17._12_4_;
          auVar58._12_4_ = local_6e0._12_4_ * fVar189;
          fVar212 = auVar17._16_4_;
          auVar58._16_4_ = local_6e0._16_4_ * fVar212;
          fVar231 = auVar17._20_4_;
          auVar58._20_4_ = local_6e0._20_4_ * fVar231;
          fVar191 = auVar17._24_4_;
          auVar58._24_4_ = local_6e0._24_4_ * fVar191;
          auVar58._28_4_ = auVar229._28_4_;
          auVar21 = vsubps_avx(auVar25,auVar58);
          auVar103._4_4_ = fStack_77c;
          auVar103._0_4_ = fVar125;
          auVar103._8_4_ = fStack_778;
          auVar103._12_4_ = fStack_774;
          auVar103._16_4_ = fStack_770;
          auVar103._20_4_ = fStack_76c;
          auVar103._24_4_ = fStack_768;
          auVar103._28_4_ = fStack_764;
          auVar308 = vmaxps_avx(auVar103,auVar253);
          auVar59._4_4_ = auVar308._4_4_ * auVar308._4_4_ * (fVar233 * fVar233 + fVar199 * fVar199);
          auVar59._0_4_ = auVar308._0_4_ * auVar308._0_4_ * (fVar214 * fVar214 + fVar176 * fVar176);
          auVar59._8_4_ = auVar308._8_4_ * auVar308._8_4_ * (fVar192 * fVar192 + fVar219 * fVar219);
          auVar59._12_4_ =
               auVar308._12_4_ * auVar308._12_4_ * (fVar216 * fVar216 + fVar189 * fVar189);
          auVar59._16_4_ =
               auVar308._16_4_ * auVar308._16_4_ * (fVar235 * fVar235 + fVar212 * fVar212);
          auVar59._20_4_ =
               auVar308._20_4_ * auVar308._20_4_ * (fVar174 * fVar174 + fVar231 * fVar231);
          auVar59._24_4_ =
               auVar308._24_4_ * auVar308._24_4_ * (fVar152 * fVar152 + fVar191 * fVar191);
          auVar59._28_4_ = auVar211._28_4_ + auVar229._28_4_;
          auVar60._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar60._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar60._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar60._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar60._16_4_ = auVar21._16_4_ * auVar21._16_4_;
          auVar60._20_4_ = auVar21._20_4_ * auVar21._20_4_;
          auVar60._24_4_ = auVar21._24_4_ * auVar21._24_4_;
          auVar60._28_4_ = auVar21._28_4_;
          auVar308 = vcmpps_avx(auVar60,auVar59,2);
          local_260 = (uint)lVar122;
          auVar171 = vpshufd_avx(ZEXT416(local_260),0);
          auVar225 = vpor_avx(auVar171,_DAT_01ff0cf0);
          auVar171 = vpor_avx(auVar171,_DAT_02020ea0);
          auVar225 = vpcmpgtd_avx(_local_320,auVar225);
          auVar243 = ZEXT1664(auVar225);
          auVar171 = vpcmpgtd_avx(_local_320,auVar171);
          register0x000012d0 = auVar171;
          _local_340 = auVar225;
          auVar188 = ZEXT3264(_local_340);
          auVar21 = _local_340 & auVar308;
          fVar220 = (float)local_720._0_4_;
          fVar232 = (float)local_720._4_4_;
          fVar234 = fStack_718;
          fVar236 = fStack_714;
          fVar219 = fStack_710;
          fVar189 = fStack_70c;
          fVar191 = fStack_708;
          fVar214 = fStack_704;
          fVar176 = (float)local_4e0._0_4_;
          fVar199 = (float)local_4e0._4_4_;
          fVar212 = fStack_4d8;
          fVar231 = fStack_4d4;
          fVar233 = fStack_4d0;
          fVar192 = fStack_4cc;
          fVar174 = fStack_4c8;
          fVar152 = fStack_4c4;
          fVar200 = (float)local_5c0._0_4_;
          fVar213 = (float)local_5c0._4_4_;
          fVar215 = fStack_5b8;
          fVar217 = fStack_5b4;
          fVar216 = fStack_5b0;
          fVar235 = fStack_5ac;
          fVar175 = fStack_5a8;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
            auVar314 = ZEXT3264(local_6c0);
            auVar300 = ZEXT3264(auVar300._0_32_);
            auVar211 = ZEXT3264(_local_620);
            _local_7a0 = *pauVar1;
          }
          else {
            local_4c0._0_4_ = auVar115._0_4_;
            local_4c0._4_4_ = auVar115._4_4_;
            fStack_4b8 = auVar115._8_4_;
            fStack_4b4 = auVar115._12_4_;
            fStack_4b0 = auVar115._16_4_;
            fStack_4ac = auVar115._20_4_;
            fStack_4a8 = auVar115._24_4_;
            fVar126 = (float)local_e0._0_4_ * (float)local_4c0._0_4_;
            fVar140 = (float)local_e0._4_4_ * (float)local_4c0._4_4_;
            fVar143 = fStack_d8 * fStack_4b8;
            fVar146 = fStack_d4 * fStack_4b4;
            fVar148 = fStack_d0 * fStack_4b0;
            fVar150 = fStack_cc * fStack_4ac;
            fVar153 = fStack_c8 * fStack_4a8;
            _local_4c0 = auVar17;
            local_520 = (float)local_7a0._0_4_ * (float)local_560._0_4_ +
                        (float)local_460._0_4_ * fVar302 +
                        fVar126 + fVar247 * (float)local_440._0_4_;
            fStack_51c = (float)local_7a0._4_4_ * (float)local_560._4_4_ +
                         (float)local_460._4_4_ * fVar190 +
                         fVar140 + fVar195 * (float)local_440._4_4_;
            fStack_518 = (float)auStack_798._0_4_ * fStack_558 +
                         fStack_458 * fVar303 + fVar143 + fVar301 * fStack_438;
            fStack_514 = (float)auStack_798._4_4_ * fStack_554 +
                         fStack_454 * fVar193 + fVar146 + fVar272 * fStack_434;
            fStack_510 = fStack_790 * fStack_550 +
                         fStack_450 * fVar304 + fVar148 + fVar273 * fStack_430;
            fStack_50c = fStack_78c * fStack_54c +
                         fStack_44c * fVar196 + fVar150 + fVar198 * fStack_42c;
            fStack_508 = fStack_788 * fStack_548 +
                         fStack_448 * fVar306 + fVar153 + fVar276 * fStack_428;
            fStack_504 = *(float *)pauVar2[1] + fStack_784 + auVar17._28_4_ + 0.0;
            local_600._0_4_ = auVar112._0_4_;
            local_600._4_4_ = auVar112._4_4_;
            fStack_5f8 = auVar112._8_4_;
            fStack_5f4 = auVar112._12_4_;
            auStack_5f0._0_4_ = auVar112._16_4_;
            auStack_5f0._4_4_ = auVar112._20_4_;
            fStack_5e8 = auVar112._24_4_;
            local_500._0_4_ = auVar111._0_4_;
            local_500._4_4_ = auVar111._4_4_;
            fStack_4f8 = auVar111._8_4_;
            fStack_4f4 = auVar111._12_4_;
            auStack_4f0._0_4_ = auVar111._16_4_;
            auStack_4f0._4_4_ = auVar111._20_4_;
            fStack_4e8 = auVar111._24_4_;
            pfVar5 = (float *)(lVar14 + 0x222d640 + lVar122 * 4);
            fVar302 = *pfVar5;
            fVar190 = pfVar5[1];
            fVar303 = pfVar5[2];
            fVar193 = pfVar5[3];
            fVar304 = pfVar5[4];
            fVar196 = pfVar5[5];
            fVar306 = pfVar5[6];
            pfVar6 = (float *)(lVar14 + 0x222dac4 + lVar122 * 4);
            fVar126 = *pfVar6;
            fVar140 = pfVar6[1];
            fVar143 = pfVar6[2];
            fVar146 = pfVar6[3];
            fVar148 = pfVar6[4];
            fVar150 = pfVar6[5];
            fVar153 = pfVar6[6];
            fVar249 = pfVar4[7] + 0.0;
            pfVar7 = (float *)(lVar14 + 0x222d1bc + lVar122 * 4);
            fVar247 = *pfVar7;
            fVar195 = pfVar7[1];
            fVar301 = pfVar7[2];
            fVar272 = pfVar7[3];
            fVar273 = pfVar7[4];
            fVar198 = pfVar7[5];
            fVar276 = pfVar7[6];
            fVar154 = pfVar5[7] + pfVar6[7];
            fVar166 = pfVar6[7] + fVar249;
            fVar249 = pfVar4[7] + auVar319._28_4_ + fVar249;
            pfVar4 = (float *)(lVar14 + 0x222cd38 + lVar122 * 4);
            fVar218 = *pfVar4;
            fVar278 = pfVar4[1];
            fVar279 = pfVar4[2];
            fVar280 = pfVar4[3];
            fVar281 = pfVar4[4];
            fVar282 = pfVar4[5];
            fVar290 = pfVar4[6];
            local_420 = (float)local_a0._0_4_ * fVar218 +
                        fVar247 * (float)local_620._0_4_ +
                        (float)local_4e0._0_4_ * fVar302 + (float)local_400._0_4_ * fVar126;
            fStack_41c = (float)local_a0._4_4_ * fVar278 +
                         fVar195 * (float)local_620._4_4_ +
                         (float)local_4e0._4_4_ * fVar190 + (float)local_400._4_4_ * fVar140;
            fStack_418 = fStack_98 * fVar279 +
                         fVar301 * fStack_618 + fStack_4d8 * fVar303 + fStack_3f8 * fVar143;
            fStack_414 = fStack_94 * fVar280 +
                         fVar272 * fStack_614 + fStack_4d4 * fVar193 + fStack_3f4 * fVar146;
            fStack_410 = fStack_90 * fVar281 +
                         fVar273 * fStack_610 + fStack_4d0 * fVar304 + fStack_3f0 * fVar148;
            fStack_40c = fStack_8c * fVar282 +
                         fVar198 * fStack_60c + fStack_4cc * fVar196 + fStack_3ec * fVar150;
            fStack_408 = fStack_88 * fVar290 +
                         fVar276 * fStack_608 + fStack_4c8 * fVar306 + fStack_3e8 * fVar153;
            fStack_404 = fVar154 + fVar166;
            auVar162._0_4_ =
                 (float)local_100._0_4_ * fVar218 +
                 fVar338 * fVar302 + (float)local_720._0_4_ * fVar126 +
                 fVar247 * (float)local_5c0._0_4_;
            auVar162._4_4_ =
                 (float)local_100._4_4_ * fVar278 +
                 fVar339 * fVar190 + (float)local_720._4_4_ * fVar140 +
                 fVar195 * (float)local_5c0._4_4_;
            auVar162._8_4_ =
                 fStack_f8 * fVar279 +
                 fVar340 * fVar303 + fStack_718 * fVar143 + fVar301 * fStack_5b8;
            auVar162._12_4_ =
                 fStack_f4 * fVar280 +
                 fVar194 * fVar193 + fStack_714 * fVar146 + fVar272 * fStack_5b4;
            auVar162._16_4_ =
                 fStack_f0 * fVar281 +
                 fVar197 * fVar304 + fStack_710 * fVar148 + fVar273 * fStack_5b0;
            auVar162._20_4_ =
                 fStack_ec * fVar282 +
                 fVar271 * fVar196 + fStack_70c * fVar150 + fVar198 * fStack_5ac;
            auVar162._24_4_ =
                 fStack_e8 * fVar290 +
                 fVar275 * fVar306 + fStack_708 * fVar153 + fVar276 * fStack_5a8;
            auVar162._28_4_ = fVar166 + fVar249;
            auVar320._0_4_ =
                 fVar247 * (float)local_460._0_4_ +
                 (float)local_e0._0_4_ * fVar302 + (float)local_440._0_4_ * fVar126 +
                 fVar218 * (float)local_560._0_4_;
            auVar320._4_4_ =
                 fVar195 * (float)local_460._4_4_ +
                 (float)local_e0._4_4_ * fVar190 + (float)local_440._4_4_ * fVar140 +
                 fVar278 * (float)local_560._4_4_;
            auVar320._8_4_ =
                 fVar301 * fStack_458 + fStack_d8 * fVar303 + fStack_438 * fVar143 +
                 fVar279 * fStack_558;
            auVar320._12_4_ =
                 fVar272 * fStack_454 + fStack_d4 * fVar193 + fStack_434 * fVar146 +
                 fVar280 * fStack_554;
            auVar320._16_4_ =
                 fVar273 * fStack_450 + fStack_d0 * fVar304 + fStack_430 * fVar148 +
                 fVar281 * fStack_550;
            auVar320._20_4_ =
                 fVar198 * fStack_44c + fStack_cc * fVar196 + fStack_42c * fVar150 +
                 fVar282 * fStack_54c;
            auVar320._24_4_ =
                 fVar276 * fStack_448 + fStack_c8 * fVar306 + fStack_428 * fVar153 +
                 fVar290 * fStack_548;
            auVar320._28_4_ = pfVar7[7] + fVar154 + fVar249;
            pfVar4 = (float *)(lVar14 + 0x222fa60 + lVar122 * 4);
            fVar302 = *pfVar4;
            fVar190 = pfVar4[1];
            fVar303 = pfVar4[2];
            fVar193 = pfVar4[3];
            fVar304 = pfVar4[4];
            fVar196 = pfVar4[5];
            fVar306 = pfVar4[6];
            pfVar5 = (float *)(lVar14 + 0x222fee4 + lVar122 * 4);
            fVar126 = *pfVar5;
            fVar140 = pfVar5[1];
            fVar143 = pfVar5[2];
            fVar146 = pfVar5[3];
            fVar148 = pfVar5[4];
            fVar150 = pfVar5[5];
            fVar153 = pfVar5[6];
            pfVar6 = (float *)(lVar14 + 0x222f5dc + lVar122 * 4);
            fVar247 = *pfVar6;
            fVar195 = pfVar6[1];
            fVar301 = pfVar6[2];
            fVar272 = pfVar6[3];
            fVar273 = pfVar6[4];
            fVar198 = pfVar6[5];
            fVar276 = pfVar6[6];
            pfVar7 = (float *)(lVar14 + 0x222f158 + lVar122 * 4);
            fVar218 = *pfVar7;
            fVar338 = pfVar7[1];
            fVar339 = pfVar7[2];
            fVar340 = pfVar7[3];
            fVar194 = pfVar7[4];
            fVar197 = pfVar7[5];
            fVar271 = pfVar7[6];
            auVar288._0_4_ =
                 (float)local_a0._0_4_ * fVar218 +
                 fVar247 * (float)local_620._0_4_ +
                 (float)local_4e0._0_4_ * fVar302 + (float)local_400._0_4_ * fVar126;
            auVar288._4_4_ =
                 (float)local_a0._4_4_ * fVar338 +
                 fVar195 * (float)local_620._4_4_ +
                 (float)local_4e0._4_4_ * fVar190 + (float)local_400._4_4_ * fVar140;
            auVar288._8_4_ =
                 fStack_98 * fVar339 +
                 fVar301 * fStack_618 + fStack_4d8 * fVar303 + fStack_3f8 * fVar143;
            auVar288._12_4_ =
                 fStack_94 * fVar340 +
                 fVar272 * fStack_614 + fStack_4d4 * fVar193 + fStack_3f4 * fVar146;
            auVar288._16_4_ =
                 fStack_90 * fVar194 +
                 fVar273 * fStack_610 + fStack_4d0 * fVar304 + fStack_3f0 * fVar148;
            auVar288._20_4_ =
                 fStack_8c * fVar197 +
                 fVar198 * fStack_60c + fStack_4cc * fVar196 + fStack_3ec * fVar150;
            auVar288._24_4_ =
                 fStack_88 * fVar271 +
                 fVar276 * fStack_608 + fStack_4c8 * fVar306 + fStack_3e8 * fVar153;
            auVar288._28_4_ = fStack_704 + fStack_704 + fStack_4c4 + fStack_3e4;
            auVar312._0_4_ =
                 fVar218 * (float)local_100._0_4_ +
                 fVar247 * (float)local_5c0._0_4_ +
                 fVar302 * (float)local_760._0_4_ + (float)local_720._0_4_ * fVar126;
            auVar312._4_4_ =
                 fVar338 * (float)local_100._4_4_ +
                 fVar195 * (float)local_5c0._4_4_ +
                 fVar190 * (float)local_760._4_4_ + (float)local_720._4_4_ * fVar140;
            auVar312._8_4_ =
                 fVar339 * fStack_f8 +
                 fVar301 * fStack_5b8 + fVar303 * fStack_758 + fStack_718 * fVar143;
            auVar312._12_4_ =
                 fVar340 * fStack_f4 +
                 fVar272 * fStack_5b4 + fVar193 * fStack_754 + fStack_714 * fVar146;
            auVar312._16_4_ =
                 fVar194 * fStack_f0 +
                 fVar273 * fStack_5b0 + fVar304 * fStack_750 + fStack_710 * fVar148;
            auVar312._20_4_ =
                 fVar197 * fStack_ec +
                 fVar198 * fStack_5ac + fVar196 * fStack_74c + fStack_70c * fVar150;
            auVar312._24_4_ =
                 fVar271 * fStack_e8 +
                 fVar276 * fStack_5a8 + fVar306 * fStack_748 + fStack_708 * fVar153;
            auVar312._28_4_ = fStack_704 + fStack_704 + fStack_e4 + fStack_704;
            auVar230._8_4_ = 0x7fffffff;
            auVar230._0_8_ = 0x7fffffff7fffffff;
            auVar230._12_4_ = 0x7fffffff;
            auVar230._16_4_ = 0x7fffffff;
            auVar230._20_4_ = 0x7fffffff;
            auVar230._24_4_ = 0x7fffffff;
            auVar230._28_4_ = 0x7fffffff;
            auVar109._4_4_ = fStack_41c;
            auVar109._0_4_ = local_420;
            auVar109._8_4_ = fStack_418;
            auVar109._12_4_ = fStack_414;
            auVar109._16_4_ = fStack_410;
            auVar109._20_4_ = fStack_40c;
            auVar109._24_4_ = fStack_408;
            auVar109._28_4_ = fStack_404;
            auVar21 = vandps_avx(auVar109,auVar230);
            auVar20 = vandps_avx(auVar162,auVar230);
            auVar20 = vmaxps_avx(auVar21,auVar20);
            auVar21 = vandps_avx(auVar320,auVar230);
            auVar20 = vmaxps_avx(auVar20,auVar21);
            auVar20 = vcmpps_avx(auVar20,local_360,1);
            auVar26 = vblendvps_avx(auVar109,auVar165,auVar20);
            auVar135._0_4_ =
                 fVar218 * (float)local_560._0_4_ +
                 fVar247 * (float)local_460._0_4_ +
                 fVar126 * (float)local_440._0_4_ + (float)local_e0._0_4_ * fVar302;
            auVar135._4_4_ =
                 fVar338 * (float)local_560._4_4_ +
                 fVar195 * (float)local_460._4_4_ +
                 fVar140 * (float)local_440._4_4_ + (float)local_e0._4_4_ * fVar190;
            auVar135._8_4_ =
                 fVar339 * fStack_558 +
                 fVar301 * fStack_458 + fVar143 * fStack_438 + fStack_d8 * fVar303;
            auVar135._12_4_ =
                 fVar340 * fStack_554 +
                 fVar272 * fStack_454 + fVar146 * fStack_434 + fStack_d4 * fVar193;
            auVar135._16_4_ =
                 fVar194 * fStack_550 +
                 fVar273 * fStack_450 + fVar148 * fStack_430 + fStack_d0 * fVar304;
            auVar135._20_4_ =
                 fVar197 * fStack_54c +
                 fVar198 * fStack_44c + fVar150 * fStack_42c + fStack_cc * fVar196;
            auVar135._24_4_ =
                 fVar271 * fStack_548 +
                 fVar276 * fStack_448 + fVar153 * fStack_428 + fStack_c8 * fVar306;
            auVar135._28_4_ = auVar21._28_4_ + pfVar6[7] + pfVar5[7] + pfVar4[7];
            auVar16 = vblendvps_avx(auVar162,auVar17,auVar20);
            auVar21 = vandps_avx(auVar288,auVar230);
            auVar20 = vandps_avx(auVar312,auVar230);
            auVar18 = vmaxps_avx(auVar21,auVar20);
            auVar21 = vandps_avx(auVar135,auVar230);
            auVar21 = vmaxps_avx(auVar18,auVar21);
            local_640._0_4_ = auVar113._0_4_;
            local_640._4_4_ = auVar113._4_4_;
            fStack_638 = auVar113._8_4_;
            fStack_634 = auVar113._12_4_;
            fStack_630 = auVar113._16_4_;
            fStack_62c = auVar113._20_4_;
            fStack_628 = auVar113._24_4_;
            auVar20 = vcmpps_avx(auVar21,local_360,1);
            auVar21 = vblendvps_avx(auVar288,auVar165,auVar20);
            auVar136._0_4_ =
                 (float)local_560._0_4_ * (float)local_640._0_4_ +
                 (float)local_460._0_4_ * (float)local_600._0_4_ +
                 (float)local_e0._0_4_ * (float)local_500._0_4_ + (float)local_440._0_4_ * fVar124;
            auVar136._4_4_ =
                 (float)local_560._4_4_ * (float)local_640._4_4_ +
                 (float)local_460._4_4_ * (float)local_600._4_4_ +
                 (float)local_e0._4_4_ * (float)local_500._4_4_ + (float)local_440._4_4_ * fVar139;
            auVar136._8_4_ =
                 fStack_558 * fStack_638 +
                 fStack_458 * fStack_5f8 + fStack_d8 * fStack_4f8 + fStack_438 * fVar142;
            auVar136._12_4_ =
                 fStack_554 * fStack_634 +
                 fStack_454 * fStack_5f4 + fStack_d4 * fStack_4f4 + fStack_434 * fVar145;
            auVar136._16_4_ =
                 fStack_550 * fStack_630 +
                 fStack_450 * (float)auStack_5f0._0_4_ +
                 fStack_d0 * (float)auStack_4f0._0_4_ + fStack_430 * fVar147;
            auVar136._20_4_ =
                 fStack_54c * fStack_62c +
                 fStack_44c * (float)auStack_5f0._4_4_ +
                 fStack_cc * (float)auStack_4f0._4_4_ + fStack_42c * fVar149;
            auVar136._24_4_ =
                 fStack_548 * fStack_628 +
                 fStack_448 * fStack_5e8 + fStack_c8 * fStack_4e8 + fStack_428 * fVar151;
            auVar136._28_4_ = auVar18._28_4_ + fStack_504 + auVar17._28_4_ + 0.0;
            auVar17 = vblendvps_avx(auVar312,auVar17,auVar20);
            fVar278 = auVar26._0_4_;
            fVar279 = auVar26._4_4_;
            fVar280 = auVar26._8_4_;
            fVar281 = auVar26._12_4_;
            fVar282 = auVar26._16_4_;
            fVar290 = auVar26._20_4_;
            fVar154 = auVar26._24_4_;
            fVar166 = auVar26._28_4_;
            fVar195 = auVar21._0_4_;
            fVar272 = auVar21._4_4_;
            fVar198 = auVar21._8_4_;
            fVar124 = auVar21._12_4_;
            fVar142 = auVar21._16_4_;
            fVar147 = auVar21._20_4_;
            fVar151 = auVar21._24_4_;
            fVar302 = auVar16._0_4_;
            fVar303 = auVar16._4_4_;
            fVar304 = auVar16._8_4_;
            fVar306 = auVar16._12_4_;
            fVar140 = auVar16._16_4_;
            fVar146 = auVar16._20_4_;
            fVar150 = auVar16._24_4_;
            auVar298._0_4_ = fVar302 * fVar302 + fVar278 * fVar278;
            auVar298._4_4_ = fVar303 * fVar303 + fVar279 * fVar279;
            auVar298._8_4_ = fVar304 * fVar304 + fVar280 * fVar280;
            auVar298._12_4_ = fVar306 * fVar306 + fVar281 * fVar281;
            auVar298._16_4_ = fVar140 * fVar140 + fVar282 * fVar282;
            auVar298._20_4_ = fVar146 * fVar146 + fVar290 * fVar290;
            auVar298._24_4_ = fVar150 * fVar150 + fVar154 * fVar154;
            auVar298._28_4_ = fStack_84 + auVar165._28_4_;
            auVar165 = vrsqrtps_avx(auVar298);
            fVar190 = auVar165._0_4_;
            fVar193 = auVar165._4_4_;
            auVar61._4_4_ = fVar193 * 1.5;
            auVar61._0_4_ = fVar190 * 1.5;
            fVar196 = auVar165._8_4_;
            auVar61._8_4_ = fVar196 * 1.5;
            fVar126 = auVar165._12_4_;
            auVar61._12_4_ = fVar126 * 1.5;
            fVar143 = auVar165._16_4_;
            auVar61._16_4_ = fVar143 * 1.5;
            fVar148 = auVar165._20_4_;
            auVar61._20_4_ = fVar148 * 1.5;
            fVar153 = auVar165._24_4_;
            auVar61._24_4_ = fVar153 * 1.5;
            auVar61._28_4_ = auVar312._28_4_;
            auVar62._4_4_ = fVar193 * fVar193 * fVar193 * auVar298._4_4_ * 0.5;
            auVar62._0_4_ = fVar190 * fVar190 * fVar190 * auVar298._0_4_ * 0.5;
            auVar62._8_4_ = fVar196 * fVar196 * fVar196 * auVar298._8_4_ * 0.5;
            auVar62._12_4_ = fVar126 * fVar126 * fVar126 * auVar298._12_4_ * 0.5;
            auVar62._16_4_ = fVar143 * fVar143 * fVar143 * auVar298._16_4_ * 0.5;
            auVar62._20_4_ = fVar148 * fVar148 * fVar148 * auVar298._20_4_ * 0.5;
            auVar62._24_4_ = fVar153 * fVar153 * fVar153 * auVar298._24_4_ * 0.5;
            auVar62._28_4_ = auVar298._28_4_;
            auVar20 = vsubps_avx(auVar61,auVar62);
            fVar338 = auVar20._0_4_;
            fVar339 = auVar20._4_4_;
            fVar340 = auVar20._8_4_;
            fVar194 = auVar20._12_4_;
            fVar197 = auVar20._16_4_;
            fVar271 = auVar20._20_4_;
            fVar275 = auVar20._24_4_;
            fVar190 = auVar17._0_4_;
            fVar193 = auVar17._4_4_;
            fVar196 = auVar17._8_4_;
            fVar126 = auVar17._12_4_;
            fVar143 = auVar17._16_4_;
            fVar148 = auVar17._20_4_;
            fVar153 = auVar17._24_4_;
            auVar268._0_4_ = fVar190 * fVar190 + fVar195 * fVar195;
            auVar268._4_4_ = fVar193 * fVar193 + fVar272 * fVar272;
            auVar268._8_4_ = fVar196 * fVar196 + fVar198 * fVar198;
            auVar268._12_4_ = fVar126 * fVar126 + fVar124 * fVar124;
            auVar268._16_4_ = fVar143 * fVar143 + fVar142 * fVar142;
            auVar268._20_4_ = fVar148 * fVar148 + fVar147 * fVar147;
            auVar268._24_4_ = fVar153 * fVar153 + fVar151 * fVar151;
            auVar268._28_4_ = auVar165._28_4_ + auVar21._28_4_;
            auVar165 = vrsqrtps_avx(auVar268);
            fVar247 = auVar165._0_4_;
            fVar301 = auVar165._4_4_;
            auVar63._4_4_ = fVar301 * 1.5;
            auVar63._0_4_ = fVar247 * 1.5;
            fVar273 = auVar165._8_4_;
            auVar63._8_4_ = fVar273 * 1.5;
            fVar276 = auVar165._12_4_;
            auVar63._12_4_ = fVar276 * 1.5;
            fVar139 = auVar165._16_4_;
            auVar63._16_4_ = fVar139 * 1.5;
            fVar145 = auVar165._20_4_;
            auVar63._20_4_ = fVar145 * 1.5;
            fVar149 = auVar165._24_4_;
            auVar63._24_4_ = fVar149 * 1.5;
            auVar63._28_4_ = auVar312._28_4_;
            auVar64._4_4_ = fVar301 * fVar301 * fVar301 * auVar268._4_4_ * 0.5;
            auVar64._0_4_ = fVar247 * fVar247 * fVar247 * auVar268._0_4_ * 0.5;
            auVar64._8_4_ = fVar273 * fVar273 * fVar273 * auVar268._8_4_ * 0.5;
            auVar64._12_4_ = fVar276 * fVar276 * fVar276 * auVar268._12_4_ * 0.5;
            auVar64._16_4_ = fVar139 * fVar139 * fVar139 * auVar268._16_4_ * 0.5;
            auVar64._20_4_ = fVar145 * fVar145 * fVar145 * auVar268._20_4_ * 0.5;
            auVar64._24_4_ = fVar149 * fVar149 * fVar149 * auVar268._24_4_ * 0.5;
            auVar64._28_4_ = auVar268._28_4_;
            auVar17 = vsubps_avx(auVar63,auVar64);
            fVar301 = auVar17._0_4_;
            fVar273 = auVar17._4_4_;
            fVar276 = auVar17._8_4_;
            fVar139 = auVar17._12_4_;
            fVar145 = auVar17._16_4_;
            fVar149 = auVar17._20_4_;
            fVar218 = auVar17._24_4_;
            fVar302 = fVar125 * fVar338 * fVar302;
            fVar303 = fStack_77c * fVar339 * fVar303;
            auVar65._4_4_ = fVar303;
            auVar65._0_4_ = fVar302;
            fVar304 = fStack_778 * fVar340 * fVar304;
            auVar65._8_4_ = fVar304;
            fVar306 = fStack_774 * fVar194 * fVar306;
            auVar65._12_4_ = fVar306;
            fVar140 = fStack_770 * fVar197 * fVar140;
            auVar65._16_4_ = fVar140;
            fVar146 = fStack_76c * fVar271 * fVar146;
            auVar65._20_4_ = fVar146;
            fVar150 = fStack_768 * fVar275 * fVar150;
            auVar65._24_4_ = fVar150;
            auVar65._28_4_ = auVar165._28_4_;
            local_640._4_4_ = fVar303 + local_6e0._4_4_;
            local_640._0_4_ = fVar302 + (float)local_6e0._0_4_;
            fStack_638 = fVar304 + local_6e0._8_4_;
            fStack_634 = fVar306 + local_6e0._12_4_;
            fStack_630 = fVar140 + local_6e0._16_4_;
            fStack_62c = fVar146 + local_6e0._20_4_;
            fStack_628 = fVar150 + local_6e0._24_4_;
            fStack_624 = auVar165._28_4_ + local_6e0._28_4_;
            fVar140 = fVar125 * fVar338 * -fVar278;
            fVar146 = fStack_77c * fVar339 * -fVar279;
            auVar66._4_4_ = fVar146;
            auVar66._0_4_ = fVar140;
            fVar150 = fStack_778 * fVar340 * -fVar280;
            auVar66._8_4_ = fVar150;
            fVar247 = fStack_774 * fVar194 * -fVar281;
            auVar66._12_4_ = fVar247;
            fStack_6f0 = fStack_770 * fVar197 * -fVar282;
            auVar66._16_4_ = fStack_6f0;
            fStack_6ec = fStack_76c * fVar271 * -fVar290;
            auVar66._20_4_ = fStack_6ec;
            fStack_6e8 = fStack_768 * fVar275 * -fVar154;
            auVar66._24_4_ = fStack_6e8;
            auVar66._28_4_ = -fVar166;
            fStack_6f0 = local_5e0._16_4_ + fStack_6f0;
            fStack_6ec = local_5e0._20_4_ + fStack_6ec;
            fStack_6e8 = local_5e0._24_4_ + fStack_6e8;
            fStack_6e4 = local_5e0._28_4_ + -fVar166;
            fVar302 = fVar338 * 0.0 * fVar125;
            fVar303 = fVar339 * 0.0 * fStack_77c;
            auVar67._4_4_ = fVar303;
            auVar67._0_4_ = fVar302;
            fVar304 = fVar340 * 0.0 * fStack_778;
            auVar67._8_4_ = fVar304;
            fVar306 = fVar194 * 0.0 * fStack_774;
            auVar67._12_4_ = fVar306;
            fVar338 = fVar197 * 0.0 * fStack_770;
            auVar67._16_4_ = fVar338;
            fVar339 = fVar271 * 0.0 * fStack_76c;
            auVar67._20_4_ = fVar339;
            fVar340 = fVar275 * 0.0 * fStack_768;
            auVar67._24_4_ = fVar340;
            auVar67._28_4_ = fVar166;
            auVar18 = vsubps_avx(local_6e0,auVar65);
            auVar342._0_4_ = fVar302 + auVar136._0_4_;
            auVar342._4_4_ = fVar303 + auVar136._4_4_;
            auVar342._8_4_ = fVar304 + auVar136._8_4_;
            auVar342._12_4_ = fVar306 + auVar136._12_4_;
            auVar342._16_4_ = fVar338 + auVar136._16_4_;
            auVar342._20_4_ = fVar339 + auVar136._20_4_;
            auVar342._24_4_ = fVar340 + auVar136._24_4_;
            auVar342._28_4_ = fVar166 + auVar136._28_4_;
            fVar302 = auVar253._0_4_ * fVar301 * fVar190;
            fVar190 = auVar253._4_4_ * fVar273 * fVar193;
            auVar68._4_4_ = fVar190;
            auVar68._0_4_ = fVar302;
            fVar303 = auVar253._8_4_ * fVar276 * fVar196;
            auVar68._8_4_ = fVar303;
            fVar193 = auVar253._12_4_ * fVar139 * fVar126;
            auVar68._12_4_ = fVar193;
            fVar304 = auVar253._16_4_ * fVar145 * fVar143;
            auVar68._16_4_ = fVar304;
            fVar196 = auVar253._20_4_ * fVar149 * fVar148;
            auVar68._20_4_ = fVar196;
            fVar306 = auVar253._24_4_ * fVar218 * fVar153;
            auVar68._24_4_ = fVar306;
            auVar68._28_4_ = fStack_764;
            auVar206 = vsubps_avx(local_5e0,auVar66);
            auVar321._0_4_ = auVar319._0_4_ + fVar302;
            auVar321._4_4_ = auVar319._4_4_ + fVar190;
            auVar321._8_4_ = auVar319._8_4_ + fVar303;
            auVar321._12_4_ = auVar319._12_4_ + fVar193;
            auVar321._16_4_ = auVar319._16_4_ + fVar304;
            auVar321._20_4_ = auVar319._20_4_ + fVar196;
            auVar321._24_4_ = auVar319._24_4_ + fVar306;
            auVar321._28_4_ = auVar319._28_4_ + fStack_764;
            fVar302 = fVar301 * -fVar195 * auVar253._0_4_;
            fVar190 = fVar273 * -fVar272 * auVar253._4_4_;
            auVar69._4_4_ = fVar190;
            auVar69._0_4_ = fVar302;
            fVar303 = fVar276 * -fVar198 * auVar253._8_4_;
            auVar69._8_4_ = fVar303;
            fVar193 = fVar139 * -fVar124 * auVar253._12_4_;
            auVar69._12_4_ = fVar193;
            fVar304 = fVar145 * -fVar142 * auVar253._16_4_;
            auVar69._16_4_ = fVar304;
            fVar196 = fVar149 * -fVar147 * auVar253._20_4_;
            auVar69._20_4_ = fVar196;
            fVar306 = fVar218 * -fVar151 * auVar253._24_4_;
            auVar69._24_4_ = fVar306;
            auVar69._28_4_ = local_6e0._28_4_;
            auVar265 = vsubps_avx(auVar136,auVar67);
            auVar209._0_4_ = auVar229._0_4_ + fVar302;
            auVar209._4_4_ = auVar229._4_4_ + fVar190;
            auVar209._8_4_ = auVar229._8_4_ + fVar303;
            auVar209._12_4_ = auVar229._12_4_ + fVar193;
            auVar209._16_4_ = auVar229._16_4_ + fVar304;
            auVar209._20_4_ = auVar229._20_4_ + fVar196;
            auVar209._24_4_ = auVar229._24_4_ + fVar306;
            auVar209._28_4_ = auVar229._28_4_ + local_6e0._28_4_;
            fVar302 = fVar301 * 0.0 * auVar253._0_4_;
            fVar190 = fVar273 * 0.0 * auVar253._4_4_;
            auVar70._4_4_ = fVar190;
            auVar70._0_4_ = fVar302;
            fVar303 = fVar276 * 0.0 * auVar253._8_4_;
            auVar70._8_4_ = fVar303;
            fVar193 = fVar139 * 0.0 * auVar253._12_4_;
            auVar70._12_4_ = fVar193;
            fVar304 = fVar145 * 0.0 * auVar253._16_4_;
            auVar70._16_4_ = fVar304;
            fVar196 = fVar149 * 0.0 * auVar253._20_4_;
            auVar70._20_4_ = fVar196;
            fVar306 = fVar218 * 0.0 * auVar253._24_4_;
            auVar70._24_4_ = fVar306;
            auVar70._28_4_ = auVar136._28_4_;
            auVar165 = vsubps_avx(auVar319,auVar68);
            auVar108._4_4_ = fStack_51c;
            auVar108._0_4_ = local_520;
            auVar108._8_4_ = fStack_518;
            auVar108._12_4_ = fStack_514;
            auVar108._16_4_ = fStack_510;
            auVar108._20_4_ = fStack_50c;
            auVar108._24_4_ = fStack_508;
            auVar108._28_4_ = fStack_504;
            auVar289._0_4_ = local_520 + fVar302;
            auVar289._4_4_ = fStack_51c + fVar190;
            auVar289._8_4_ = fStack_518 + fVar303;
            auVar289._12_4_ = fStack_514 + fVar193;
            auVar289._16_4_ = fStack_510 + fVar304;
            auVar289._20_4_ = fStack_50c + fVar196;
            auVar289._24_4_ = fStack_508 + fVar306;
            auVar289._28_4_ = fStack_504 + auVar136._28_4_;
            auVar21 = vsubps_avx(auVar229,auVar69);
            auVar20 = vsubps_avx(auVar108,auVar70);
            auVar26 = vsubps_avx(auVar209,auVar206);
            auVar16 = vsubps_avx(auVar289,auVar265);
            auVar71._4_4_ = auVar265._4_4_ * auVar26._4_4_;
            auVar71._0_4_ = auVar265._0_4_ * auVar26._0_4_;
            auVar71._8_4_ = auVar265._8_4_ * auVar26._8_4_;
            auVar71._12_4_ = auVar265._12_4_ * auVar26._12_4_;
            auVar71._16_4_ = auVar265._16_4_ * auVar26._16_4_;
            auVar71._20_4_ = auVar265._20_4_ * auVar26._20_4_;
            auVar71._24_4_ = auVar265._24_4_ * auVar26._24_4_;
            auVar71._28_4_ = auVar312._28_4_;
            auVar72._4_4_ = auVar206._4_4_ * auVar16._4_4_;
            auVar72._0_4_ = auVar206._0_4_ * auVar16._0_4_;
            auVar72._8_4_ = auVar206._8_4_ * auVar16._8_4_;
            auVar72._12_4_ = auVar206._12_4_ * auVar16._12_4_;
            auVar72._16_4_ = auVar206._16_4_ * auVar16._16_4_;
            auVar72._20_4_ = auVar206._20_4_ * auVar16._20_4_;
            auVar72._24_4_ = auVar206._24_4_ * auVar16._24_4_;
            auVar72._28_4_ = auVar229._28_4_;
            auVar25 = vsubps_avx(auVar72,auVar71);
            auVar73._4_4_ = auVar18._4_4_ * auVar16._4_4_;
            auVar73._0_4_ = auVar18._0_4_ * auVar16._0_4_;
            auVar73._8_4_ = auVar18._8_4_ * auVar16._8_4_;
            auVar73._12_4_ = auVar18._12_4_ * auVar16._12_4_;
            auVar73._16_4_ = auVar18._16_4_ * auVar16._16_4_;
            auVar73._20_4_ = auVar18._20_4_ * auVar16._20_4_;
            auVar73._24_4_ = auVar18._24_4_ * auVar16._24_4_;
            auVar73._28_4_ = auVar16._28_4_;
            auVar16 = vsubps_avx(auVar321,auVar18);
            auVar74._4_4_ = auVar265._4_4_ * auVar16._4_4_;
            auVar74._0_4_ = auVar265._0_4_ * auVar16._0_4_;
            auVar74._8_4_ = auVar265._8_4_ * auVar16._8_4_;
            auVar74._12_4_ = auVar265._12_4_ * auVar16._12_4_;
            auVar74._16_4_ = auVar265._16_4_ * auVar16._16_4_;
            auVar74._20_4_ = auVar265._20_4_ * auVar16._20_4_;
            auVar74._24_4_ = auVar265._24_4_ * auVar16._24_4_;
            auVar74._28_4_ = auVar17._28_4_;
            auVar183 = vsubps_avx(auVar74,auVar73);
            auVar75._4_4_ = auVar206._4_4_ * auVar16._4_4_;
            auVar75._0_4_ = auVar206._0_4_ * auVar16._0_4_;
            auVar75._8_4_ = auVar206._8_4_ * auVar16._8_4_;
            auVar75._12_4_ = auVar206._12_4_ * auVar16._12_4_;
            auVar75._16_4_ = auVar206._16_4_ * auVar16._16_4_;
            auVar75._20_4_ = auVar206._20_4_ * auVar16._20_4_;
            auVar75._24_4_ = auVar206._24_4_ * auVar16._24_4_;
            auVar75._28_4_ = auVar17._28_4_;
            auVar76._4_4_ = auVar18._4_4_ * auVar26._4_4_;
            auVar76._0_4_ = auVar18._0_4_ * auVar26._0_4_;
            auVar76._8_4_ = auVar18._8_4_ * auVar26._8_4_;
            auVar76._12_4_ = auVar18._12_4_ * auVar26._12_4_;
            auVar76._16_4_ = auVar18._16_4_ * auVar26._16_4_;
            auVar76._20_4_ = auVar18._20_4_ * auVar26._20_4_;
            auVar76._24_4_ = auVar18._24_4_ * auVar26._24_4_;
            auVar76._28_4_ = auVar26._28_4_;
            auVar17 = vsubps_avx(auVar76,auVar75);
            auVar163._0_4_ = auVar25._0_4_ * 0.0 + auVar17._0_4_ + auVar183._0_4_ * 0.0;
            auVar163._4_4_ = auVar25._4_4_ * 0.0 + auVar17._4_4_ + auVar183._4_4_ * 0.0;
            auVar163._8_4_ = auVar25._8_4_ * 0.0 + auVar17._8_4_ + auVar183._8_4_ * 0.0;
            auVar163._12_4_ = auVar25._12_4_ * 0.0 + auVar17._12_4_ + auVar183._12_4_ * 0.0;
            auVar163._16_4_ = auVar25._16_4_ * 0.0 + auVar17._16_4_ + auVar183._16_4_ * 0.0;
            auVar163._20_4_ = auVar25._20_4_ * 0.0 + auVar17._20_4_ + auVar183._20_4_ * 0.0;
            auVar163._24_4_ = auVar25._24_4_ * 0.0 + auVar17._24_4_ + auVar183._24_4_ * 0.0;
            auVar163._28_4_ = auVar25._28_4_ + auVar17._28_4_ + auVar183._28_4_;
            auVar184 = vcmpps_avx(auVar163,ZEXT832(0) << 0x20,2);
            auVar17 = vblendvps_avx(auVar165,_local_640,auVar184);
            auVar188 = ZEXT3264(auVar17);
            auVar105._4_4_ = local_5e0._4_4_ + fVar146;
            auVar105._0_4_ = local_5e0._0_4_ + fVar140;
            auVar105._8_4_ = local_5e0._8_4_ + fVar150;
            auVar105._12_4_ = local_5e0._12_4_ + fVar247;
            auVar105._16_4_ = fStack_6f0;
            auVar105._20_4_ = fStack_6ec;
            auVar105._24_4_ = fStack_6e8;
            auVar105._28_4_ = fStack_6e4;
            auVar165 = vblendvps_avx(auVar21,auVar105,auVar184);
            auVar21 = vblendvps_avx(auVar20,auVar342,auVar184);
            auVar20 = vblendvps_avx(auVar18,auVar321,auVar184);
            auVar26 = vblendvps_avx(auVar206,auVar209,auVar184);
            auVar16 = vblendvps_avx(auVar265,auVar289,auVar184);
            auVar18 = vblendvps_avx(auVar321,auVar18,auVar184);
            auVar25 = vblendvps_avx(auVar209,auVar206,auVar184);
            auVar183 = vblendvps_avx(auVar289,auVar265,auVar184);
            local_5e0 = vandps_avx(auVar308,_local_340);
            auVar18 = vsubps_avx(auVar18,auVar17);
            auVar266 = vsubps_avx(auVar25,auVar165);
            auVar183 = vsubps_avx(auVar183,auVar21);
            auVar285 = vsubps_avx(auVar165,auVar26);
            fVar302 = auVar266._0_4_;
            fVar250 = auVar21._0_4_;
            fVar126 = auVar266._4_4_;
            fVar254 = auVar21._4_4_;
            auVar77._4_4_ = fVar254 * fVar126;
            auVar77._0_4_ = fVar250 * fVar302;
            fVar247 = auVar266._8_4_;
            fVar255 = auVar21._8_4_;
            auVar77._8_4_ = fVar255 * fVar247;
            fVar124 = auVar266._12_4_;
            fVar256 = auVar21._12_4_;
            auVar77._12_4_ = fVar256 * fVar124;
            fVar218 = auVar266._16_4_;
            fVar257 = auVar21._16_4_;
            auVar77._16_4_ = fVar257 * fVar218;
            fVar275 = auVar266._20_4_;
            fVar258 = auVar21._20_4_;
            auVar77._20_4_ = fVar258 * fVar275;
            fVar154 = auVar266._24_4_;
            fVar259 = auVar21._24_4_;
            auVar77._24_4_ = fVar259 * fVar154;
            auVar77._28_4_ = auVar25._28_4_;
            fVar190 = auVar165._0_4_;
            fVar283 = auVar183._0_4_;
            fVar140 = auVar165._4_4_;
            fVar291 = auVar183._4_4_;
            auVar78._4_4_ = fVar291 * fVar140;
            auVar78._0_4_ = fVar283 * fVar190;
            fVar195 = auVar165._8_4_;
            fVar292 = auVar183._8_4_;
            auVar78._8_4_ = fVar292 * fVar195;
            fVar139 = auVar165._12_4_;
            fVar293 = auVar183._12_4_;
            auVar78._12_4_ = fVar293 * fVar139;
            fVar338 = auVar165._16_4_;
            fVar294 = auVar183._16_4_;
            auVar78._16_4_ = fVar294 * fVar338;
            fVar278 = auVar165._20_4_;
            fVar295 = auVar183._20_4_;
            auVar78._20_4_ = fVar295 * fVar278;
            fVar166 = auVar165._24_4_;
            fVar296 = auVar183._24_4_;
            uVar8 = auVar206._28_4_;
            auVar78._24_4_ = fVar296 * fVar166;
            auVar78._28_4_ = uVar8;
            auVar25 = vsubps_avx(auVar78,auVar77);
            fVar303 = auVar17._0_4_;
            fVar143 = auVar17._4_4_;
            auVar79._4_4_ = fVar291 * fVar143;
            auVar79._0_4_ = fVar283 * fVar303;
            fVar301 = auVar17._8_4_;
            auVar79._8_4_ = fVar292 * fVar301;
            fVar142 = auVar17._12_4_;
            auVar79._12_4_ = fVar293 * fVar142;
            fVar339 = auVar17._16_4_;
            auVar79._16_4_ = fVar294 * fVar339;
            fVar279 = auVar17._20_4_;
            auVar79._20_4_ = fVar295 * fVar279;
            fVar249 = auVar17._24_4_;
            auVar79._24_4_ = fVar296 * fVar249;
            auVar79._28_4_ = uVar8;
            fVar193 = auVar18._0_4_;
            fVar146 = auVar18._4_4_;
            auVar80._4_4_ = fVar254 * fVar146;
            auVar80._0_4_ = fVar250 * fVar193;
            fVar272 = auVar18._8_4_;
            auVar80._8_4_ = fVar255 * fVar272;
            fVar145 = auVar18._12_4_;
            auVar80._12_4_ = fVar256 * fVar145;
            fVar340 = auVar18._16_4_;
            auVar80._16_4_ = fVar257 * fVar340;
            fVar280 = auVar18._20_4_;
            auVar80._20_4_ = fVar258 * fVar280;
            fVar237 = auVar18._24_4_;
            auVar80._24_4_ = fVar259 * fVar237;
            auVar80._28_4_ = auVar321._28_4_;
            auVar206 = vsubps_avx(auVar80,auVar79);
            auVar81._4_4_ = fVar140 * fVar146;
            auVar81._0_4_ = fVar190 * fVar193;
            auVar81._8_4_ = fVar195 * fVar272;
            auVar81._12_4_ = fVar139 * fVar145;
            auVar81._16_4_ = fVar338 * fVar340;
            auVar81._20_4_ = fVar278 * fVar280;
            auVar81._24_4_ = fVar166 * fVar237;
            auVar81._28_4_ = uVar8;
            auVar82._4_4_ = fVar143 * fVar126;
            auVar82._0_4_ = fVar303 * fVar302;
            auVar82._8_4_ = fVar301 * fVar247;
            auVar82._12_4_ = fVar142 * fVar124;
            auVar82._16_4_ = fVar339 * fVar218;
            auVar82._20_4_ = fVar279 * fVar275;
            auVar82._24_4_ = fVar249 * fVar154;
            auVar82._28_4_ = auVar265._28_4_;
            auVar265 = vsubps_avx(auVar82,auVar81);
            auVar309 = vsubps_avx(auVar21,auVar16);
            fVar196 = auVar265._28_4_ + auVar206._28_4_;
            auVar299._0_4_ = auVar265._0_4_ + auVar206._0_4_ * 0.0 + auVar25._0_4_ * 0.0;
            auVar299._4_4_ = auVar265._4_4_ + auVar206._4_4_ * 0.0 + auVar25._4_4_ * 0.0;
            auVar299._8_4_ = auVar265._8_4_ + auVar206._8_4_ * 0.0 + auVar25._8_4_ * 0.0;
            auVar299._12_4_ = auVar265._12_4_ + auVar206._12_4_ * 0.0 + auVar25._12_4_ * 0.0;
            auVar299._16_4_ = auVar265._16_4_ + auVar206._16_4_ * 0.0 + auVar25._16_4_ * 0.0;
            auVar299._20_4_ = auVar265._20_4_ + auVar206._20_4_ * 0.0 + auVar25._20_4_ * 0.0;
            auVar299._24_4_ = auVar265._24_4_ + auVar206._24_4_ * 0.0 + auVar25._24_4_ * 0.0;
            auVar299._28_4_ = fVar196 + auVar25._28_4_;
            fVar304 = auVar285._0_4_;
            fVar148 = auVar285._4_4_;
            auVar83._4_4_ = auVar16._4_4_ * fVar148;
            auVar83._0_4_ = auVar16._0_4_ * fVar304;
            fVar273 = auVar285._8_4_;
            auVar83._8_4_ = auVar16._8_4_ * fVar273;
            fVar147 = auVar285._12_4_;
            auVar83._12_4_ = auVar16._12_4_ * fVar147;
            fVar194 = auVar285._16_4_;
            auVar83._16_4_ = auVar16._16_4_ * fVar194;
            fVar281 = auVar285._20_4_;
            auVar83._20_4_ = auVar16._20_4_ * fVar281;
            fVar244 = auVar285._24_4_;
            auVar83._24_4_ = auVar16._24_4_ * fVar244;
            auVar83._28_4_ = fVar196;
            fVar196 = auVar309._0_4_;
            fVar150 = auVar309._4_4_;
            auVar84._4_4_ = auVar26._4_4_ * fVar150;
            auVar84._0_4_ = auVar26._0_4_ * fVar196;
            fVar198 = auVar309._8_4_;
            auVar84._8_4_ = auVar26._8_4_ * fVar198;
            fVar149 = auVar309._12_4_;
            auVar84._12_4_ = auVar26._12_4_ * fVar149;
            fVar197 = auVar309._16_4_;
            auVar84._16_4_ = auVar26._16_4_ * fVar197;
            fVar282 = auVar309._20_4_;
            auVar84._20_4_ = auVar26._20_4_ * fVar282;
            fVar245 = auVar309._24_4_;
            auVar84._24_4_ = auVar26._24_4_ * fVar245;
            auVar84._28_4_ = auVar265._28_4_;
            auVar206 = vsubps_avx(auVar84,auVar83);
            auVar265 = vsubps_avx(auVar17,auVar20);
            fVar306 = auVar265._0_4_;
            fVar153 = auVar265._4_4_;
            auVar85._4_4_ = auVar16._4_4_ * fVar153;
            auVar85._0_4_ = auVar16._0_4_ * fVar306;
            fVar276 = auVar265._8_4_;
            auVar85._8_4_ = auVar16._8_4_ * fVar276;
            fVar151 = auVar265._12_4_;
            auVar85._12_4_ = auVar16._12_4_ * fVar151;
            fVar271 = auVar265._16_4_;
            auVar85._16_4_ = auVar16._16_4_ * fVar271;
            fVar290 = auVar265._20_4_;
            auVar85._20_4_ = auVar16._20_4_ * fVar290;
            fVar246 = auVar265._24_4_;
            auVar85._24_4_ = auVar16._24_4_ * fVar246;
            auVar85._28_4_ = auVar16._28_4_;
            auVar86._4_4_ = fVar150 * auVar20._4_4_;
            auVar86._0_4_ = fVar196 * auVar20._0_4_;
            auVar86._8_4_ = fVar198 * auVar20._8_4_;
            auVar86._12_4_ = fVar149 * auVar20._12_4_;
            auVar86._16_4_ = fVar197 * auVar20._16_4_;
            auVar86._20_4_ = fVar282 * auVar20._20_4_;
            auVar86._24_4_ = fVar245 * auVar20._24_4_;
            auVar86._28_4_ = auVar25._28_4_;
            auVar16 = vsubps_avx(auVar85,auVar86);
            auVar87._4_4_ = auVar26._4_4_ * fVar153;
            auVar87._0_4_ = auVar26._0_4_ * fVar306;
            auVar87._8_4_ = auVar26._8_4_ * fVar276;
            auVar87._12_4_ = auVar26._12_4_ * fVar151;
            auVar87._16_4_ = auVar26._16_4_ * fVar271;
            auVar87._20_4_ = auVar26._20_4_ * fVar290;
            auVar87._24_4_ = auVar26._24_4_ * fVar246;
            auVar87._28_4_ = auVar26._28_4_;
            auVar88._4_4_ = fVar148 * auVar20._4_4_;
            auVar88._0_4_ = fVar304 * auVar20._0_4_;
            auVar88._8_4_ = fVar273 * auVar20._8_4_;
            auVar88._12_4_ = fVar147 * auVar20._12_4_;
            auVar88._16_4_ = fVar194 * auVar20._16_4_;
            auVar88._20_4_ = fVar281 * auVar20._20_4_;
            auVar88._24_4_ = fVar244 * auVar20._24_4_;
            auVar88._28_4_ = auVar20._28_4_;
            auVar20 = vsubps_avx(auVar88,auVar87);
            auVar137._0_4_ = auVar206._0_4_ * 0.0 + auVar20._0_4_ + auVar16._0_4_ * 0.0;
            auVar137._4_4_ = auVar206._4_4_ * 0.0 + auVar20._4_4_ + auVar16._4_4_ * 0.0;
            auVar137._8_4_ = auVar206._8_4_ * 0.0 + auVar20._8_4_ + auVar16._8_4_ * 0.0;
            auVar137._12_4_ = auVar206._12_4_ * 0.0 + auVar20._12_4_ + auVar16._12_4_ * 0.0;
            auVar137._16_4_ = auVar206._16_4_ * 0.0 + auVar20._16_4_ + auVar16._16_4_ * 0.0;
            auVar137._20_4_ = auVar206._20_4_ * 0.0 + auVar20._20_4_ + auVar16._20_4_ * 0.0;
            auVar137._24_4_ = auVar206._24_4_ * 0.0 + auVar20._24_4_ + auVar16._24_4_ * 0.0;
            auVar137._28_4_ = auVar16._28_4_ + auVar20._28_4_ + auVar16._28_4_;
            auVar20 = vmaxps_avx(auVar299,auVar137);
            auVar20 = vcmpps_avx(auVar20,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar26 = local_5e0 & auVar20;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0x7f,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0xbf,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0x1f]) {
LAB_00fa9c4d:
              auVar243 = ZEXT3264(auVar165);
              auVar211 = ZEXT3264(CONCAT824(uStack_468,
                                            CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
              auVar322._4_4_ = fStack_77c;
              auVar322._0_4_ = fVar125;
              auVar322._8_4_ = fStack_778;
              auVar322._12_4_ = fStack_774;
              auVar322._16_4_ = fStack_770;
              auVar322._20_4_ = fStack_76c;
              auVar322._24_4_ = fStack_768;
              auVar322._28_4_ = fStack_764;
            }
            else {
              auVar26 = vandps_avx(auVar20,local_5e0);
              auVar89._4_4_ = fVar150 * fVar126;
              auVar89._0_4_ = fVar196 * fVar302;
              auVar89._8_4_ = fVar198 * fVar247;
              auVar89._12_4_ = fVar149 * fVar124;
              auVar89._16_4_ = fVar197 * fVar218;
              auVar89._20_4_ = fVar282 * fVar275;
              auVar89._24_4_ = fVar245 * fVar154;
              auVar89._28_4_ = local_5e0._28_4_;
              auVar90._4_4_ = fVar148 * fVar291;
              auVar90._0_4_ = fVar304 * fVar283;
              auVar90._8_4_ = fVar273 * fVar292;
              auVar90._12_4_ = fVar147 * fVar293;
              auVar90._16_4_ = fVar194 * fVar294;
              auVar90._20_4_ = fVar281 * fVar295;
              auVar90._24_4_ = fVar244 * fVar296;
              auVar90._28_4_ = auVar20._28_4_;
              auVar16 = vsubps_avx(auVar90,auVar89);
              auVar91._4_4_ = fVar153 * fVar291;
              auVar91._0_4_ = fVar306 * fVar283;
              auVar91._8_4_ = fVar276 * fVar292;
              auVar91._12_4_ = fVar151 * fVar293;
              auVar91._16_4_ = fVar271 * fVar294;
              auVar91._20_4_ = fVar290 * fVar295;
              auVar91._24_4_ = fVar246 * fVar296;
              auVar91._28_4_ = auVar183._28_4_;
              auVar92._4_4_ = fVar150 * fVar146;
              auVar92._0_4_ = fVar196 * fVar193;
              auVar92._8_4_ = fVar198 * fVar272;
              auVar92._12_4_ = fVar149 * fVar145;
              auVar92._16_4_ = fVar197 * fVar340;
              auVar92._20_4_ = fVar282 * fVar280;
              auVar92._24_4_ = fVar245 * fVar237;
              auVar92._28_4_ = auVar309._28_4_;
              auVar25 = vsubps_avx(auVar92,auVar91);
              auVar93._4_4_ = fVar148 * fVar146;
              auVar93._0_4_ = fVar304 * fVar193;
              auVar93._8_4_ = fVar273 * fVar272;
              auVar93._12_4_ = fVar147 * fVar145;
              auVar93._16_4_ = fVar194 * fVar340;
              auVar93._20_4_ = fVar281 * fVar280;
              auVar93._24_4_ = fVar244 * fVar237;
              auVar93._28_4_ = auVar18._28_4_;
              auVar94._4_4_ = fVar153 * fVar126;
              auVar94._0_4_ = fVar306 * fVar302;
              auVar94._8_4_ = fVar276 * fVar247;
              auVar94._12_4_ = fVar151 * fVar124;
              auVar94._16_4_ = fVar271 * fVar218;
              auVar94._20_4_ = fVar290 * fVar275;
              auVar94._24_4_ = fVar246 * fVar154;
              auVar94._28_4_ = auVar266._28_4_;
              auVar183 = vsubps_avx(auVar94,auVar93);
              auVar164._0_4_ = auVar16._0_4_ * 0.0 + auVar183._0_4_ + auVar25._0_4_ * 0.0;
              auVar164._4_4_ = auVar16._4_4_ * 0.0 + auVar183._4_4_ + auVar25._4_4_ * 0.0;
              auVar164._8_4_ = auVar16._8_4_ * 0.0 + auVar183._8_4_ + auVar25._8_4_ * 0.0;
              auVar164._12_4_ = auVar16._12_4_ * 0.0 + auVar183._12_4_ + auVar25._12_4_ * 0.0;
              auVar164._16_4_ = auVar16._16_4_ * 0.0 + auVar183._16_4_ + auVar25._16_4_ * 0.0;
              auVar164._20_4_ = auVar16._20_4_ * 0.0 + auVar183._20_4_ + auVar25._20_4_ * 0.0;
              auVar164._24_4_ = auVar16._24_4_ * 0.0 + auVar183._24_4_ + auVar25._24_4_ * 0.0;
              auVar164._28_4_ = auVar266._28_4_ + auVar183._28_4_ + auVar18._28_4_;
              auVar20 = vrcpps_avx(auVar164);
              fVar193 = auVar20._0_4_;
              fVar304 = auVar20._4_4_;
              auVar95._4_4_ = auVar164._4_4_ * fVar304;
              auVar95._0_4_ = auVar164._0_4_ * fVar193;
              fVar196 = auVar20._8_4_;
              auVar95._8_4_ = auVar164._8_4_ * fVar196;
              fVar306 = auVar20._12_4_;
              auVar95._12_4_ = auVar164._12_4_ * fVar306;
              fVar126 = auVar20._16_4_;
              auVar95._16_4_ = auVar164._16_4_ * fVar126;
              fVar146 = auVar20._20_4_;
              auVar95._20_4_ = auVar164._20_4_ * fVar146;
              fVar148 = auVar20._24_4_;
              auVar95._24_4_ = auVar164._24_4_ * fVar148;
              auVar95._28_4_ = auVar309._28_4_;
              auVar313._8_4_ = 0x3f800000;
              auVar313._0_8_ = &DAT_3f8000003f800000;
              auVar313._12_4_ = 0x3f800000;
              auVar313._16_4_ = 0x3f800000;
              auVar313._20_4_ = 0x3f800000;
              auVar313._24_4_ = 0x3f800000;
              auVar313._28_4_ = 0x3f800000;
              auVar20 = vsubps_avx(auVar313,auVar95);
              fVar193 = auVar20._0_4_ * fVar193 + fVar193;
              fVar304 = auVar20._4_4_ * fVar304 + fVar304;
              fVar196 = auVar20._8_4_ * fVar196 + fVar196;
              fVar306 = auVar20._12_4_ * fVar306 + fVar306;
              fVar126 = auVar20._16_4_ * fVar126 + fVar126;
              fVar146 = auVar20._20_4_ * fVar146 + fVar146;
              fVar148 = auVar20._24_4_ * fVar148 + fVar148;
              auVar96._4_4_ =
                   (fVar143 * auVar16._4_4_ + auVar25._4_4_ * fVar140 + auVar183._4_4_ * fVar254) *
                   fVar304;
              auVar96._0_4_ =
                   (fVar303 * auVar16._0_4_ + auVar25._0_4_ * fVar190 + auVar183._0_4_ * fVar250) *
                   fVar193;
              auVar96._8_4_ =
                   (fVar301 * auVar16._8_4_ + auVar25._8_4_ * fVar195 + auVar183._8_4_ * fVar255) *
                   fVar196;
              auVar96._12_4_ =
                   (fVar142 * auVar16._12_4_ + auVar25._12_4_ * fVar139 + auVar183._12_4_ * fVar256)
                   * fVar306;
              auVar96._16_4_ =
                   (fVar339 * auVar16._16_4_ + auVar25._16_4_ * fVar338 + auVar183._16_4_ * fVar257)
                   * fVar126;
              auVar96._20_4_ =
                   (fVar279 * auVar16._20_4_ + auVar25._20_4_ * fVar278 + auVar183._20_4_ * fVar258)
                   * fVar146;
              auVar96._24_4_ =
                   (fVar249 * auVar16._24_4_ + auVar25._24_4_ * fVar166 + auVar183._24_4_ * fVar259)
                   * fVar148;
              auVar96._28_4_ = auVar17._28_4_ + auVar165._28_4_ + auVar21._28_4_;
              auVar188 = ZEXT3264(auVar96);
              fVar302 = local_7c8->tfar;
              auVar210._4_4_ = fVar302;
              auVar210._0_4_ = fVar302;
              auVar210._8_4_ = fVar302;
              auVar210._12_4_ = fVar302;
              auVar210._16_4_ = fVar302;
              auVar210._20_4_ = fVar302;
              auVar210._24_4_ = fVar302;
              auVar210._28_4_ = fVar302;
              auVar165 = vcmpps_avx(_local_380,auVar96,2);
              auVar17 = vcmpps_avx(auVar96,auVar210,2);
              auVar165 = vandps_avx(auVar165,auVar17);
              auVar21 = auVar26 & auVar165;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar21 >> 0x7f,0) == '\0') &&
                    (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar21 >> 0xbf,0) == '\0') &&
                  (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar21[0x1f]) goto LAB_00fa9c4d;
              auVar165 = vandps_avx(auVar26,auVar165);
              auVar243 = ZEXT3264(auVar165);
              auVar21 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar164,4);
              auVar20 = auVar165 & auVar21;
              auVar211 = ZEXT3264(CONCAT824(uStack_468,
                                            CONCAT816(uStack_470,CONCAT88(uStack_478,local_480))));
              auVar322._4_4_ = fStack_77c;
              auVar322._0_4_ = fVar125;
              auVar322._8_4_ = fStack_778;
              auVar322._12_4_ = fStack_774;
              auVar322._16_4_ = fStack_770;
              auVar322._20_4_ = fStack_76c;
              auVar322._24_4_ = fStack_768;
              auVar322._28_4_ = fStack_764;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                auVar165 = vandps_avx(auVar21,auVar165);
                auVar211 = ZEXT3264(auVar165);
                auVar97._4_4_ = auVar299._4_4_ * fVar304;
                auVar97._0_4_ = auVar299._0_4_ * fVar193;
                auVar97._8_4_ = auVar299._8_4_ * fVar196;
                auVar97._12_4_ = auVar299._12_4_ * fVar306;
                auVar97._16_4_ = auVar299._16_4_ * fVar126;
                auVar97._20_4_ = auVar299._20_4_ * fVar146;
                auVar97._24_4_ = auVar299._24_4_ * fVar148;
                auVar97._28_4_ = auVar17._28_4_;
                auVar98._4_4_ = auVar137._4_4_ * fVar304;
                auVar98._0_4_ = auVar137._0_4_ * fVar193;
                auVar98._8_4_ = auVar137._8_4_ * fVar196;
                auVar98._12_4_ = auVar137._12_4_ * fVar306;
                auVar98._16_4_ = auVar137._16_4_ * fVar126;
                auVar98._20_4_ = auVar137._20_4_ * fVar146;
                auVar98._24_4_ = auVar137._24_4_ * fVar148;
                auVar98._28_4_ = auVar137._28_4_;
                auVar242._8_4_ = 0x3f800000;
                auVar242._0_8_ = &DAT_3f8000003f800000;
                auVar242._12_4_ = 0x3f800000;
                auVar242._16_4_ = 0x3f800000;
                auVar242._20_4_ = 0x3f800000;
                auVar242._24_4_ = 0x3f800000;
                auVar242._28_4_ = 0x3f800000;
                auVar243 = ZEXT3264(auVar242);
                auVar165 = vsubps_avx(auVar242,auVar97);
                local_160 = vblendvps_avx(auVar165,auVar97,auVar184);
                auVar165 = vsubps_avx(auVar242,auVar98);
                _local_3e0 = vblendvps_avx(auVar165,auVar98,auVar184);
                local_180 = auVar96;
              }
            }
            auVar314 = ZEXT3264(local_6c0);
            auVar165 = auVar211._0_32_;
            _local_7a0 = auVar253;
            if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar165 >> 0x7f,0) != '\0') ||
                  (auVar211 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar165 >> 0xbf,0) != '\0') ||
                (auVar211 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar211[0x1f] < '\0') {
              auVar17 = vsubps_avx(auVar253,auVar322);
              auVar188 = ZEXT3264(local_160);
              fVar190 = auVar322._0_4_ + auVar17._0_4_ * local_160._0_4_;
              fVar303 = auVar322._4_4_ + auVar17._4_4_ * local_160._4_4_;
              fVar193 = auVar322._8_4_ + auVar17._8_4_ * local_160._8_4_;
              fVar304 = auVar322._12_4_ + auVar17._12_4_ * local_160._12_4_;
              fVar196 = auVar322._16_4_ + auVar17._16_4_ * local_160._16_4_;
              fVar306 = auVar322._20_4_ + auVar17._20_4_ * local_160._20_4_;
              fVar126 = auVar322._24_4_ + auVar17._24_4_ * local_160._24_4_;
              fVar140 = auVar322._28_4_ + auVar17._28_4_;
              fVar302 = local_7a8->depth_scale;
              auVar99._4_4_ = (fVar303 + fVar303) * fVar302;
              auVar99._0_4_ = (fVar190 + fVar190) * fVar302;
              auVar99._8_4_ = (fVar193 + fVar193) * fVar302;
              auVar99._12_4_ = (fVar304 + fVar304) * fVar302;
              auVar99._16_4_ = (fVar196 + fVar196) * fVar302;
              auVar99._20_4_ = (fVar306 + fVar306) * fVar302;
              auVar99._24_4_ = (fVar126 + fVar126) * fVar302;
              auVar99._28_4_ = fVar140 + fVar140;
              auVar17 = vcmpps_avx(local_180,auVar99,6);
              auVar21 = auVar165 & auVar17;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar21 >> 0x7f,0) != '\0') ||
                    (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0xbf,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar21[0x1f] < '\0') {
                local_200 = vandps_avx(auVar17,auVar165);
                local_2a0 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
                fStack_29c = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
                fStack_298 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
                fStack_294 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
                fStack_290 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
                fStack_28c = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
                fStack_288 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
                fStack_284 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
                local_2c0 = local_160;
                local_280 = local_180;
                local_25c = uVar116;
                local_250 = local_7c0;
                uStack_248 = uStack_7b8;
                local_240 = local_680._0_8_;
                uStack_238 = local_680._8_8_;
                local_230 = local_690._0_8_;
                uStack_228 = local_690._8_8_;
                local_220 = local_490._0_8_;
                uStack_218 = local_490._8_8_;
                local_540._0_8_ = (local_7d0->scene->geometries).items[local_728].ptr;
                local_3e0._4_4_ = fStack_29c;
                local_3e0._0_4_ = local_2a0;
                uStack_3d8._0_4_ = fStack_298;
                uStack_3d8._4_4_ = fStack_294;
                uStack_3d0._0_4_ = fStack_290;
                uStack_3d0._4_4_ = fStack_28c;
                auVar114 = _local_3e0;
                uStack_3c8._0_4_ = fStack_288;
                uStack_3c8._4_4_ = fStack_284;
                auVar165 = _local_3e0;
                if ((((Geometry *)local_540._0_8_)->mask & local_7c8->mask) == 0) {
                  pRVar118 = (RTCIntersectArguments *)0x0;
                  auVar300 = ZEXT3264(_local_760);
                  auVar211 = ZEXT3264(_local_620);
                }
                else {
                  pRVar118 = local_7d0->args;
                  auVar300 = ZEXT3264(_local_760);
                  auVar211 = ZEXT3264(_local_620);
                  if ((pRVar118->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar118 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar118 >> 8),1),
                     ((Geometry *)local_540._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    stack0xfffffffffffffac8 = auVar229._8_24_;
                    local_780 = (float)(uint)uVar120;
                    auVar159._0_4_ = (float)(int)local_260;
                    auVar159._4_8_ = SUB128(ZEXT812(0),4);
                    auVar159._12_4_ = 0;
                    auVar225 = vshufps_avx(auVar159,auVar159,0);
                    local_1e0[0] = (auVar225._0_4_ + local_160._0_4_ + 0.0) * (float)local_3a0._0_4_
                    ;
                    local_1e0[1] = (auVar225._4_4_ + local_160._4_4_ + 1.0) * (float)local_3a0._4_4_
                    ;
                    local_1e0[2] = (auVar225._8_4_ + local_160._8_4_ + 2.0) * fStack_398;
                    local_1e0[3] = (auVar225._12_4_ + local_160._12_4_ + 3.0) * fStack_394;
                    fStack_1d0 = (auVar225._0_4_ + local_160._16_4_ + 4.0) * fStack_390;
                    fStack_1cc = (auVar225._4_4_ + local_160._20_4_ + 5.0) * fStack_38c;
                    fStack_1c8 = (auVar225._8_4_ + local_160._24_4_ + 6.0) * fStack_388;
                    fStack_1c4 = auVar225._12_4_ + (float)local_160._28_4_ + 7.0;
                    uStack_3d0 = auVar114._16_8_;
                    uStack_3c8 = auVar165._24_8_;
                    local_1c0 = local_3e0;
                    uStack_1b8 = uStack_3d8;
                    uStack_1b0 = uStack_3d0;
                    uStack_1a8 = uStack_3c8;
                    local_1a0 = local_180;
                    iVar117 = vmovmskps_avx(local_200);
                    uVar120 = CONCAT44((int)((ulong)pRVar118 >> 0x20),iVar117);
                    local_7a0 = (undefined1  [8])0x0;
                    if (uVar120 != 0) {
                      for (; (uVar120 >> (long)local_7a0 & 1) == 0;
                          local_7a0 = (undefined1  [8])((long)local_7a0 + 1)) {
                      }
                    }
                    _auStack_798 = auVar253._8_24_;
                    local_5e0._0_8_ = uVar120;
                    local_640._0_4_ = (int)CONCAT71((int7)(uVar120 >> 8),iVar117 != 0);
                    _local_3e0 = auVar165;
                    if (iVar117 != 0) {
                      _auStack_5f0 = auVar308._16_16_;
                      _local_600 = local_680;
                      _auStack_4f0 = auVar319._16_16_;
                      _local_500 = local_690;
                      local_700 = local_490._0_4_;
                      fStack_6fc = local_490._4_4_;
                      fStack_6f8 = local_490._8_4_;
                      fStack_6f4 = local_490._12_4_;
                      do {
                        local_594 = local_1e0[(long)local_7a0];
                        local_590 = *(undefined4 *)((long)&local_1c0 + (long)local_7a0 * 4);
                        local_6e0._0_4_ = local_7c8->tfar;
                        local_7c8->tfar = *(float *)(local_1a0 + (long)local_7a0 * 4);
                        local_670.context = local_7d0->user;
                        fVar199 = 1.0 - local_594;
                        fVar176 = local_594 * fVar199 * 4.0;
                        auVar243 = ZEXT464(0x3f000000);
                        auVar225 = ZEXT416((uint)(local_594 * local_594 * 0.5));
                        auVar225 = vshufps_avx(auVar225,auVar225,0);
                        auVar171 = ZEXT416((uint)((fVar199 * fVar199 + fVar176) * 0.5));
                        auVar171 = vshufps_avx(auVar171,auVar171,0);
                        auVar205 = ZEXT416((uint)((-local_594 * local_594 - fVar176) * 0.5));
                        auVar205 = vshufps_avx(auVar205,auVar205,0);
                        auVar181 = ZEXT416((uint)(fVar199 * -fVar199 * 0.5));
                        auVar181 = vshufps_avx(auVar181,auVar181,0);
                        auVar182._0_4_ = auVar181._0_4_ * (float)local_7c0._0_4_;
                        auVar182._4_4_ = auVar181._4_4_ * (float)local_7c0._4_4_;
                        auVar182._8_4_ = auVar181._8_4_ * (float)uStack_7b8;
                        auVar182._12_4_ = auVar181._12_4_ * uStack_7b8._4_4_;
                        auVar188 = ZEXT1664(auVar182);
                        auVar172._0_4_ =
                             auVar182._0_4_ +
                             auVar205._0_4_ * (float)local_600._0_4_ +
                             auVar225._0_4_ * local_700 + auVar171._0_4_ * (float)local_500._0_4_;
                        auVar172._4_4_ =
                             auVar182._4_4_ +
                             auVar205._4_4_ * (float)local_600._4_4_ +
                             auVar225._4_4_ * fStack_6fc + auVar171._4_4_ * (float)local_500._4_4_;
                        auVar172._8_4_ =
                             auVar182._8_4_ +
                             auVar205._8_4_ * fStack_5f8 +
                             auVar225._8_4_ * fStack_6f8 + auVar171._8_4_ * fStack_4f8;
                        auVar172._12_4_ =
                             auVar182._12_4_ +
                             auVar205._12_4_ * fStack_5f4 +
                             auVar225._12_4_ * fStack_6f4 + auVar171._12_4_ * fStack_4f4;
                        local_5a0 = vmovlps_avx(auVar172);
                        local_598 = vextractps_avx(auVar172,2);
                        local_58c = (int)local_568;
                        local_588 = (int)local_728;
                        local_584 = (local_670.context)->instID[0];
                        local_580 = (local_670.context)->instPrimID[0];
                        local_7d4 = -1;
                        local_670.valid = &local_7d4;
                        local_670.geometryUserPtr = *(void **)(local_540._0_8_ + 0x18);
                        local_670.ray = (RTCRayN *)local_7c8;
                        local_670.hit = (RTCHitN *)&local_5a0;
                        local_670.N = 1;
                        if (*(code **)(local_540._0_8_ + 0x48) == (code *)0x0) {
LAB_00fa9b3e:
                          p_Var13 = local_7d0->args->filter;
                          if (p_Var13 == (RTCFilterFunctionN)0x0) break;
                          if (((local_7d0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                               != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_540._0_8_ + 0x3e) & 0x40) != 0)) {
                            auVar188 = ZEXT1664(auVar188._0_16_);
                            auVar243 = ZEXT1664(auVar243._0_16_);
                            (*p_Var13)(&local_670);
                          }
                          if (*local_670.valid != 0) break;
                        }
                        else {
                          auVar188 = ZEXT1664(auVar182);
                          auVar243 = ZEXT1664(auVar243._0_16_);
                          (**(code **)(local_540._0_8_ + 0x48))(&local_670);
                          if (*local_670.valid != 0) goto LAB_00fa9b3e;
                        }
                        local_7c8->tfar = (float)local_6e0._0_4_;
                        uVar120 = local_5e0._0_8_ ^ 1L << ((ulong)local_7a0 & 0x3f);
                        lVar15 = 0;
                        if (uVar120 != 0) {
                          for (; (uVar120 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                          }
                        }
                        local_7a0 = (undefined1  [8])lVar15;
                        local_5e0._0_8_ = uVar120;
                        local_640._0_4_ = (int)CONCAT71((int7)(uVar120 >> 8),uVar120 != 0);
                      } while (uVar120 != 0);
                    }
                    pRVar118 = (RTCIntersectArguments *)(ulong)(local_640[0] & 1);
                    auVar314 = ZEXT3264(local_6c0);
                    auVar300 = ZEXT3264(_local_760);
                    auVar211 = ZEXT3264(_local_620);
                    uVar120 = (ulong)(uint)local_780;
                    fVar220 = (float)local_720._0_4_;
                    fVar232 = (float)local_720._4_4_;
                    fVar234 = fStack_718;
                    fVar236 = fStack_714;
                    fVar219 = fStack_710;
                    fVar189 = fStack_70c;
                    fVar191 = fStack_708;
                    fVar214 = fStack_704;
                    fVar176 = (float)local_4e0._0_4_;
                    fVar199 = (float)local_4e0._4_4_;
                    fVar212 = fStack_4d8;
                    fVar231 = fStack_4d4;
                    fVar233 = fStack_4d0;
                    fVar192 = fStack_4cc;
                    fVar174 = fStack_4c8;
                    fVar152 = fStack_4c4;
                    fVar200 = (float)local_5c0._0_4_;
                    fVar213 = (float)local_5c0._4_4_;
                    fVar215 = fStack_5b8;
                    fVar217 = fStack_5b4;
                    fVar216 = fStack_5b0;
                    fVar235 = fStack_5ac;
                    fVar175 = fStack_5a8;
                  }
                }
                uVar120 = CONCAT71((int7)(uVar120 >> 8),(byte)uVar120 | (byte)pRVar118);
                goto LAB_00fa97cd;
              }
            }
            auVar300 = ZEXT3264(_local_760);
            auVar211 = ZEXT3264(_local_620);
          }
LAB_00fa97cd:
          lVar122 = lVar122 + 8;
        } while ((int)lVar122 < (int)uVar116);
      }
      if ((uVar120 & 1) != 0) {
        return local_7d5;
      }
      fVar176 = local_7c8->tfar;
      auVar130._4_4_ = fVar176;
      auVar130._0_4_ = fVar176;
      auVar130._8_4_ = fVar176;
      auVar130._12_4_ = fVar176;
      auVar225 = vcmpps_avx(local_2d0,auVar130,2);
      uVar116 = vmovmskps_avx(auVar225);
      uVar116 = (uint)uVar121 & uVar116;
      local_7d5 = uVar116 != 0;
      ray = local_7c8;
      context = local_7d0;
      pre = local_7a8;
    } while (local_7d5);
  }
  return local_7d5;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }